

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  float *pfVar14;
  size_t sVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [32];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  int *piVar353;
  undefined1 auVar354 [32];
  float afVar355 [16];
  float afVar356 [16];
  float afVar357 [16];
  float afVar358 [16];
  float afVar359 [16];
  float afVar360 [16];
  float afVar361 [16];
  int iVar362;
  ulong uVar363;
  long lVar364;
  long lVar365;
  long lVar366;
  long lVar367;
  ulong uVar368;
  long lVar369;
  undefined4 *puVar370;
  ulong uVar371;
  long lVar372;
  undefined4 *puVar373;
  ulong uVar374;
  long lVar375;
  long lVar376;
  undefined1 (*pauVar377) [64];
  undefined4 *puVar378;
  uint *puVar379;
  int iVar380;
  int iVar381;
  long lVar382;
  long lVar383;
  int iVar384;
  uint uVar385;
  int iVar386;
  long lVar387;
  long lVar388;
  long lVar389;
  ulong uVar390;
  ulong uVar391;
  long lVar392;
  ulong uVar393;
  long lVar394;
  uint *puVar395;
  ulong uVar396;
  long lVar397;
  ulong uVar398;
  uint uVar399;
  ulong uVar400;
  undefined1 (*pauVar401) [32];
  undefined1 (*pauVar402) [16];
  int iVar403;
  long lVar404;
  undefined1 (*pauVar405) [64];
  undefined1 (*pauVar406) [16];
  undefined4 *puVar407;
  uint uVar408;
  int iVar409;
  long lVar410;
  undefined1 (*pauVar411) [32];
  undefined1 (*pauVar412) [64];
  long lVar413;
  long lVar414;
  long lVar415;
  long lVar416;
  ulong uVar417;
  long lVar418;
  long lVar419;
  undefined1 (*pauVar420) [64];
  long lVar421;
  float *pfVar422;
  int iVar423;
  long lVar424;
  long lVar425;
  long lVar426;
  float fVar427;
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [28];
  undefined1 auVar445 [32];
  undefined1 auVar459 [64];
  undefined1 auVar460 [64];
  undefined1 auVar461 [64];
  undefined1 auVar462 [64];
  undefined1 auVar463 [64];
  undefined1 auVar464 [64];
  undefined1 auVar465 [64];
  undefined1 auVar466 [64];
  undefined1 auVar467 [64];
  undefined1 auVar468 [64];
  undefined1 auVar469 [64];
  undefined1 auVar470 [64];
  undefined1 auVar471 [64];
  undefined1 auVar472 [64];
  undefined1 auVar473 [64];
  undefined1 auVar474 [64];
  undefined1 auVar475 [64];
  undefined1 auVar476 [64];
  undefined1 auVar477 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar482 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  float fVar493;
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  float fVar492;
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  float fVar494;
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  long lVar495;
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 auVar506 [32];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  float fVar507;
  undefined1 auVar516 [16];
  float fVar508;
  undefined1 auVar517 [32];
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [32];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  long lVar527;
  long lVar528;
  long lVar529;
  undefined1 auVar532 [32];
  undefined1 auVar533 [64];
  undefined1 auVar535 [16];
  undefined1 auVar536 [32];
  undefined1 auVar534 [16];
  undefined1 auVar537 [32];
  undefined1 auVar538 [16];
  undefined1 auVar539 [32];
  undefined1 auVar540 [32];
  undefined1 auVar541 [16];
  undefined1 auVar542 [32];
  undefined1 auVar543 [16];
  undefined1 auVar544 [32];
  undefined1 auVar545 [16];
  undefined1 auVar546 [32];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [32];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [32];
  undefined1 auVar559 [16];
  undefined1 auVar560 [32];
  undefined1 auVar561 [16];
  undefined1 auVar562 [32];
  undefined1 auVar563 [16];
  undefined1 auVar564 [32];
  undefined1 in_ZMM16 [64];
  float in_ZMM17 [16];
  float in_ZMM18 [16];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar565 [64];
  undefined1 in_ZMM31 [64];
  int local_350;
  long local_348;
  int local_318;
  undefined1 (*local_2e8) [64];
  undefined1 (*local_2e0) [16];
  undefined1 (*local_2d8) [32];
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2a8;
  undefined1 local_298 [16];
  long local_288;
  int local_210;
  Mat local_188;
  ulong local_138;
  ulong local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [32];
  ulong local_f0;
  long local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  undefined1 auVar453 [32];
  
  auVar429 = in_ZMM29._0_16_;
  uVar368 = bottom_blob->elemsize;
  iVar5 = bottom_blob->elempack;
  iVar381 = (this->super_Convolution1D).kernel_w;
  iVar6 = (this->super_Convolution1D).dilation_w;
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_188,opt);
  iVar423 = -100;
  if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
    uVar399 = (this->super_Convolution1D).num_output;
    uVar408 = 0x10;
    if (opt->use_packing_layout == true) {
      if (((uVar399 & 0xf) != 0) && (uVar408 = 8, (uVar399 & 7) != 0)) {
        uVar408 = (uint)((uVar399 & 3) == 0) * 3 + 1;
      }
    }
    else {
      uVar408 = 1;
    }
    Mat::create(top_blob,(local_188.w + ~((iVar381 + -1) * iVar6)) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar399 / (int)uVar408,
                (ulong)uVar408 * (uVar368 / (ulong)(long)iVar5),uVar408,opt->blob_allocator);
    iVar5 = local_188.elempack;
    afVar361 = ::_ps512_cephes_exp_p5;
    afVar360 = ::_ps512_cephes_exp_p4;
    afVar359 = ::_ps512_cephes_exp_p3;
    afVar358 = ::_ps512_cephes_exp_p2;
    afVar357 = ::_ps512_cephes_exp_p1;
    afVar356 = ::_ps512_cephes_LOG2EF;
    afVar355 = ::_ps512_1;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar381 = (this->super_Convolution1D).dilation_w;
      lVar425 = (long)iVar381;
      iVar6 = (this->super_Convolution1D).stride_w;
      uVar399 = (this->super_Convolution1D).kernel_w;
      iVar423 = (this->super_Convolution1D).activation_type;
      lVar387 = (long)local_188.elempack;
      lVar382 = (long)local_188.h;
      iVar380 = local_188.w * local_188.elempack;
      local_f0 = (ulong)top_blob->w;
      uVar363 = (long)top_blob->h * (long)top_blob->elempack;
      lVar413 = (long)top_blob->elempack * local_f0;
      pvVar7 = (this->super_Convolution1D).bias_data.data;
      iVar386 = (int)uVar363;
      uVar368 = (long)((ulong)(uint)(iVar386 >> 0x1f) << 0x20 | uVar363 & 0xffffffff) / 0x10;
      lVar424 = (long)(iVar381 << 4);
      lVar394 = (long)iVar380;
      lVar388 = (long)(iVar381 * 8);
      lVar421 = (long)(iVar381 * 4);
      auVar445 = vpbroadcastd_avx512vl();
      auVar446 = vpmulld_avx2(auVar445,_DAT_00544880);
      auVar459 = vpmovsxdq_avx512f(auVar446);
      auVar428 = vpmulld_avx(auVar445._0_16_,_DAT_005448a0);
      local_118 = vpmovsxdq_avx2(auVar428);
      lVar364 = (long)(iVar380 * 0xe);
      lVar365 = (long)(iVar380 * 0xf);
      auVar460 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar461 = vxorps_avx512dq(auVar460,(undefined1  [64])_ps512_cephes_log_q2);
      auVar462 = vxorps_avx512dq(auVar460,(undefined1  [64])_ps512_cephes_log_q1);
      auVar463 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_78 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar460);
      iVar381 = (int)lVar413;
      lVar366 = (long)(iVar381 * 2);
      lVar367 = (long)(iVar381 * 3);
      local_c0 = (long)(iVar381 * 0xc);
      local_c8 = (long)(iVar381 * 0xd);
      local_d0 = (long)(iVar381 * 0xe);
      uVar396 = 0;
      uVar417 = (ulong)uVar399;
      if ((int)uVar399 < 1) {
        uVar417 = uVar396;
      }
      local_d8 = (long)(iVar381 * 0xf);
      iVar380 = (int)uVar368;
      local_e0 = 0;
      if (0 < iVar380) {
        local_e0 = uVar368 & 0xffffffff;
      }
      lVar410 = vpextrq_avx(auVar459._16_16_,1);
      auVar428 = vextracti32x4_avx512f(auVar459,2);
      lVar527 = auVar428._0_8_;
      lVar8 = vpextrq_avx(auVar428,1);
      auVar428 = vextracti32x4_avx512f(auVar459,3);
      lVar528 = auVar428._0_8_;
      lVar383 = vpextrq_avx(auVar428,1);
      auVar428 = local_118._0_16_;
      lVar426 = lVar425 * 4;
      lVar529 = local_118._16_8_;
      lVar376 = vpextrq_avx(local_118._16_16_,1);
      auVar429 = vxorps_avx512vl(auVar429,auVar429);
      auVar565 = ZEXT1664(auVar429);
      lVar419 = auVar459._0_8_;
      local_b8 = vmovdqu64_avx512f(auVar459);
      lVar414 = vpextrq_avx(auVar459._0_16_,1);
      lVar495 = local_118._0_8_;
      lVar9 = vpextrq_avx(auVar428,1);
      lVar1 = lVar388 * 4;
      lVar2 = lVar421 * 4;
      local_e8 = lVar394 * 4;
      lVar3 = (long)iVar6 * 4;
      auVar460 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      for (; uVar396 != local_e0; uVar396 = uVar396 + 1) {
        uVar399 = top_blob->w;
        iVar409 = top_blob->elempack;
        local_2e8 = (undefined1 (*) [64])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar396 * 0x10) >> 0x1f) << 0x20 |
                                       uVar396 * 0x10 & 0xffffffff) / (long)iVar409) *
                     (long)(int)uVar399 * top_blob->elemsize + (long)top_blob->data);
        lVar404 = (long)local_188.h * (long)local_188.elempack;
        local_288 = 0;
        uVar368 = 0;
        if (0 < (int)uVar399) {
          uVar368 = (ulong)uVar399;
        }
        iVar403 = 0;
        local_2d8 = (undefined1 (*) [32])local_e8;
        for (uVar391 = 0; uVar391 != uVar368; uVar391 = uVar391 + 1) {
          auVar429 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar429);
          auVar533 = ZEXT1664((undefined1  [16])0x0);
          if (pvVar7 != (void *)0x0) {
            auVar533 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar7 + uVar396 * 0x40));
          }
          pauVar405 = (undefined1 (*) [64])
                      ((this->weight_data_tm).cstep * uVar396 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          iVar362 = local_188.elempack * iVar6 * (int)uVar391;
          lVar389 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar418 = (long)local_2d8 + (long)local_188.data;
          puVar395 = (uint *)((long)local_188.data + local_288);
          uVar390 = 0;
          auVar429 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = (float  [16])ZEXT1664(auVar429);
          auVar429 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = (float  [16])ZEXT1664(auVar429);
          while( true ) {
            local_350 = (int)lVar404;
            if (local_350 <= (int)((uint)uVar390 | 0xf)) break;
            lVar369 = (int)((long)((ulong)(uint)((int)(uint)uVar390 >> 0x1f) << 0x20 |
                                  uVar390 & 0xffffffff) / (long)local_188.elempack) * lVar389;
            if (local_188.elempack == 0x10) {
              puVar370 = (undefined4 *)((long)local_188.data + lVar369 + (long)iVar403 * 4);
              uVar374 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar374, uVar374 = (ulong)(iVar384 - 1), iVar384 != 0) {
                in_ZMM26 = pauVar377[8];
                in_ZMM28 = pauVar377[0xb];
                in_ZMM31 = pauVar377[0xc];
                uVar4 = *puVar370;
                auVar254._4_4_ = uVar4;
                auVar254._0_4_ = uVar4;
                auVar254._8_4_ = uVar4;
                auVar254._12_4_ = uVar4;
                auVar254._16_4_ = uVar4;
                auVar254._20_4_ = uVar4;
                auVar254._24_4_ = uVar4;
                auVar254._28_4_ = uVar4;
                auVar254._32_4_ = uVar4;
                auVar254._36_4_ = uVar4;
                auVar254._40_4_ = uVar4;
                auVar254._44_4_ = uVar4;
                auVar254._48_4_ = uVar4;
                auVar254._52_4_ = uVar4;
                auVar254._56_4_ = uVar4;
                auVar254._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar254);
                uVar4 = puVar370[1];
                auVar255._4_4_ = uVar4;
                auVar255._0_4_ = uVar4;
                auVar255._8_4_ = uVar4;
                auVar255._12_4_ = uVar4;
                auVar255._16_4_ = uVar4;
                auVar255._20_4_ = uVar4;
                auVar255._24_4_ = uVar4;
                auVar255._28_4_ = uVar4;
                auVar255._32_4_ = uVar4;
                auVar255._36_4_ = uVar4;
                auVar255._40_4_ = uVar4;
                auVar255._44_4_ = uVar4;
                auVar255._48_4_ = uVar4;
                auVar255._52_4_ = uVar4;
                auVar255._56_4_ = uVar4;
                auVar255._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar255);
                uVar4 = puVar370[2];
                auVar256._4_4_ = uVar4;
                auVar256._0_4_ = uVar4;
                auVar256._8_4_ = uVar4;
                auVar256._12_4_ = uVar4;
                auVar256._16_4_ = uVar4;
                auVar256._20_4_ = uVar4;
                auVar256._24_4_ = uVar4;
                auVar256._28_4_ = uVar4;
                auVar256._32_4_ = uVar4;
                auVar256._36_4_ = uVar4;
                auVar256._40_4_ = uVar4;
                auVar256._44_4_ = uVar4;
                auVar256._48_4_ = uVar4;
                auVar256._52_4_ = uVar4;
                auVar256._56_4_ = uVar4;
                auVar256._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar256);
                uVar4 = puVar370[3];
                auVar257._4_4_ = uVar4;
                auVar257._0_4_ = uVar4;
                auVar257._8_4_ = uVar4;
                auVar257._12_4_ = uVar4;
                auVar257._16_4_ = uVar4;
                auVar257._20_4_ = uVar4;
                auVar257._24_4_ = uVar4;
                auVar257._28_4_ = uVar4;
                auVar257._32_4_ = uVar4;
                auVar257._36_4_ = uVar4;
                auVar257._40_4_ = uVar4;
                auVar257._44_4_ = uVar4;
                auVar257._48_4_ = uVar4;
                auVar257._52_4_ = uVar4;
                auVar257._56_4_ = uVar4;
                auVar257._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar257);
                uVar4 = puVar370[4];
                auVar258._4_4_ = uVar4;
                auVar258._0_4_ = uVar4;
                auVar258._8_4_ = uVar4;
                auVar258._12_4_ = uVar4;
                auVar258._16_4_ = uVar4;
                auVar258._20_4_ = uVar4;
                auVar258._24_4_ = uVar4;
                auVar258._28_4_ = uVar4;
                auVar258._32_4_ = uVar4;
                auVar258._36_4_ = uVar4;
                auVar258._40_4_ = uVar4;
                auVar258._44_4_ = uVar4;
                auVar258._48_4_ = uVar4;
                auVar258._52_4_ = uVar4;
                auVar258._56_4_ = uVar4;
                auVar258._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[4],auVar258);
                uVar4 = puVar370[5];
                auVar259._4_4_ = uVar4;
                auVar259._0_4_ = uVar4;
                auVar259._8_4_ = uVar4;
                auVar259._12_4_ = uVar4;
                auVar259._16_4_ = uVar4;
                auVar259._20_4_ = uVar4;
                auVar259._24_4_ = uVar4;
                auVar259._28_4_ = uVar4;
                auVar259._32_4_ = uVar4;
                auVar259._36_4_ = uVar4;
                auVar259._40_4_ = uVar4;
                auVar259._44_4_ = uVar4;
                auVar259._48_4_ = uVar4;
                auVar259._52_4_ = uVar4;
                auVar259._56_4_ = uVar4;
                auVar259._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[5],auVar259);
                uVar4 = puVar370[6];
                auVar260._4_4_ = uVar4;
                auVar260._0_4_ = uVar4;
                auVar260._8_4_ = uVar4;
                auVar260._12_4_ = uVar4;
                auVar260._16_4_ = uVar4;
                auVar260._20_4_ = uVar4;
                auVar260._24_4_ = uVar4;
                auVar260._28_4_ = uVar4;
                auVar260._32_4_ = uVar4;
                auVar260._36_4_ = uVar4;
                auVar260._40_4_ = uVar4;
                auVar260._44_4_ = uVar4;
                auVar260._48_4_ = uVar4;
                auVar260._52_4_ = uVar4;
                auVar260._56_4_ = uVar4;
                auVar260._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar260);
                uVar4 = puVar370[7];
                auVar261._4_4_ = uVar4;
                auVar261._0_4_ = uVar4;
                auVar261._8_4_ = uVar4;
                auVar261._12_4_ = uVar4;
                auVar261._16_4_ = uVar4;
                auVar261._20_4_ = uVar4;
                auVar261._24_4_ = uVar4;
                auVar261._28_4_ = uVar4;
                auVar261._32_4_ = uVar4;
                auVar261._36_4_ = uVar4;
                auVar261._40_4_ = uVar4;
                auVar261._44_4_ = uVar4;
                auVar261._48_4_ = uVar4;
                auVar261._52_4_ = uVar4;
                auVar261._56_4_ = uVar4;
                auVar261._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar261);
                uVar4 = puVar370[8];
                auVar262._4_4_ = uVar4;
                auVar262._0_4_ = uVar4;
                auVar262._8_4_ = uVar4;
                auVar262._12_4_ = uVar4;
                auVar262._16_4_ = uVar4;
                auVar262._20_4_ = uVar4;
                auVar262._24_4_ = uVar4;
                auVar262._28_4_ = uVar4;
                auVar262._32_4_ = uVar4;
                auVar262._36_4_ = uVar4;
                auVar262._40_4_ = uVar4;
                auVar262._44_4_ = uVar4;
                auVar262._48_4_ = uVar4;
                auVar262._52_4_ = uVar4;
                auVar262._56_4_ = uVar4;
                auVar262._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,in_ZMM26,auVar262);
                uVar4 = puVar370[9];
                auVar263._4_4_ = uVar4;
                auVar263._0_4_ = uVar4;
                auVar263._8_4_ = uVar4;
                auVar263._12_4_ = uVar4;
                auVar263._16_4_ = uVar4;
                auVar263._20_4_ = uVar4;
                auVar263._24_4_ = uVar4;
                auVar263._28_4_ = uVar4;
                auVar263._32_4_ = uVar4;
                auVar263._36_4_ = uVar4;
                auVar263._40_4_ = uVar4;
                auVar263._44_4_ = uVar4;
                auVar263._48_4_ = uVar4;
                auVar263._52_4_ = uVar4;
                auVar263._56_4_ = uVar4;
                auVar263._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[9],auVar263);
                uVar4 = puVar370[10];
                auVar264._4_4_ = uVar4;
                auVar264._0_4_ = uVar4;
                auVar264._8_4_ = uVar4;
                auVar264._12_4_ = uVar4;
                auVar264._16_4_ = uVar4;
                auVar264._20_4_ = uVar4;
                auVar264._24_4_ = uVar4;
                auVar264._28_4_ = uVar4;
                auVar264._32_4_ = uVar4;
                auVar264._36_4_ = uVar4;
                auVar264._40_4_ = uVar4;
                auVar264._44_4_ = uVar4;
                auVar264._48_4_ = uVar4;
                auVar264._52_4_ = uVar4;
                auVar264._56_4_ = uVar4;
                auVar264._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[10],auVar264);
                uVar4 = puVar370[0xb];
                auVar265._4_4_ = uVar4;
                auVar265._0_4_ = uVar4;
                auVar265._8_4_ = uVar4;
                auVar265._12_4_ = uVar4;
                auVar265._16_4_ = uVar4;
                auVar265._20_4_ = uVar4;
                auVar265._24_4_ = uVar4;
                auVar265._28_4_ = uVar4;
                auVar265._32_4_ = uVar4;
                auVar265._36_4_ = uVar4;
                auVar265._40_4_ = uVar4;
                auVar265._44_4_ = uVar4;
                auVar265._48_4_ = uVar4;
                auVar265._52_4_ = uVar4;
                auVar265._56_4_ = uVar4;
                auVar265._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,in_ZMM28,auVar265);
                uVar4 = puVar370[0xc];
                auVar266._4_4_ = uVar4;
                auVar266._0_4_ = uVar4;
                auVar266._8_4_ = uVar4;
                auVar266._12_4_ = uVar4;
                auVar266._16_4_ = uVar4;
                auVar266._20_4_ = uVar4;
                auVar266._24_4_ = uVar4;
                auVar266._28_4_ = uVar4;
                auVar266._32_4_ = uVar4;
                auVar266._36_4_ = uVar4;
                auVar266._40_4_ = uVar4;
                auVar266._44_4_ = uVar4;
                auVar266._48_4_ = uVar4;
                auVar266._52_4_ = uVar4;
                auVar266._56_4_ = uVar4;
                auVar266._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,in_ZMM31,auVar266);
                uVar4 = puVar370[0xd];
                auVar267._4_4_ = uVar4;
                auVar267._0_4_ = uVar4;
                auVar267._8_4_ = uVar4;
                auVar267._12_4_ = uVar4;
                auVar267._16_4_ = uVar4;
                auVar267._20_4_ = uVar4;
                auVar267._24_4_ = uVar4;
                auVar267._28_4_ = uVar4;
                auVar267._32_4_ = uVar4;
                auVar267._36_4_ = uVar4;
                auVar267._40_4_ = uVar4;
                auVar267._44_4_ = uVar4;
                auVar267._48_4_ = uVar4;
                auVar267._52_4_ = uVar4;
                auVar267._56_4_ = uVar4;
                auVar267._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar464,pauVar377[0xd],auVar267);
                uVar4 = puVar370[0xe];
                auVar268._4_4_ = uVar4;
                auVar268._0_4_ = uVar4;
                auVar268._8_4_ = uVar4;
                auVar268._12_4_ = uVar4;
                auVar268._16_4_ = uVar4;
                auVar268._20_4_ = uVar4;
                auVar268._24_4_ = uVar4;
                auVar268._28_4_ = uVar4;
                auVar268._32_4_ = uVar4;
                auVar268._36_4_ = uVar4;
                auVar268._40_4_ = uVar4;
                auVar268._44_4_ = uVar4;
                auVar268._48_4_ = uVar4;
                auVar268._52_4_ = uVar4;
                auVar268._56_4_ = uVar4;
                auVar268._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,pauVar377[0xe],auVar268);
                uVar4 = puVar370[0xf];
                auVar269._4_4_ = uVar4;
                auVar269._0_4_ = uVar4;
                auVar269._8_4_ = uVar4;
                auVar269._12_4_ = uVar4;
                auVar269._16_4_ = uVar4;
                auVar269._20_4_ = uVar4;
                auVar269._24_4_ = uVar4;
                auVar269._28_4_ = uVar4;
                auVar269._32_4_ = uVar4;
                auVar269._36_4_ = uVar4;
                auVar269._40_4_ = uVar4;
                auVar269._44_4_ = uVar4;
                auVar269._48_4_ = uVar4;
                auVar269._52_4_ = uVar4;
                auVar269._56_4_ = uVar4;
                auVar269._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,pauVar377[0xf],auVar269);
                pauVar377 = pauVar377 + 0x10;
                puVar370 = puVar370 + lVar424;
              }
              pauVar405 = pauVar405 + uVar417 * 0x10;
            }
            else {
              puVar370 = (undefined4 *)((long)local_188.data + lVar369 + (long)iVar362 * 4);
            }
            if (local_188.elempack == 8) {
              puVar373 = puVar370 + 7;
              uVar374 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar374, uVar374 = (ulong)(iVar384 - 1), iVar384 != 0) {
                in_ZMM26 = pauVar377[0xc];
                in_ZMM28 = pauVar377[0xe];
                in_ZMM31 = pauVar377[0xf];
                uVar4 = puVar373[-7];
                auVar270._4_4_ = uVar4;
                auVar270._0_4_ = uVar4;
                auVar270._8_4_ = uVar4;
                auVar270._12_4_ = uVar4;
                auVar270._16_4_ = uVar4;
                auVar270._20_4_ = uVar4;
                auVar270._24_4_ = uVar4;
                auVar270._28_4_ = uVar4;
                auVar270._32_4_ = uVar4;
                auVar270._36_4_ = uVar4;
                auVar270._40_4_ = uVar4;
                auVar270._44_4_ = uVar4;
                auVar270._48_4_ = uVar4;
                auVar270._52_4_ = uVar4;
                auVar270._56_4_ = uVar4;
                auVar270._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar270);
                uVar4 = puVar373[-6];
                auVar271._4_4_ = uVar4;
                auVar271._0_4_ = uVar4;
                auVar271._8_4_ = uVar4;
                auVar271._12_4_ = uVar4;
                auVar271._16_4_ = uVar4;
                auVar271._20_4_ = uVar4;
                auVar271._24_4_ = uVar4;
                auVar271._28_4_ = uVar4;
                auVar271._32_4_ = uVar4;
                auVar271._36_4_ = uVar4;
                auVar271._40_4_ = uVar4;
                auVar271._44_4_ = uVar4;
                auVar271._48_4_ = uVar4;
                auVar271._52_4_ = uVar4;
                auVar271._56_4_ = uVar4;
                auVar271._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar271);
                uVar4 = puVar373[-5];
                auVar272._4_4_ = uVar4;
                auVar272._0_4_ = uVar4;
                auVar272._8_4_ = uVar4;
                auVar272._12_4_ = uVar4;
                auVar272._16_4_ = uVar4;
                auVar272._20_4_ = uVar4;
                auVar272._24_4_ = uVar4;
                auVar272._28_4_ = uVar4;
                auVar272._32_4_ = uVar4;
                auVar272._36_4_ = uVar4;
                auVar272._40_4_ = uVar4;
                auVar272._44_4_ = uVar4;
                auVar272._48_4_ = uVar4;
                auVar272._52_4_ = uVar4;
                auVar272._56_4_ = uVar4;
                auVar272._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar272);
                uVar4 = puVar373[-4];
                auVar273._4_4_ = uVar4;
                auVar273._0_4_ = uVar4;
                auVar273._8_4_ = uVar4;
                auVar273._12_4_ = uVar4;
                auVar273._16_4_ = uVar4;
                auVar273._20_4_ = uVar4;
                auVar273._24_4_ = uVar4;
                auVar273._28_4_ = uVar4;
                auVar273._32_4_ = uVar4;
                auVar273._36_4_ = uVar4;
                auVar273._40_4_ = uVar4;
                auVar273._44_4_ = uVar4;
                auVar273._48_4_ = uVar4;
                auVar273._52_4_ = uVar4;
                auVar273._56_4_ = uVar4;
                auVar273._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar273);
                uVar4 = puVar373[-3];
                auVar274._4_4_ = uVar4;
                auVar274._0_4_ = uVar4;
                auVar274._8_4_ = uVar4;
                auVar274._12_4_ = uVar4;
                auVar274._16_4_ = uVar4;
                auVar274._20_4_ = uVar4;
                auVar274._24_4_ = uVar4;
                auVar274._28_4_ = uVar4;
                auVar274._32_4_ = uVar4;
                auVar274._36_4_ = uVar4;
                auVar274._40_4_ = uVar4;
                auVar274._44_4_ = uVar4;
                auVar274._48_4_ = uVar4;
                auVar274._52_4_ = uVar4;
                auVar274._56_4_ = uVar4;
                auVar274._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[4],auVar274);
                uVar4 = puVar373[-2];
                auVar275._4_4_ = uVar4;
                auVar275._0_4_ = uVar4;
                auVar275._8_4_ = uVar4;
                auVar275._12_4_ = uVar4;
                auVar275._16_4_ = uVar4;
                auVar275._20_4_ = uVar4;
                auVar275._24_4_ = uVar4;
                auVar275._28_4_ = uVar4;
                auVar275._32_4_ = uVar4;
                auVar275._36_4_ = uVar4;
                auVar275._40_4_ = uVar4;
                auVar275._44_4_ = uVar4;
                auVar275._48_4_ = uVar4;
                auVar275._52_4_ = uVar4;
                auVar275._56_4_ = uVar4;
                auVar275._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[5],auVar275);
                uVar4 = puVar373[-1];
                auVar276._4_4_ = uVar4;
                auVar276._0_4_ = uVar4;
                auVar276._8_4_ = uVar4;
                auVar276._12_4_ = uVar4;
                auVar276._16_4_ = uVar4;
                auVar276._20_4_ = uVar4;
                auVar276._24_4_ = uVar4;
                auVar276._28_4_ = uVar4;
                auVar276._32_4_ = uVar4;
                auVar276._36_4_ = uVar4;
                auVar276._40_4_ = uVar4;
                auVar276._44_4_ = uVar4;
                auVar276._48_4_ = uVar4;
                auVar276._52_4_ = uVar4;
                auVar276._56_4_ = uVar4;
                auVar276._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar276);
                uVar4 = *puVar373;
                auVar277._4_4_ = uVar4;
                auVar277._0_4_ = uVar4;
                auVar277._8_4_ = uVar4;
                auVar277._12_4_ = uVar4;
                auVar277._16_4_ = uVar4;
                auVar277._20_4_ = uVar4;
                auVar277._24_4_ = uVar4;
                auVar277._28_4_ = uVar4;
                auVar277._32_4_ = uVar4;
                auVar277._36_4_ = uVar4;
                auVar277._40_4_ = uVar4;
                auVar277._44_4_ = uVar4;
                auVar277._48_4_ = uVar4;
                auVar277._52_4_ = uVar4;
                auVar277._56_4_ = uVar4;
                auVar277._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar277);
                uVar4 = puVar373[lVar394 + -7];
                auVar278._4_4_ = uVar4;
                auVar278._0_4_ = uVar4;
                auVar278._8_4_ = uVar4;
                auVar278._12_4_ = uVar4;
                auVar278._16_4_ = uVar4;
                auVar278._20_4_ = uVar4;
                auVar278._24_4_ = uVar4;
                auVar278._28_4_ = uVar4;
                auVar278._32_4_ = uVar4;
                auVar278._36_4_ = uVar4;
                auVar278._40_4_ = uVar4;
                auVar278._44_4_ = uVar4;
                auVar278._48_4_ = uVar4;
                auVar278._52_4_ = uVar4;
                auVar278._56_4_ = uVar4;
                auVar278._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[8],auVar278);
                uVar4 = puVar373[lVar394 + -6];
                auVar279._4_4_ = uVar4;
                auVar279._0_4_ = uVar4;
                auVar279._8_4_ = uVar4;
                auVar279._12_4_ = uVar4;
                auVar279._16_4_ = uVar4;
                auVar279._20_4_ = uVar4;
                auVar279._24_4_ = uVar4;
                auVar279._28_4_ = uVar4;
                auVar279._32_4_ = uVar4;
                auVar279._36_4_ = uVar4;
                auVar279._40_4_ = uVar4;
                auVar279._44_4_ = uVar4;
                auVar279._48_4_ = uVar4;
                auVar279._52_4_ = uVar4;
                auVar279._56_4_ = uVar4;
                auVar279._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[9],auVar279);
                uVar4 = puVar373[lVar394 + -5];
                auVar280._4_4_ = uVar4;
                auVar280._0_4_ = uVar4;
                auVar280._8_4_ = uVar4;
                auVar280._12_4_ = uVar4;
                auVar280._16_4_ = uVar4;
                auVar280._20_4_ = uVar4;
                auVar280._24_4_ = uVar4;
                auVar280._28_4_ = uVar4;
                auVar280._32_4_ = uVar4;
                auVar280._36_4_ = uVar4;
                auVar280._40_4_ = uVar4;
                auVar280._44_4_ = uVar4;
                auVar280._48_4_ = uVar4;
                auVar280._52_4_ = uVar4;
                auVar280._56_4_ = uVar4;
                auVar280._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[10],auVar280);
                uVar4 = puVar373[lVar394 + -4];
                auVar281._4_4_ = uVar4;
                auVar281._0_4_ = uVar4;
                auVar281._8_4_ = uVar4;
                auVar281._12_4_ = uVar4;
                auVar281._16_4_ = uVar4;
                auVar281._20_4_ = uVar4;
                auVar281._24_4_ = uVar4;
                auVar281._28_4_ = uVar4;
                auVar281._32_4_ = uVar4;
                auVar281._36_4_ = uVar4;
                auVar281._40_4_ = uVar4;
                auVar281._44_4_ = uVar4;
                auVar281._48_4_ = uVar4;
                auVar281._52_4_ = uVar4;
                auVar281._56_4_ = uVar4;
                auVar281._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[0xb],auVar281);
                uVar4 = puVar373[lVar394 + -3];
                auVar282._4_4_ = uVar4;
                auVar282._0_4_ = uVar4;
                auVar282._8_4_ = uVar4;
                auVar282._12_4_ = uVar4;
                auVar282._16_4_ = uVar4;
                auVar282._20_4_ = uVar4;
                auVar282._24_4_ = uVar4;
                auVar282._28_4_ = uVar4;
                auVar282._32_4_ = uVar4;
                auVar282._36_4_ = uVar4;
                auVar282._40_4_ = uVar4;
                auVar282._44_4_ = uVar4;
                auVar282._48_4_ = uVar4;
                auVar282._52_4_ = uVar4;
                auVar282._56_4_ = uVar4;
                auVar282._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,in_ZMM26,auVar282);
                uVar4 = puVar373[lVar394 + -2];
                auVar283._4_4_ = uVar4;
                auVar283._0_4_ = uVar4;
                auVar283._8_4_ = uVar4;
                auVar283._12_4_ = uVar4;
                auVar283._16_4_ = uVar4;
                auVar283._20_4_ = uVar4;
                auVar283._24_4_ = uVar4;
                auVar283._28_4_ = uVar4;
                auVar283._32_4_ = uVar4;
                auVar283._36_4_ = uVar4;
                auVar283._40_4_ = uVar4;
                auVar283._44_4_ = uVar4;
                auVar283._48_4_ = uVar4;
                auVar283._52_4_ = uVar4;
                auVar283._56_4_ = uVar4;
                auVar283._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar464,pauVar377[0xd],auVar283);
                uVar4 = puVar373[lVar394 + -1];
                auVar284._4_4_ = uVar4;
                auVar284._0_4_ = uVar4;
                auVar284._8_4_ = uVar4;
                auVar284._12_4_ = uVar4;
                auVar284._16_4_ = uVar4;
                auVar284._20_4_ = uVar4;
                auVar284._24_4_ = uVar4;
                auVar284._28_4_ = uVar4;
                auVar284._32_4_ = uVar4;
                auVar284._36_4_ = uVar4;
                auVar284._40_4_ = uVar4;
                auVar284._44_4_ = uVar4;
                auVar284._48_4_ = uVar4;
                auVar284._52_4_ = uVar4;
                auVar284._56_4_ = uVar4;
                auVar284._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,in_ZMM28,auVar284);
                uVar4 = puVar373[lVar394];
                auVar285._4_4_ = uVar4;
                auVar285._0_4_ = uVar4;
                auVar285._8_4_ = uVar4;
                auVar285._12_4_ = uVar4;
                auVar285._16_4_ = uVar4;
                auVar285._20_4_ = uVar4;
                auVar285._24_4_ = uVar4;
                auVar285._28_4_ = uVar4;
                auVar285._32_4_ = uVar4;
                auVar285._36_4_ = uVar4;
                auVar285._40_4_ = uVar4;
                auVar285._44_4_ = uVar4;
                auVar285._48_4_ = uVar4;
                auVar285._52_4_ = uVar4;
                auVar285._56_4_ = uVar4;
                auVar285._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,in_ZMM31,auVar285);
                pauVar377 = pauVar377 + 0x10;
                puVar373 = puVar373 + lVar388;
              }
              pauVar405 = pauVar405 + uVar417 * 0x10;
              puVar370 = puVar370 + lVar388 * uVar417;
            }
            if (local_188.elempack == 4) {
              puVar373 = puVar370 + 3;
              uVar374 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar374, uVar374 = (ulong)(iVar384 - 1), iVar384 != 0) {
                in_ZMM26 = pauVar377[0xc];
                in_ZMM28 = pauVar377[0xe];
                in_ZMM31 = pauVar377[0xf];
                uVar4 = puVar373[-3];
                auVar286._4_4_ = uVar4;
                auVar286._0_4_ = uVar4;
                auVar286._8_4_ = uVar4;
                auVar286._12_4_ = uVar4;
                auVar286._16_4_ = uVar4;
                auVar286._20_4_ = uVar4;
                auVar286._24_4_ = uVar4;
                auVar286._28_4_ = uVar4;
                auVar286._32_4_ = uVar4;
                auVar286._36_4_ = uVar4;
                auVar286._40_4_ = uVar4;
                auVar286._44_4_ = uVar4;
                auVar286._48_4_ = uVar4;
                auVar286._52_4_ = uVar4;
                auVar286._56_4_ = uVar4;
                auVar286._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar286);
                uVar4 = puVar373[-2];
                auVar287._4_4_ = uVar4;
                auVar287._0_4_ = uVar4;
                auVar287._8_4_ = uVar4;
                auVar287._12_4_ = uVar4;
                auVar287._16_4_ = uVar4;
                auVar287._20_4_ = uVar4;
                auVar287._24_4_ = uVar4;
                auVar287._28_4_ = uVar4;
                auVar287._32_4_ = uVar4;
                auVar287._36_4_ = uVar4;
                auVar287._40_4_ = uVar4;
                auVar287._44_4_ = uVar4;
                auVar287._48_4_ = uVar4;
                auVar287._52_4_ = uVar4;
                auVar287._56_4_ = uVar4;
                auVar287._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar287);
                uVar4 = puVar373[-1];
                auVar288._4_4_ = uVar4;
                auVar288._0_4_ = uVar4;
                auVar288._8_4_ = uVar4;
                auVar288._12_4_ = uVar4;
                auVar288._16_4_ = uVar4;
                auVar288._20_4_ = uVar4;
                auVar288._24_4_ = uVar4;
                auVar288._28_4_ = uVar4;
                auVar288._32_4_ = uVar4;
                auVar288._36_4_ = uVar4;
                auVar288._40_4_ = uVar4;
                auVar288._44_4_ = uVar4;
                auVar288._48_4_ = uVar4;
                auVar288._52_4_ = uVar4;
                auVar288._56_4_ = uVar4;
                auVar288._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar288);
                uVar4 = *puVar373;
                auVar289._4_4_ = uVar4;
                auVar289._0_4_ = uVar4;
                auVar289._8_4_ = uVar4;
                auVar289._12_4_ = uVar4;
                auVar289._16_4_ = uVar4;
                auVar289._20_4_ = uVar4;
                auVar289._24_4_ = uVar4;
                auVar289._28_4_ = uVar4;
                auVar289._32_4_ = uVar4;
                auVar289._36_4_ = uVar4;
                auVar289._40_4_ = uVar4;
                auVar289._44_4_ = uVar4;
                auVar289._48_4_ = uVar4;
                auVar289._52_4_ = uVar4;
                auVar289._56_4_ = uVar4;
                auVar289._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar289);
                uVar4 = puVar373[lVar394 + -3];
                auVar290._4_4_ = uVar4;
                auVar290._0_4_ = uVar4;
                auVar290._8_4_ = uVar4;
                auVar290._12_4_ = uVar4;
                auVar290._16_4_ = uVar4;
                auVar290._20_4_ = uVar4;
                auVar290._24_4_ = uVar4;
                auVar290._28_4_ = uVar4;
                auVar290._32_4_ = uVar4;
                auVar290._36_4_ = uVar4;
                auVar290._40_4_ = uVar4;
                auVar290._44_4_ = uVar4;
                auVar290._48_4_ = uVar4;
                auVar290._52_4_ = uVar4;
                auVar290._56_4_ = uVar4;
                auVar290._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[4],auVar290);
                uVar4 = puVar373[lVar394 + -2];
                auVar291._4_4_ = uVar4;
                auVar291._0_4_ = uVar4;
                auVar291._8_4_ = uVar4;
                auVar291._12_4_ = uVar4;
                auVar291._16_4_ = uVar4;
                auVar291._20_4_ = uVar4;
                auVar291._24_4_ = uVar4;
                auVar291._28_4_ = uVar4;
                auVar291._32_4_ = uVar4;
                auVar291._36_4_ = uVar4;
                auVar291._40_4_ = uVar4;
                auVar291._44_4_ = uVar4;
                auVar291._48_4_ = uVar4;
                auVar291._52_4_ = uVar4;
                auVar291._56_4_ = uVar4;
                auVar291._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[5],auVar291);
                uVar4 = puVar373[lVar394 + -1];
                auVar292._4_4_ = uVar4;
                auVar292._0_4_ = uVar4;
                auVar292._8_4_ = uVar4;
                auVar292._12_4_ = uVar4;
                auVar292._16_4_ = uVar4;
                auVar292._20_4_ = uVar4;
                auVar292._24_4_ = uVar4;
                auVar292._28_4_ = uVar4;
                auVar292._32_4_ = uVar4;
                auVar292._36_4_ = uVar4;
                auVar292._40_4_ = uVar4;
                auVar292._44_4_ = uVar4;
                auVar292._48_4_ = uVar4;
                auVar292._52_4_ = uVar4;
                auVar292._56_4_ = uVar4;
                auVar292._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar292);
                uVar4 = puVar373[lVar394];
                auVar293._4_4_ = uVar4;
                auVar293._0_4_ = uVar4;
                auVar293._8_4_ = uVar4;
                auVar293._12_4_ = uVar4;
                auVar293._16_4_ = uVar4;
                auVar293._20_4_ = uVar4;
                auVar293._24_4_ = uVar4;
                auVar293._28_4_ = uVar4;
                auVar293._32_4_ = uVar4;
                auVar293._36_4_ = uVar4;
                auVar293._40_4_ = uVar4;
                auVar293._44_4_ = uVar4;
                auVar293._48_4_ = uVar4;
                auVar293._52_4_ = uVar4;
                auVar293._56_4_ = uVar4;
                auVar293._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar293);
                uVar4 = puVar373[lVar419 + -3];
                auVar294._4_4_ = uVar4;
                auVar294._0_4_ = uVar4;
                auVar294._8_4_ = uVar4;
                auVar294._12_4_ = uVar4;
                auVar294._16_4_ = uVar4;
                auVar294._20_4_ = uVar4;
                auVar294._24_4_ = uVar4;
                auVar294._28_4_ = uVar4;
                auVar294._32_4_ = uVar4;
                auVar294._36_4_ = uVar4;
                auVar294._40_4_ = uVar4;
                auVar294._44_4_ = uVar4;
                auVar294._48_4_ = uVar4;
                auVar294._52_4_ = uVar4;
                auVar294._56_4_ = uVar4;
                auVar294._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[8],auVar294);
                uVar4 = puVar373[lVar419 + -2];
                auVar295._4_4_ = uVar4;
                auVar295._0_4_ = uVar4;
                auVar295._8_4_ = uVar4;
                auVar295._12_4_ = uVar4;
                auVar295._16_4_ = uVar4;
                auVar295._20_4_ = uVar4;
                auVar295._24_4_ = uVar4;
                auVar295._28_4_ = uVar4;
                auVar295._32_4_ = uVar4;
                auVar295._36_4_ = uVar4;
                auVar295._40_4_ = uVar4;
                auVar295._44_4_ = uVar4;
                auVar295._48_4_ = uVar4;
                auVar295._52_4_ = uVar4;
                auVar295._56_4_ = uVar4;
                auVar295._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[9],auVar295);
                uVar4 = puVar373[lVar419 + -1];
                auVar296._4_4_ = uVar4;
                auVar296._0_4_ = uVar4;
                auVar296._8_4_ = uVar4;
                auVar296._12_4_ = uVar4;
                auVar296._16_4_ = uVar4;
                auVar296._20_4_ = uVar4;
                auVar296._24_4_ = uVar4;
                auVar296._28_4_ = uVar4;
                auVar296._32_4_ = uVar4;
                auVar296._36_4_ = uVar4;
                auVar296._40_4_ = uVar4;
                auVar296._44_4_ = uVar4;
                auVar296._48_4_ = uVar4;
                auVar296._52_4_ = uVar4;
                auVar296._56_4_ = uVar4;
                auVar296._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[10],auVar296);
                uVar4 = puVar373[lVar419];
                auVar297._4_4_ = uVar4;
                auVar297._0_4_ = uVar4;
                auVar297._8_4_ = uVar4;
                auVar297._12_4_ = uVar4;
                auVar297._16_4_ = uVar4;
                auVar297._20_4_ = uVar4;
                auVar297._24_4_ = uVar4;
                auVar297._28_4_ = uVar4;
                auVar297._32_4_ = uVar4;
                auVar297._36_4_ = uVar4;
                auVar297._40_4_ = uVar4;
                auVar297._44_4_ = uVar4;
                auVar297._48_4_ = uVar4;
                auVar297._52_4_ = uVar4;
                auVar297._56_4_ = uVar4;
                auVar297._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[0xb],auVar297);
                uVar4 = puVar373[lVar414 + -3];
                auVar298._4_4_ = uVar4;
                auVar298._0_4_ = uVar4;
                auVar298._8_4_ = uVar4;
                auVar298._12_4_ = uVar4;
                auVar298._16_4_ = uVar4;
                auVar298._20_4_ = uVar4;
                auVar298._24_4_ = uVar4;
                auVar298._28_4_ = uVar4;
                auVar298._32_4_ = uVar4;
                auVar298._36_4_ = uVar4;
                auVar298._40_4_ = uVar4;
                auVar298._44_4_ = uVar4;
                auVar298._48_4_ = uVar4;
                auVar298._52_4_ = uVar4;
                auVar298._56_4_ = uVar4;
                auVar298._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,in_ZMM26,auVar298);
                uVar4 = puVar373[lVar414 + -2];
                auVar299._4_4_ = uVar4;
                auVar299._0_4_ = uVar4;
                auVar299._8_4_ = uVar4;
                auVar299._12_4_ = uVar4;
                auVar299._16_4_ = uVar4;
                auVar299._20_4_ = uVar4;
                auVar299._24_4_ = uVar4;
                auVar299._28_4_ = uVar4;
                auVar299._32_4_ = uVar4;
                auVar299._36_4_ = uVar4;
                auVar299._40_4_ = uVar4;
                auVar299._44_4_ = uVar4;
                auVar299._48_4_ = uVar4;
                auVar299._52_4_ = uVar4;
                auVar299._56_4_ = uVar4;
                auVar299._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar464,pauVar377[0xd],auVar299);
                uVar4 = puVar373[lVar414 + -1];
                auVar300._4_4_ = uVar4;
                auVar300._0_4_ = uVar4;
                auVar300._8_4_ = uVar4;
                auVar300._12_4_ = uVar4;
                auVar300._16_4_ = uVar4;
                auVar300._20_4_ = uVar4;
                auVar300._24_4_ = uVar4;
                auVar300._28_4_ = uVar4;
                auVar300._32_4_ = uVar4;
                auVar300._36_4_ = uVar4;
                auVar300._40_4_ = uVar4;
                auVar300._44_4_ = uVar4;
                auVar300._48_4_ = uVar4;
                auVar300._52_4_ = uVar4;
                auVar300._56_4_ = uVar4;
                auVar300._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,in_ZMM28,auVar300);
                uVar4 = puVar373[lVar414];
                auVar301._4_4_ = uVar4;
                auVar301._0_4_ = uVar4;
                auVar301._8_4_ = uVar4;
                auVar301._12_4_ = uVar4;
                auVar301._16_4_ = uVar4;
                auVar301._20_4_ = uVar4;
                auVar301._24_4_ = uVar4;
                auVar301._28_4_ = uVar4;
                auVar301._32_4_ = uVar4;
                auVar301._36_4_ = uVar4;
                auVar301._40_4_ = uVar4;
                auVar301._44_4_ = uVar4;
                auVar301._48_4_ = uVar4;
                auVar301._52_4_ = uVar4;
                auVar301._56_4_ = uVar4;
                auVar301._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,in_ZMM31,auVar301);
                pauVar377 = pauVar377 + 0x10;
                puVar373 = puVar373 + lVar421;
              }
              pauVar405 = pauVar405 + uVar417 * 0x10;
              puVar370 = puVar370 + lVar421 * uVar417;
            }
            uVar374 = uVar417;
            pauVar377 = pauVar405;
            if (local_188.elempack == 1) {
              while ((int)uVar374 != 0) {
                in_ZMM26 = pauVar377[0xc];
                in_ZMM28 = pauVar377[0xe];
                in_ZMM31 = pauVar377[0xf];
                uVar4 = *puVar370;
                auVar302._4_4_ = uVar4;
                auVar302._0_4_ = uVar4;
                auVar302._8_4_ = uVar4;
                auVar302._12_4_ = uVar4;
                auVar302._16_4_ = uVar4;
                auVar302._20_4_ = uVar4;
                auVar302._24_4_ = uVar4;
                auVar302._28_4_ = uVar4;
                auVar302._32_4_ = uVar4;
                auVar302._36_4_ = uVar4;
                auVar302._40_4_ = uVar4;
                auVar302._44_4_ = uVar4;
                auVar302._48_4_ = uVar4;
                auVar302._52_4_ = uVar4;
                auVar302._56_4_ = uVar4;
                auVar302._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar302);
                uVar4 = puVar370[lVar394];
                auVar303._4_4_ = uVar4;
                auVar303._0_4_ = uVar4;
                auVar303._8_4_ = uVar4;
                auVar303._12_4_ = uVar4;
                auVar303._16_4_ = uVar4;
                auVar303._20_4_ = uVar4;
                auVar303._24_4_ = uVar4;
                auVar303._28_4_ = uVar4;
                auVar303._32_4_ = uVar4;
                auVar303._36_4_ = uVar4;
                auVar303._40_4_ = uVar4;
                auVar303._44_4_ = uVar4;
                auVar303._48_4_ = uVar4;
                auVar303._52_4_ = uVar4;
                auVar303._56_4_ = uVar4;
                auVar303._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar303);
                uVar4 = puVar370[lVar419];
                auVar304._4_4_ = uVar4;
                auVar304._0_4_ = uVar4;
                auVar304._8_4_ = uVar4;
                auVar304._12_4_ = uVar4;
                auVar304._16_4_ = uVar4;
                auVar304._20_4_ = uVar4;
                auVar304._24_4_ = uVar4;
                auVar304._28_4_ = uVar4;
                auVar304._32_4_ = uVar4;
                auVar304._36_4_ = uVar4;
                auVar304._40_4_ = uVar4;
                auVar304._44_4_ = uVar4;
                auVar304._48_4_ = uVar4;
                auVar304._52_4_ = uVar4;
                auVar304._56_4_ = uVar4;
                auVar304._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar304);
                uVar4 = puVar370[lVar414];
                auVar305._4_4_ = uVar4;
                auVar305._0_4_ = uVar4;
                auVar305._8_4_ = uVar4;
                auVar305._12_4_ = uVar4;
                auVar305._16_4_ = uVar4;
                auVar305._20_4_ = uVar4;
                auVar305._24_4_ = uVar4;
                auVar305._28_4_ = uVar4;
                auVar305._32_4_ = uVar4;
                auVar305._36_4_ = uVar4;
                auVar305._40_4_ = uVar4;
                auVar305._44_4_ = uVar4;
                auVar305._48_4_ = uVar4;
                auVar305._52_4_ = uVar4;
                auVar305._56_4_ = uVar4;
                auVar305._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar305);
                uVar4 = puVar370[auVar459._16_8_];
                auVar306._4_4_ = uVar4;
                auVar306._0_4_ = uVar4;
                auVar306._8_4_ = uVar4;
                auVar306._12_4_ = uVar4;
                auVar306._16_4_ = uVar4;
                auVar306._20_4_ = uVar4;
                auVar306._24_4_ = uVar4;
                auVar306._28_4_ = uVar4;
                auVar306._32_4_ = uVar4;
                auVar306._36_4_ = uVar4;
                auVar306._40_4_ = uVar4;
                auVar306._44_4_ = uVar4;
                auVar306._48_4_ = uVar4;
                auVar306._52_4_ = uVar4;
                auVar306._56_4_ = uVar4;
                auVar306._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[4],auVar306);
                uVar4 = puVar370[lVar410];
                auVar307._4_4_ = uVar4;
                auVar307._0_4_ = uVar4;
                auVar307._8_4_ = uVar4;
                auVar307._12_4_ = uVar4;
                auVar307._16_4_ = uVar4;
                auVar307._20_4_ = uVar4;
                auVar307._24_4_ = uVar4;
                auVar307._28_4_ = uVar4;
                auVar307._32_4_ = uVar4;
                auVar307._36_4_ = uVar4;
                auVar307._40_4_ = uVar4;
                auVar307._44_4_ = uVar4;
                auVar307._48_4_ = uVar4;
                auVar307._52_4_ = uVar4;
                auVar307._56_4_ = uVar4;
                auVar307._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[5],auVar307);
                uVar4 = puVar370[lVar527];
                auVar308._4_4_ = uVar4;
                auVar308._0_4_ = uVar4;
                auVar308._8_4_ = uVar4;
                auVar308._12_4_ = uVar4;
                auVar308._16_4_ = uVar4;
                auVar308._20_4_ = uVar4;
                auVar308._24_4_ = uVar4;
                auVar308._28_4_ = uVar4;
                auVar308._32_4_ = uVar4;
                auVar308._36_4_ = uVar4;
                auVar308._40_4_ = uVar4;
                auVar308._44_4_ = uVar4;
                auVar308._48_4_ = uVar4;
                auVar308._52_4_ = uVar4;
                auVar308._56_4_ = uVar4;
                auVar308._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar308);
                uVar4 = puVar370[lVar8];
                auVar309._4_4_ = uVar4;
                auVar309._0_4_ = uVar4;
                auVar309._8_4_ = uVar4;
                auVar309._12_4_ = uVar4;
                auVar309._16_4_ = uVar4;
                auVar309._20_4_ = uVar4;
                auVar309._24_4_ = uVar4;
                auVar309._28_4_ = uVar4;
                auVar309._32_4_ = uVar4;
                auVar309._36_4_ = uVar4;
                auVar309._40_4_ = uVar4;
                auVar309._44_4_ = uVar4;
                auVar309._48_4_ = uVar4;
                auVar309._52_4_ = uVar4;
                auVar309._56_4_ = uVar4;
                auVar309._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar309);
                uVar4 = puVar370[lVar528];
                auVar310._4_4_ = uVar4;
                auVar310._0_4_ = uVar4;
                auVar310._8_4_ = uVar4;
                auVar310._12_4_ = uVar4;
                auVar310._16_4_ = uVar4;
                auVar310._20_4_ = uVar4;
                auVar310._24_4_ = uVar4;
                auVar310._28_4_ = uVar4;
                auVar310._32_4_ = uVar4;
                auVar310._36_4_ = uVar4;
                auVar310._40_4_ = uVar4;
                auVar310._44_4_ = uVar4;
                auVar310._48_4_ = uVar4;
                auVar310._52_4_ = uVar4;
                auVar310._56_4_ = uVar4;
                auVar310._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[8],auVar310);
                uVar4 = puVar370[lVar383];
                auVar311._4_4_ = uVar4;
                auVar311._0_4_ = uVar4;
                auVar311._8_4_ = uVar4;
                auVar311._12_4_ = uVar4;
                auVar311._16_4_ = uVar4;
                auVar311._20_4_ = uVar4;
                auVar311._24_4_ = uVar4;
                auVar311._28_4_ = uVar4;
                auVar311._32_4_ = uVar4;
                auVar311._36_4_ = uVar4;
                auVar311._40_4_ = uVar4;
                auVar311._44_4_ = uVar4;
                auVar311._48_4_ = uVar4;
                auVar311._52_4_ = uVar4;
                auVar311._56_4_ = uVar4;
                auVar311._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar464,pauVar377[9],auVar311);
                uVar4 = puVar370[lVar495];
                auVar312._4_4_ = uVar4;
                auVar312._0_4_ = uVar4;
                auVar312._8_4_ = uVar4;
                auVar312._12_4_ = uVar4;
                auVar312._16_4_ = uVar4;
                auVar312._20_4_ = uVar4;
                auVar312._24_4_ = uVar4;
                auVar312._28_4_ = uVar4;
                auVar312._32_4_ = uVar4;
                auVar312._36_4_ = uVar4;
                auVar312._40_4_ = uVar4;
                auVar312._44_4_ = uVar4;
                auVar312._48_4_ = uVar4;
                auVar312._52_4_ = uVar4;
                auVar312._56_4_ = uVar4;
                auVar312._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f(auVar465,pauVar377[10],auVar312);
                uVar4 = puVar370[lVar9];
                auVar313._4_4_ = uVar4;
                auVar313._0_4_ = uVar4;
                auVar313._8_4_ = uVar4;
                auVar313._12_4_ = uVar4;
                auVar313._16_4_ = uVar4;
                auVar313._20_4_ = uVar4;
                auVar313._24_4_ = uVar4;
                auVar313._28_4_ = uVar4;
                auVar313._32_4_ = uVar4;
                auVar313._36_4_ = uVar4;
                auVar313._40_4_ = uVar4;
                auVar313._44_4_ = uVar4;
                auVar313._48_4_ = uVar4;
                auVar313._52_4_ = uVar4;
                auVar313._56_4_ = uVar4;
                auVar313._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar377[0xb],auVar313);
                uVar4 = puVar370[lVar529];
                auVar314._4_4_ = uVar4;
                auVar314._0_4_ = uVar4;
                auVar314._8_4_ = uVar4;
                auVar314._12_4_ = uVar4;
                auVar314._16_4_ = uVar4;
                auVar314._20_4_ = uVar4;
                auVar314._24_4_ = uVar4;
                auVar314._28_4_ = uVar4;
                auVar314._32_4_ = uVar4;
                auVar314._36_4_ = uVar4;
                auVar314._40_4_ = uVar4;
                auVar314._44_4_ = uVar4;
                auVar314._48_4_ = uVar4;
                auVar314._52_4_ = uVar4;
                auVar314._56_4_ = uVar4;
                auVar314._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,in_ZMM26,auVar314);
                uVar4 = puVar370[lVar376];
                auVar315._4_4_ = uVar4;
                auVar315._0_4_ = uVar4;
                auVar315._8_4_ = uVar4;
                auVar315._12_4_ = uVar4;
                auVar315._16_4_ = uVar4;
                auVar315._20_4_ = uVar4;
                auVar315._24_4_ = uVar4;
                auVar315._28_4_ = uVar4;
                auVar315._32_4_ = uVar4;
                auVar315._36_4_ = uVar4;
                auVar315._40_4_ = uVar4;
                auVar315._44_4_ = uVar4;
                auVar315._48_4_ = uVar4;
                auVar315._52_4_ = uVar4;
                auVar315._56_4_ = uVar4;
                auVar315._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar464,pauVar377[0xd],auVar315);
                uVar4 = puVar370[lVar364];
                auVar316._4_4_ = uVar4;
                auVar316._0_4_ = uVar4;
                auVar316._8_4_ = uVar4;
                auVar316._12_4_ = uVar4;
                auVar316._16_4_ = uVar4;
                auVar316._20_4_ = uVar4;
                auVar316._24_4_ = uVar4;
                auVar316._28_4_ = uVar4;
                auVar316._32_4_ = uVar4;
                auVar316._36_4_ = uVar4;
                auVar316._40_4_ = uVar4;
                auVar316._44_4_ = uVar4;
                auVar316._48_4_ = uVar4;
                auVar316._52_4_ = uVar4;
                auVar316._56_4_ = uVar4;
                auVar316._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,in_ZMM28,auVar316);
                uVar4 = puVar370[lVar365];
                auVar317._4_4_ = uVar4;
                auVar317._0_4_ = uVar4;
                auVar317._8_4_ = uVar4;
                auVar317._12_4_ = uVar4;
                auVar317._16_4_ = uVar4;
                auVar317._20_4_ = uVar4;
                auVar317._24_4_ = uVar4;
                auVar317._28_4_ = uVar4;
                auVar317._32_4_ = uVar4;
                auVar317._36_4_ = uVar4;
                auVar317._40_4_ = uVar4;
                auVar317._44_4_ = uVar4;
                auVar317._48_4_ = uVar4;
                auVar317._52_4_ = uVar4;
                auVar317._56_4_ = uVar4;
                auVar317._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,in_ZMM31,auVar317);
                puVar370 = puVar370 + lVar425;
                uVar374 = (ulong)((int)uVar374 - 1);
                pauVar377 = pauVar377 + 0x10;
              }
              pauVar405 = pauVar405 + uVar417 * 0x10;
            }
            uVar390 = uVar390 + 0x10;
            lVar418 = lVar418 + lVar389 * 0x10;
            puVar395 = puVar395 + lVar389 * 4;
          }
          for (; (int)((uint)uVar390 | 7) < local_350; uVar390 = uVar390 + 8) {
            lVar369 = (int)((long)((ulong)(uint)((int)(uint)uVar390 >> 0x1f) << 0x20 |
                                  uVar390 & 0xffffffff) / (long)local_188.elempack) * lVar389;
            if (local_188.elempack == 8) {
              puVar370 = (undefined4 *)((long)local_188.data + lVar369 + (long)iVar403 * 4);
              uVar374 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar374, uVar374 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = *puVar370;
                auVar464._4_4_ = uVar4;
                auVar464._0_4_ = uVar4;
                auVar464._8_4_ = uVar4;
                auVar464._12_4_ = uVar4;
                auVar464._16_4_ = uVar4;
                auVar464._20_4_ = uVar4;
                auVar464._24_4_ = uVar4;
                auVar464._28_4_ = uVar4;
                auVar464._32_4_ = uVar4;
                auVar464._36_4_ = uVar4;
                auVar464._40_4_ = uVar4;
                auVar464._44_4_ = uVar4;
                auVar464._48_4_ = uVar4;
                auVar464._52_4_ = uVar4;
                auVar464._56_4_ = uVar4;
                auVar464._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar464);
                uVar4 = puVar370[1];
                auVar533._4_4_ = uVar4;
                auVar533._0_4_ = uVar4;
                auVar533._8_4_ = uVar4;
                auVar533._12_4_ = uVar4;
                auVar533._16_4_ = uVar4;
                auVar533._20_4_ = uVar4;
                auVar533._24_4_ = uVar4;
                auVar533._28_4_ = uVar4;
                auVar533._32_4_ = uVar4;
                auVar533._36_4_ = uVar4;
                auVar533._40_4_ = uVar4;
                auVar533._44_4_ = uVar4;
                auVar533._48_4_ = uVar4;
                auVar533._52_4_ = uVar4;
                auVar533._56_4_ = uVar4;
                auVar533._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar533);
                uVar4 = puVar370[2];
                auVar465._4_4_ = uVar4;
                auVar465._0_4_ = uVar4;
                auVar465._8_4_ = uVar4;
                auVar465._12_4_ = uVar4;
                auVar465._16_4_ = uVar4;
                auVar465._20_4_ = uVar4;
                auVar465._24_4_ = uVar4;
                auVar465._28_4_ = uVar4;
                auVar465._32_4_ = uVar4;
                auVar465._36_4_ = uVar4;
                auVar465._40_4_ = uVar4;
                auVar465._44_4_ = uVar4;
                auVar465._48_4_ = uVar4;
                auVar465._52_4_ = uVar4;
                auVar465._56_4_ = uVar4;
                auVar465._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar465);
                uVar4 = puVar370[3];
                auVar466._4_4_ = uVar4;
                auVar466._0_4_ = uVar4;
                auVar466._8_4_ = uVar4;
                auVar466._12_4_ = uVar4;
                auVar466._16_4_ = uVar4;
                auVar466._20_4_ = uVar4;
                auVar466._24_4_ = uVar4;
                auVar466._28_4_ = uVar4;
                auVar466._32_4_ = uVar4;
                auVar466._36_4_ = uVar4;
                auVar466._40_4_ = uVar4;
                auVar466._44_4_ = uVar4;
                auVar466._48_4_ = uVar4;
                auVar466._52_4_ = uVar4;
                auVar466._56_4_ = uVar4;
                auVar466._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar466);
                uVar4 = puVar370[4];
                auVar469._4_4_ = uVar4;
                auVar469._0_4_ = uVar4;
                auVar469._8_4_ = uVar4;
                auVar469._12_4_ = uVar4;
                auVar469._16_4_ = uVar4;
                auVar469._20_4_ = uVar4;
                auVar469._24_4_ = uVar4;
                auVar469._28_4_ = uVar4;
                auVar469._32_4_ = uVar4;
                auVar469._36_4_ = uVar4;
                auVar469._40_4_ = uVar4;
                auVar469._44_4_ = uVar4;
                auVar469._48_4_ = uVar4;
                auVar469._52_4_ = uVar4;
                auVar469._56_4_ = uVar4;
                auVar469._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar464,pauVar377[4],auVar469);
                uVar4 = puVar370[5];
                auVar471._4_4_ = uVar4;
                auVar471._0_4_ = uVar4;
                auVar471._8_4_ = uVar4;
                auVar471._12_4_ = uVar4;
                auVar471._16_4_ = uVar4;
                auVar471._20_4_ = uVar4;
                auVar471._24_4_ = uVar4;
                auVar471._28_4_ = uVar4;
                auVar471._32_4_ = uVar4;
                auVar471._36_4_ = uVar4;
                auVar471._40_4_ = uVar4;
                auVar471._44_4_ = uVar4;
                auVar471._48_4_ = uVar4;
                auVar471._52_4_ = uVar4;
                auVar471._56_4_ = uVar4;
                auVar471._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar467,pauVar377[5],auVar471);
                uVar4 = puVar370[6];
                auVar467._4_4_ = uVar4;
                auVar467._0_4_ = uVar4;
                auVar467._8_4_ = uVar4;
                auVar467._12_4_ = uVar4;
                auVar467._16_4_ = uVar4;
                auVar467._20_4_ = uVar4;
                auVar467._24_4_ = uVar4;
                auVar467._28_4_ = uVar4;
                auVar467._32_4_ = uVar4;
                auVar467._36_4_ = uVar4;
                auVar467._40_4_ = uVar4;
                auVar467._44_4_ = uVar4;
                auVar467._48_4_ = uVar4;
                auVar467._52_4_ = uVar4;
                auVar467._56_4_ = uVar4;
                auVar467._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar467);
                uVar4 = puVar370[7];
                auVar318._4_4_ = uVar4;
                auVar318._0_4_ = uVar4;
                auVar318._8_4_ = uVar4;
                auVar318._12_4_ = uVar4;
                auVar318._16_4_ = uVar4;
                auVar318._20_4_ = uVar4;
                auVar318._24_4_ = uVar4;
                auVar318._28_4_ = uVar4;
                auVar318._32_4_ = uVar4;
                auVar318._36_4_ = uVar4;
                auVar318._40_4_ = uVar4;
                auVar318._44_4_ = uVar4;
                auVar318._48_4_ = uVar4;
                auVar318._52_4_ = uVar4;
                auVar318._56_4_ = uVar4;
                auVar318._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar318);
                pauVar377 = pauVar377 + 8;
                puVar370 = puVar370 + lVar388;
              }
              pauVar405 = pauVar405 + uVar417 * 8;
            }
            else {
              puVar370 = (undefined4 *)((long)local_188.data + lVar369 + (long)iVar362 * 4);
            }
            if (local_188.elempack == 4) {
              puVar373 = puVar370 + 3;
              uVar374 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar374, uVar374 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = puVar373[-3];
                auVar319._4_4_ = uVar4;
                auVar319._0_4_ = uVar4;
                auVar319._8_4_ = uVar4;
                auVar319._12_4_ = uVar4;
                auVar319._16_4_ = uVar4;
                auVar319._20_4_ = uVar4;
                auVar319._24_4_ = uVar4;
                auVar319._28_4_ = uVar4;
                auVar319._32_4_ = uVar4;
                auVar319._36_4_ = uVar4;
                auVar319._40_4_ = uVar4;
                auVar319._44_4_ = uVar4;
                auVar319._48_4_ = uVar4;
                auVar319._52_4_ = uVar4;
                auVar319._56_4_ = uVar4;
                auVar319._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar319);
                uVar4 = puVar373[-2];
                auVar320._4_4_ = uVar4;
                auVar320._0_4_ = uVar4;
                auVar320._8_4_ = uVar4;
                auVar320._12_4_ = uVar4;
                auVar320._16_4_ = uVar4;
                auVar320._20_4_ = uVar4;
                auVar320._24_4_ = uVar4;
                auVar320._28_4_ = uVar4;
                auVar320._32_4_ = uVar4;
                auVar320._36_4_ = uVar4;
                auVar320._40_4_ = uVar4;
                auVar320._44_4_ = uVar4;
                auVar320._48_4_ = uVar4;
                auVar320._52_4_ = uVar4;
                auVar320._56_4_ = uVar4;
                auVar320._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar320);
                uVar4 = puVar373[-1];
                auVar321._4_4_ = uVar4;
                auVar321._0_4_ = uVar4;
                auVar321._8_4_ = uVar4;
                auVar321._12_4_ = uVar4;
                auVar321._16_4_ = uVar4;
                auVar321._20_4_ = uVar4;
                auVar321._24_4_ = uVar4;
                auVar321._28_4_ = uVar4;
                auVar321._32_4_ = uVar4;
                auVar321._36_4_ = uVar4;
                auVar321._40_4_ = uVar4;
                auVar321._44_4_ = uVar4;
                auVar321._48_4_ = uVar4;
                auVar321._52_4_ = uVar4;
                auVar321._56_4_ = uVar4;
                auVar321._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar321);
                uVar4 = *puVar373;
                auVar322._4_4_ = uVar4;
                auVar322._0_4_ = uVar4;
                auVar322._8_4_ = uVar4;
                auVar322._12_4_ = uVar4;
                auVar322._16_4_ = uVar4;
                auVar322._20_4_ = uVar4;
                auVar322._24_4_ = uVar4;
                auVar322._28_4_ = uVar4;
                auVar322._32_4_ = uVar4;
                auVar322._36_4_ = uVar4;
                auVar322._40_4_ = uVar4;
                auVar322._44_4_ = uVar4;
                auVar322._48_4_ = uVar4;
                auVar322._52_4_ = uVar4;
                auVar322._56_4_ = uVar4;
                auVar322._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar322);
                uVar4 = puVar373[lVar394 + -3];
                auVar323._4_4_ = uVar4;
                auVar323._0_4_ = uVar4;
                auVar323._8_4_ = uVar4;
                auVar323._12_4_ = uVar4;
                auVar323._16_4_ = uVar4;
                auVar323._20_4_ = uVar4;
                auVar323._24_4_ = uVar4;
                auVar323._28_4_ = uVar4;
                auVar323._32_4_ = uVar4;
                auVar323._36_4_ = uVar4;
                auVar323._40_4_ = uVar4;
                auVar323._44_4_ = uVar4;
                auVar323._48_4_ = uVar4;
                auVar323._52_4_ = uVar4;
                auVar323._56_4_ = uVar4;
                auVar323._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[4],auVar323);
                uVar4 = puVar373[lVar394 + -2];
                auVar324._4_4_ = uVar4;
                auVar324._0_4_ = uVar4;
                auVar324._8_4_ = uVar4;
                auVar324._12_4_ = uVar4;
                auVar324._16_4_ = uVar4;
                auVar324._20_4_ = uVar4;
                auVar324._24_4_ = uVar4;
                auVar324._28_4_ = uVar4;
                auVar324._32_4_ = uVar4;
                auVar324._36_4_ = uVar4;
                auVar324._40_4_ = uVar4;
                auVar324._44_4_ = uVar4;
                auVar324._48_4_ = uVar4;
                auVar324._52_4_ = uVar4;
                auVar324._56_4_ = uVar4;
                auVar324._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar464,pauVar377[5],auVar324);
                uVar4 = puVar373[lVar394 + -1];
                auVar325._4_4_ = uVar4;
                auVar325._0_4_ = uVar4;
                auVar325._8_4_ = uVar4;
                auVar325._12_4_ = uVar4;
                auVar325._16_4_ = uVar4;
                auVar325._20_4_ = uVar4;
                auVar325._24_4_ = uVar4;
                auVar325._28_4_ = uVar4;
                auVar325._32_4_ = uVar4;
                auVar325._36_4_ = uVar4;
                auVar325._40_4_ = uVar4;
                auVar325._44_4_ = uVar4;
                auVar325._48_4_ = uVar4;
                auVar325._52_4_ = uVar4;
                auVar325._56_4_ = uVar4;
                auVar325._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar325);
                uVar4 = puVar373[lVar394];
                auVar326._4_4_ = uVar4;
                auVar326._0_4_ = uVar4;
                auVar326._8_4_ = uVar4;
                auVar326._12_4_ = uVar4;
                auVar326._16_4_ = uVar4;
                auVar326._20_4_ = uVar4;
                auVar326._24_4_ = uVar4;
                auVar326._28_4_ = uVar4;
                auVar326._32_4_ = uVar4;
                auVar326._36_4_ = uVar4;
                auVar326._40_4_ = uVar4;
                auVar326._44_4_ = uVar4;
                auVar326._48_4_ = uVar4;
                auVar326._52_4_ = uVar4;
                auVar326._56_4_ = uVar4;
                auVar326._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar326);
                pauVar377 = pauVar377 + 8;
                puVar373 = puVar373 + lVar421;
              }
              pauVar405 = pauVar405 + uVar417 * 8;
              puVar370 = puVar370 + lVar421 * uVar417;
            }
            uVar374 = uVar417;
            pauVar377 = pauVar405;
            if (local_188.elempack == 1) {
              while ((int)uVar374 != 0) {
                uVar4 = *puVar370;
                auVar327._4_4_ = uVar4;
                auVar327._0_4_ = uVar4;
                auVar327._8_4_ = uVar4;
                auVar327._12_4_ = uVar4;
                auVar327._16_4_ = uVar4;
                auVar327._20_4_ = uVar4;
                auVar327._24_4_ = uVar4;
                auVar327._28_4_ = uVar4;
                auVar327._32_4_ = uVar4;
                auVar327._36_4_ = uVar4;
                auVar327._40_4_ = uVar4;
                auVar327._44_4_ = uVar4;
                auVar327._48_4_ = uVar4;
                auVar327._52_4_ = uVar4;
                auVar327._56_4_ = uVar4;
                auVar327._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar327);
                uVar4 = puVar370[lVar394];
                auVar328._4_4_ = uVar4;
                auVar328._0_4_ = uVar4;
                auVar328._8_4_ = uVar4;
                auVar328._12_4_ = uVar4;
                auVar328._16_4_ = uVar4;
                auVar328._20_4_ = uVar4;
                auVar328._24_4_ = uVar4;
                auVar328._28_4_ = uVar4;
                auVar328._32_4_ = uVar4;
                auVar328._36_4_ = uVar4;
                auVar328._40_4_ = uVar4;
                auVar328._44_4_ = uVar4;
                auVar328._48_4_ = uVar4;
                auVar328._52_4_ = uVar4;
                auVar328._56_4_ = uVar4;
                auVar328._60_4_ = uVar4;
                auVar464 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar328);
                uVar4 = puVar370[lVar419];
                auVar329._4_4_ = uVar4;
                auVar329._0_4_ = uVar4;
                auVar329._8_4_ = uVar4;
                auVar329._12_4_ = uVar4;
                auVar329._16_4_ = uVar4;
                auVar329._20_4_ = uVar4;
                auVar329._24_4_ = uVar4;
                auVar329._28_4_ = uVar4;
                auVar329._32_4_ = uVar4;
                auVar329._36_4_ = uVar4;
                auVar329._40_4_ = uVar4;
                auVar329._44_4_ = uVar4;
                auVar329._48_4_ = uVar4;
                auVar329._52_4_ = uVar4;
                auVar329._56_4_ = uVar4;
                auVar329._60_4_ = uVar4;
                auVar465 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar329);
                uVar4 = puVar370[lVar414];
                auVar330._4_4_ = uVar4;
                auVar330._0_4_ = uVar4;
                auVar330._8_4_ = uVar4;
                auVar330._12_4_ = uVar4;
                auVar330._16_4_ = uVar4;
                auVar330._20_4_ = uVar4;
                auVar330._24_4_ = uVar4;
                auVar330._28_4_ = uVar4;
                auVar330._32_4_ = uVar4;
                auVar330._36_4_ = uVar4;
                auVar330._40_4_ = uVar4;
                auVar330._44_4_ = uVar4;
                auVar330._48_4_ = uVar4;
                auVar330._52_4_ = uVar4;
                auVar330._56_4_ = uVar4;
                auVar330._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar330);
                uVar4 = puVar370[auVar459._16_8_];
                auVar331._4_4_ = uVar4;
                auVar331._0_4_ = uVar4;
                auVar331._8_4_ = uVar4;
                auVar331._12_4_ = uVar4;
                auVar331._16_4_ = uVar4;
                auVar331._20_4_ = uVar4;
                auVar331._24_4_ = uVar4;
                auVar331._28_4_ = uVar4;
                auVar331._32_4_ = uVar4;
                auVar331._36_4_ = uVar4;
                auVar331._40_4_ = uVar4;
                auVar331._44_4_ = uVar4;
                auVar331._48_4_ = uVar4;
                auVar331._52_4_ = uVar4;
                auVar331._56_4_ = uVar4;
                auVar331._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,pauVar377[4],auVar331);
                uVar4 = puVar370[lVar410];
                auVar332._4_4_ = uVar4;
                auVar332._0_4_ = uVar4;
                auVar332._8_4_ = uVar4;
                auVar332._12_4_ = uVar4;
                auVar332._16_4_ = uVar4;
                auVar332._20_4_ = uVar4;
                auVar332._24_4_ = uVar4;
                auVar332._28_4_ = uVar4;
                auVar332._32_4_ = uVar4;
                auVar332._36_4_ = uVar4;
                auVar332._40_4_ = uVar4;
                auVar332._44_4_ = uVar4;
                auVar332._48_4_ = uVar4;
                auVar332._52_4_ = uVar4;
                auVar332._56_4_ = uVar4;
                auVar332._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar464,pauVar377[5],auVar332);
                uVar4 = puVar370[lVar527];
                auVar333._4_4_ = uVar4;
                auVar333._0_4_ = uVar4;
                auVar333._8_4_ = uVar4;
                auVar333._12_4_ = uVar4;
                auVar333._16_4_ = uVar4;
                auVar333._20_4_ = uVar4;
                auVar333._24_4_ = uVar4;
                auVar333._28_4_ = uVar4;
                auVar333._32_4_ = uVar4;
                auVar333._36_4_ = uVar4;
                auVar333._40_4_ = uVar4;
                auVar333._44_4_ = uVar4;
                auVar333._48_4_ = uVar4;
                auVar333._52_4_ = uVar4;
                auVar333._56_4_ = uVar4;
                auVar333._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar465,pauVar377[6],auVar333);
                uVar4 = puVar370[lVar8];
                auVar334._4_4_ = uVar4;
                auVar334._0_4_ = uVar4;
                auVar334._8_4_ = uVar4;
                auVar334._12_4_ = uVar4;
                auVar334._16_4_ = uVar4;
                auVar334._20_4_ = uVar4;
                auVar334._24_4_ = uVar4;
                auVar334._28_4_ = uVar4;
                auVar334._32_4_ = uVar4;
                auVar334._36_4_ = uVar4;
                auVar334._40_4_ = uVar4;
                auVar334._44_4_ = uVar4;
                auVar334._48_4_ = uVar4;
                auVar334._52_4_ = uVar4;
                auVar334._56_4_ = uVar4;
                auVar334._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar466,pauVar377[7],auVar334);
                puVar370 = puVar370 + lVar425;
                uVar374 = (ulong)((int)uVar374 - 1);
                pauVar377 = pauVar377 + 8;
              }
              pauVar405 = pauVar405 + uVar417 * 8;
            }
            lVar418 = lVar418 + lVar389 * 8;
            puVar395 = puVar395 + lVar389 * 2;
          }
          for (; (int)((uint)uVar390 | 3) < local_350; uVar390 = uVar390 + 4) {
            lVar369 = (int)((long)((ulong)(uint)((int)(uint)uVar390 >> 0x1f) << 0x20 |
                                  uVar390 & 0xffffffff) / (long)local_188.elempack) * lVar389;
            if (local_188.elempack == 4) {
              puVar370 = (undefined4 *)((long)local_188.data + lVar369 + (long)iVar403 * 4);
              uVar374 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar374, uVar374 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = *puVar370;
                auVar335._4_4_ = uVar4;
                auVar335._0_4_ = uVar4;
                auVar335._8_4_ = uVar4;
                auVar335._12_4_ = uVar4;
                auVar335._16_4_ = uVar4;
                auVar335._20_4_ = uVar4;
                auVar335._24_4_ = uVar4;
                auVar335._28_4_ = uVar4;
                auVar335._32_4_ = uVar4;
                auVar335._36_4_ = uVar4;
                auVar335._40_4_ = uVar4;
                auVar335._44_4_ = uVar4;
                auVar335._48_4_ = uVar4;
                auVar335._52_4_ = uVar4;
                auVar335._56_4_ = uVar4;
                auVar335._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar335);
                uVar4 = puVar370[1];
                auVar336._4_4_ = uVar4;
                auVar336._0_4_ = uVar4;
                auVar336._8_4_ = uVar4;
                auVar336._12_4_ = uVar4;
                auVar336._16_4_ = uVar4;
                auVar336._20_4_ = uVar4;
                auVar336._24_4_ = uVar4;
                auVar336._28_4_ = uVar4;
                auVar336._32_4_ = uVar4;
                auVar336._36_4_ = uVar4;
                auVar336._40_4_ = uVar4;
                auVar336._44_4_ = uVar4;
                auVar336._48_4_ = uVar4;
                auVar336._52_4_ = uVar4;
                auVar336._56_4_ = uVar4;
                auVar336._60_4_ = uVar4;
                in_ZMM18 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar336);
                uVar4 = puVar370[2];
                auVar337._4_4_ = uVar4;
                auVar337._0_4_ = uVar4;
                auVar337._8_4_ = uVar4;
                auVar337._12_4_ = uVar4;
                auVar337._16_4_ = uVar4;
                auVar337._20_4_ = uVar4;
                auVar337._24_4_ = uVar4;
                auVar337._28_4_ = uVar4;
                auVar337._32_4_ = uVar4;
                auVar337._36_4_ = uVar4;
                auVar337._40_4_ = uVar4;
                auVar337._44_4_ = uVar4;
                auVar337._48_4_ = uVar4;
                auVar337._52_4_ = uVar4;
                auVar337._56_4_ = uVar4;
                auVar337._60_4_ = uVar4;
                in_ZMM17 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar337);
                uVar4 = puVar370[3];
                auVar338._4_4_ = uVar4;
                auVar338._0_4_ = uVar4;
                auVar338._8_4_ = uVar4;
                auVar338._12_4_ = uVar4;
                auVar338._16_4_ = uVar4;
                auVar338._20_4_ = uVar4;
                auVar338._24_4_ = uVar4;
                auVar338._28_4_ = uVar4;
                auVar338._32_4_ = uVar4;
                auVar338._36_4_ = uVar4;
                auVar338._40_4_ = uVar4;
                auVar338._44_4_ = uVar4;
                auVar338._48_4_ = uVar4;
                auVar338._52_4_ = uVar4;
                auVar338._56_4_ = uVar4;
                auVar338._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar338);
                pauVar377 = pauVar377 + 4;
                puVar370 = puVar370 + lVar421;
              }
              pauVar405 = pauVar405 + uVar417 * 4;
            }
            else {
              puVar370 = (undefined4 *)((long)local_188.data + lVar369 + (long)iVar362 * 4);
            }
            uVar374 = uVar417;
            pauVar377 = pauVar405;
            if (local_188.elempack == 1) {
              while ((int)uVar374 != 0) {
                uVar4 = *puVar370;
                auVar339._4_4_ = uVar4;
                auVar339._0_4_ = uVar4;
                auVar339._8_4_ = uVar4;
                auVar339._12_4_ = uVar4;
                auVar339._16_4_ = uVar4;
                auVar339._20_4_ = uVar4;
                auVar339._24_4_ = uVar4;
                auVar339._28_4_ = uVar4;
                auVar339._32_4_ = uVar4;
                auVar339._36_4_ = uVar4;
                auVar339._40_4_ = uVar4;
                auVar339._44_4_ = uVar4;
                auVar339._48_4_ = uVar4;
                auVar339._52_4_ = uVar4;
                auVar339._56_4_ = uVar4;
                auVar339._60_4_ = uVar4;
                auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar339);
                uVar4 = puVar370[lVar394];
                auVar340._4_4_ = uVar4;
                auVar340._0_4_ = uVar4;
                auVar340._8_4_ = uVar4;
                auVar340._12_4_ = uVar4;
                auVar340._16_4_ = uVar4;
                auVar340._20_4_ = uVar4;
                auVar340._24_4_ = uVar4;
                auVar340._28_4_ = uVar4;
                auVar340._32_4_ = uVar4;
                auVar340._36_4_ = uVar4;
                auVar340._40_4_ = uVar4;
                auVar340._44_4_ = uVar4;
                auVar340._48_4_ = uVar4;
                auVar340._52_4_ = uVar4;
                auVar340._56_4_ = uVar4;
                auVar340._60_4_ = uVar4;
                in_ZMM18 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar340);
                uVar4 = puVar370[lVar419];
                auVar341._4_4_ = uVar4;
                auVar341._0_4_ = uVar4;
                auVar341._8_4_ = uVar4;
                auVar341._12_4_ = uVar4;
                auVar341._16_4_ = uVar4;
                auVar341._20_4_ = uVar4;
                auVar341._24_4_ = uVar4;
                auVar341._28_4_ = uVar4;
                auVar341._32_4_ = uVar4;
                auVar341._36_4_ = uVar4;
                auVar341._40_4_ = uVar4;
                auVar341._44_4_ = uVar4;
                auVar341._48_4_ = uVar4;
                auVar341._52_4_ = uVar4;
                auVar341._56_4_ = uVar4;
                auVar341._60_4_ = uVar4;
                in_ZMM17 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar377[2],auVar341);
                uVar4 = puVar370[lVar414];
                auVar342._4_4_ = uVar4;
                auVar342._0_4_ = uVar4;
                auVar342._8_4_ = uVar4;
                auVar342._12_4_ = uVar4;
                auVar342._16_4_ = uVar4;
                auVar342._20_4_ = uVar4;
                auVar342._24_4_ = uVar4;
                auVar342._28_4_ = uVar4;
                auVar342._32_4_ = uVar4;
                auVar342._36_4_ = uVar4;
                auVar342._40_4_ = uVar4;
                auVar342._44_4_ = uVar4;
                auVar342._48_4_ = uVar4;
                auVar342._52_4_ = uVar4;
                auVar342._56_4_ = uVar4;
                auVar342._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(in_ZMM16,pauVar377[3],auVar342);
                puVar370 = puVar370 + lVar425;
                uVar374 = (ulong)((int)uVar374 - 1);
                pauVar377 = pauVar377 + 4;
              }
              pauVar405 = pauVar405 + uVar417 * 4;
            }
            lVar418 = lVar418 + lVar389 * 4;
            puVar395 = puVar395 + lVar389;
          }
          for (; (long)(uVar390 | 1) < lVar404; uVar390 = uVar390 + 2) {
            lVar369 = 0;
            uVar374 = uVar417;
            pauVar377 = pauVar405;
            while (iVar362 = (int)uVar374, uVar374 = (ulong)(iVar362 - 1), iVar362 != 0) {
              uVar4 = *(undefined4 *)((long)puVar395 + lVar369);
              auVar343._4_4_ = uVar4;
              auVar343._0_4_ = uVar4;
              auVar343._8_4_ = uVar4;
              auVar343._12_4_ = uVar4;
              auVar343._16_4_ = uVar4;
              auVar343._20_4_ = uVar4;
              auVar343._24_4_ = uVar4;
              auVar343._28_4_ = uVar4;
              auVar343._32_4_ = uVar4;
              auVar343._36_4_ = uVar4;
              auVar343._40_4_ = uVar4;
              auVar343._44_4_ = uVar4;
              auVar343._48_4_ = uVar4;
              auVar343._52_4_ = uVar4;
              auVar343._56_4_ = uVar4;
              auVar343._60_4_ = uVar4;
              auVar533 = vfmadd231ps_avx512f(auVar533,*pauVar377,auVar343);
              uVar4 = *(undefined4 *)(lVar418 + lVar369);
              auVar344._4_4_ = uVar4;
              auVar344._0_4_ = uVar4;
              auVar344._8_4_ = uVar4;
              auVar344._12_4_ = uVar4;
              auVar344._16_4_ = uVar4;
              auVar344._20_4_ = uVar4;
              auVar344._24_4_ = uVar4;
              auVar344._28_4_ = uVar4;
              auVar344._32_4_ = uVar4;
              auVar344._36_4_ = uVar4;
              auVar344._40_4_ = uVar4;
              auVar344._44_4_ = uVar4;
              auVar344._48_4_ = uVar4;
              auVar344._52_4_ = uVar4;
              auVar344._56_4_ = uVar4;
              auVar344._60_4_ = uVar4;
              in_ZMM18 = (float  [16])
                         vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar377[1],auVar344);
              pauVar377 = pauVar377 + 2;
              lVar369 = lVar369 + lVar426;
            }
            pauVar405 = pauVar405 + uVar417 * 2;
            lVar418 = lVar418 + lVar389 * 2;
            puVar395 = (uint *)((long)puVar395 + lVar389 * 2);
          }
          for (; puVar379 = puVar395, uVar374 = uVar417, pauVar377 = pauVar405,
              (long)uVar390 < lVar404; uVar390 = uVar390 + 1) {
            while ((int)uVar374 != 0) {
              auVar464 = vbroadcastss_avx512f(ZEXT416(*puVar379));
              auVar533 = vfmadd231ps_avx512f(auVar533,auVar464,*pauVar377);
              puVar379 = puVar379 + lVar425;
              uVar374 = (ulong)((int)uVar374 - 1);
              pauVar377 = pauVar377 + 1;
            }
            pauVar405 = pauVar405 + uVar417;
            puVar395 = (uint *)((long)puVar395 + lVar389);
          }
          auVar464 = vaddps_avx512f((undefined1  [64])in_ZMM17,in_ZMM16);
          auVar533 = vaddps_avx512f((undefined1  [64])in_ZMM18,auVar533);
          auVar533 = vaddps_avx512f(auVar464,auVar533);
          auVar476 = auVar533;
          switch(iVar423) {
          case 1:
            auVar476 = vmaxps_avx512f(auVar533,auVar565);
            break;
          case 2:
            uVar390 = vcmpps_avx512f(auVar533,auVar565,1);
            uVar4 = *(this->super_Convolution1D).activation_params.data;
            auVar349._4_4_ = uVar4;
            auVar349._0_4_ = uVar4;
            auVar349._8_4_ = uVar4;
            auVar349._12_4_ = uVar4;
            auVar349._16_4_ = uVar4;
            auVar349._20_4_ = uVar4;
            auVar349._24_4_ = uVar4;
            auVar349._28_4_ = uVar4;
            auVar349._32_4_ = uVar4;
            auVar349._36_4_ = uVar4;
            auVar349._40_4_ = uVar4;
            auVar349._44_4_ = uVar4;
            auVar349._48_4_ = uVar4;
            auVar349._52_4_ = uVar4;
            auVar349._56_4_ = uVar4;
            auVar349._60_4_ = uVar4;
            auVar464 = vmulps_avx512f(auVar533,auVar349);
            bVar18 = (bool)((byte)uVar390 & 1);
            auVar476._0_4_ = (uint)bVar18 * auVar464._0_4_ | (uint)!bVar18 * auVar533._0_4_;
            bVar18 = (bool)((byte)(uVar390 >> 1) & 1);
            auVar476._4_4_ = (uint)bVar18 * auVar464._4_4_ | (uint)!bVar18 * auVar533._4_4_;
            bVar18 = (bool)((byte)(uVar390 >> 2) & 1);
            auVar476._8_4_ = (uint)bVar18 * auVar464._8_4_ | (uint)!bVar18 * auVar533._8_4_;
            bVar18 = (bool)((byte)(uVar390 >> 3) & 1);
            auVar476._12_4_ = (uint)bVar18 * auVar464._12_4_ | (uint)!bVar18 * auVar533._12_4_;
            bVar18 = (bool)((byte)(uVar390 >> 4) & 1);
            auVar476._16_4_ = (uint)bVar18 * auVar464._16_4_ | (uint)!bVar18 * auVar533._16_4_;
            bVar18 = (bool)((byte)(uVar390 >> 5) & 1);
            auVar476._20_4_ = (uint)bVar18 * auVar464._20_4_ | (uint)!bVar18 * auVar533._20_4_;
            bVar18 = (bool)((byte)(uVar390 >> 6) & 1);
            auVar476._24_4_ = (uint)bVar18 * auVar464._24_4_ | (uint)!bVar18 * auVar533._24_4_;
            bVar18 = (bool)((byte)(uVar390 >> 7) & 1);
            auVar476._28_4_ = (uint)bVar18 * auVar464._28_4_ | (uint)!bVar18 * auVar533._28_4_;
            bVar18 = (bool)((byte)(uVar390 >> 8) & 1);
            auVar476._32_4_ = (uint)bVar18 * auVar464._32_4_ | (uint)!bVar18 * auVar533._32_4_;
            bVar18 = (bool)((byte)(uVar390 >> 9) & 1);
            auVar476._36_4_ = (uint)bVar18 * auVar464._36_4_ | (uint)!bVar18 * auVar533._36_4_;
            bVar18 = (bool)((byte)(uVar390 >> 10) & 1);
            auVar476._40_4_ = (uint)bVar18 * auVar464._40_4_ | (uint)!bVar18 * auVar533._40_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xb) & 1);
            auVar476._44_4_ = (uint)bVar18 * auVar464._44_4_ | (uint)!bVar18 * auVar533._44_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xc) & 1);
            auVar476._48_4_ = (uint)bVar18 * auVar464._48_4_ | (uint)!bVar18 * auVar533._48_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xd) & 1);
            auVar476._52_4_ = (uint)bVar18 * auVar464._52_4_ | (uint)!bVar18 * auVar533._52_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xe) & 1);
            auVar476._56_4_ = (uint)bVar18 * auVar464._56_4_ | (uint)!bVar18 * auVar533._56_4_;
            bVar18 = SUB81(uVar390 >> 0xf,0);
            auVar476._60_4_ = (uint)bVar18 * auVar464._60_4_ | (uint)!bVar18 * auVar533._60_4_;
            break;
          case 3:
            puVar370 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
            uVar4 = *puVar370;
            auVar347._4_4_ = uVar4;
            auVar347._0_4_ = uVar4;
            auVar347._8_4_ = uVar4;
            auVar347._12_4_ = uVar4;
            auVar347._16_4_ = uVar4;
            auVar347._20_4_ = uVar4;
            auVar347._24_4_ = uVar4;
            auVar347._28_4_ = uVar4;
            auVar347._32_4_ = uVar4;
            auVar347._36_4_ = uVar4;
            auVar347._40_4_ = uVar4;
            auVar347._44_4_ = uVar4;
            auVar347._48_4_ = uVar4;
            auVar347._52_4_ = uVar4;
            auVar347._56_4_ = uVar4;
            auVar347._60_4_ = uVar4;
            auVar533 = vmaxps_avx512f(auVar533,auVar347);
            uVar4 = puVar370[1];
            auVar348._4_4_ = uVar4;
            auVar348._0_4_ = uVar4;
            auVar348._8_4_ = uVar4;
            auVar348._12_4_ = uVar4;
            auVar348._16_4_ = uVar4;
            auVar348._20_4_ = uVar4;
            auVar348._24_4_ = uVar4;
            auVar348._28_4_ = uVar4;
            auVar348._32_4_ = uVar4;
            auVar348._36_4_ = uVar4;
            auVar348._40_4_ = uVar4;
            auVar348._44_4_ = uVar4;
            auVar348._48_4_ = uVar4;
            auVar348._52_4_ = uVar4;
            auVar348._56_4_ = uVar4;
            auVar348._60_4_ = uVar4;
            auVar476 = vminps_avx512f(auVar533,auVar348);
            break;
          case 4:
            auVar346._8_4_ = 0x80000000;
            auVar346._0_8_ = 0x8000000080000000;
            auVar346._12_4_ = 0x80000000;
            auVar346._16_4_ = 0x80000000;
            auVar346._20_4_ = 0x80000000;
            auVar346._24_4_ = 0x80000000;
            auVar346._28_4_ = 0x80000000;
            auVar346._32_4_ = 0x80000000;
            auVar346._36_4_ = 0x80000000;
            auVar346._40_4_ = 0x80000000;
            auVar346._44_4_ = 0x80000000;
            auVar346._48_4_ = 0x80000000;
            auVar346._52_4_ = 0x80000000;
            auVar346._56_4_ = 0x80000000;
            auVar346._60_4_ = 0x80000000;
            auVar533 = vxorps_avx512dq(auVar533,auVar346);
            auVar533 = vminps_avx512f(auVar533,(undefined1  [64])::_ps512_exp_hi);
            auVar533 = vmaxps_avx512f(auVar533,(undefined1  [64])::_ps512_exp_lo);
            auVar464 = vfmadd213ps_avx512f((undefined1  [64])afVar356,auVar533,
                                           (undefined1  [64])afVar361);
            auVar465 = vrndscaleps_avx512f(auVar464,1);
            uVar390 = vcmpps_avx512f(auVar464,auVar465,1);
            auVar464 = vsubps_avx512f(auVar465,(undefined1  [64])afVar355);
            bVar18 = (bool)((byte)uVar390 & 1);
            auVar475._0_4_ = (uint)bVar18 * auVar464._0_4_ | (uint)!bVar18 * auVar465._0_4_;
            bVar18 = (bool)((byte)(uVar390 >> 1) & 1);
            auVar475._4_4_ = (uint)bVar18 * auVar464._4_4_ | (uint)!bVar18 * auVar465._4_4_;
            bVar18 = (bool)((byte)(uVar390 >> 2) & 1);
            auVar475._8_4_ = (uint)bVar18 * auVar464._8_4_ | (uint)!bVar18 * auVar465._8_4_;
            bVar18 = (bool)((byte)(uVar390 >> 3) & 1);
            auVar475._12_4_ = (uint)bVar18 * auVar464._12_4_ | (uint)!bVar18 * auVar465._12_4_;
            bVar18 = (bool)((byte)(uVar390 >> 4) & 1);
            auVar475._16_4_ = (uint)bVar18 * auVar464._16_4_ | (uint)!bVar18 * auVar465._16_4_;
            bVar18 = (bool)((byte)(uVar390 >> 5) & 1);
            auVar475._20_4_ = (uint)bVar18 * auVar464._20_4_ | (uint)!bVar18 * auVar465._20_4_;
            bVar18 = (bool)((byte)(uVar390 >> 6) & 1);
            auVar475._24_4_ = (uint)bVar18 * auVar464._24_4_ | (uint)!bVar18 * auVar465._24_4_;
            bVar18 = (bool)((byte)(uVar390 >> 7) & 1);
            auVar475._28_4_ = (uint)bVar18 * auVar464._28_4_ | (uint)!bVar18 * auVar465._28_4_;
            bVar18 = (bool)((byte)(uVar390 >> 8) & 1);
            auVar475._32_4_ = (uint)bVar18 * auVar464._32_4_ | (uint)!bVar18 * auVar465._32_4_;
            bVar18 = (bool)((byte)(uVar390 >> 9) & 1);
            auVar475._36_4_ = (uint)bVar18 * auVar464._36_4_ | (uint)!bVar18 * auVar465._36_4_;
            bVar18 = (bool)((byte)(uVar390 >> 10) & 1);
            auVar475._40_4_ = (uint)bVar18 * auVar464._40_4_ | (uint)!bVar18 * auVar465._40_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xb) & 1);
            auVar475._44_4_ = (uint)bVar18 * auVar464._44_4_ | (uint)!bVar18 * auVar465._44_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xc) & 1);
            auVar475._48_4_ = (uint)bVar18 * auVar464._48_4_ | (uint)!bVar18 * auVar465._48_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xd) & 1);
            auVar475._52_4_ = (uint)bVar18 * auVar464._52_4_ | (uint)!bVar18 * auVar465._52_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xe) & 1);
            auVar475._56_4_ = (uint)bVar18 * auVar464._56_4_ | (uint)!bVar18 * auVar465._56_4_;
            bVar18 = SUB81(uVar390 >> 0xf,0);
            auVar475._60_4_ = (uint)bVar18 * auVar464._60_4_ | (uint)!bVar18 * auVar465._60_4_;
            auVar533 = vfmadd231ps_avx512f(auVar533,auVar475,auVar461);
            auVar533 = vfmadd231ps_avx512f(auVar533,auVar475,auVar462);
            auVar464 = vmulps_avx512f(auVar533,auVar533);
            auVar465 = vfmadd132ps_avx512f(auVar533,(undefined1  [64])afVar357,
                                           (undefined1  [64])::_ps512_cephes_exp_p0);
            auVar465 = vfmadd213ps_avx512f(auVar465,auVar533,(undefined1  [64])afVar358);
            auVar465 = vfmadd213ps_avx512f(auVar465,auVar533,(undefined1  [64])afVar359);
            auVar465 = vfmadd213ps_avx512f(auVar465,auVar533,(undefined1  [64])afVar360);
            auVar465 = vfmadd213ps_avx512f(auVar465,auVar533,(undefined1  [64])afVar361);
            auVar533 = vfmadd213ps_avx512f(auVar465,auVar464,auVar533);
            auVar533 = vaddps_avx512f(auVar533,(undefined1  [64])afVar355);
            auVar464 = vcvttps2dq_avx512f(auVar475);
            auVar464 = vpaddd_avx512f(auVar464,auVar463);
            auVar464 = vpslld_avx512f(auVar464,0x17);
            auVar533 = vfmadd213ps_avx512f(auVar464,auVar533,auVar460);
            auVar476 = vdivps_avx512f(auVar460,auVar533);
            break;
          case 5:
            auVar464 = vminps_avx512f(auVar533,(undefined1  [64])::_ps512_exp_hi);
            auVar464 = vmaxps_avx512f(auVar464,(undefined1  [64])::_ps512_exp_lo);
            auVar465 = vfmadd213ps_avx512f((undefined1  [64])afVar356,auVar464,
                                           (undefined1  [64])afVar361);
            auVar466 = vrndscaleps_avx512f(auVar465,1);
            uVar390 = vcmpps_avx512f(auVar465,auVar466,1);
            auVar465 = vsubps_avx512f(auVar466,(undefined1  [64])afVar355);
            bVar18 = (bool)((byte)uVar390 & 1);
            auVar468._0_4_ = (uint)bVar18 * auVar465._0_4_ | (uint)!bVar18 * auVar466._0_4_;
            bVar18 = (bool)((byte)(uVar390 >> 1) & 1);
            auVar468._4_4_ = (uint)bVar18 * auVar465._4_4_ | (uint)!bVar18 * auVar466._4_4_;
            bVar18 = (bool)((byte)(uVar390 >> 2) & 1);
            auVar468._8_4_ = (uint)bVar18 * auVar465._8_4_ | (uint)!bVar18 * auVar466._8_4_;
            bVar18 = (bool)((byte)(uVar390 >> 3) & 1);
            auVar468._12_4_ = (uint)bVar18 * auVar465._12_4_ | (uint)!bVar18 * auVar466._12_4_;
            bVar18 = (bool)((byte)(uVar390 >> 4) & 1);
            auVar468._16_4_ = (uint)bVar18 * auVar465._16_4_ | (uint)!bVar18 * auVar466._16_4_;
            bVar18 = (bool)((byte)(uVar390 >> 5) & 1);
            auVar468._20_4_ = (uint)bVar18 * auVar465._20_4_ | (uint)!bVar18 * auVar466._20_4_;
            bVar18 = (bool)((byte)(uVar390 >> 6) & 1);
            auVar468._24_4_ = (uint)bVar18 * auVar465._24_4_ | (uint)!bVar18 * auVar466._24_4_;
            bVar18 = (bool)((byte)(uVar390 >> 7) & 1);
            auVar468._28_4_ = (uint)bVar18 * auVar465._28_4_ | (uint)!bVar18 * auVar466._28_4_;
            bVar18 = (bool)((byte)(uVar390 >> 8) & 1);
            auVar468._32_4_ = (uint)bVar18 * auVar465._32_4_ | (uint)!bVar18 * auVar466._32_4_;
            bVar18 = (bool)((byte)(uVar390 >> 9) & 1);
            auVar468._36_4_ = (uint)bVar18 * auVar465._36_4_ | (uint)!bVar18 * auVar466._36_4_;
            bVar18 = (bool)((byte)(uVar390 >> 10) & 1);
            auVar468._40_4_ = (uint)bVar18 * auVar465._40_4_ | (uint)!bVar18 * auVar466._40_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xb) & 1);
            auVar468._44_4_ = (uint)bVar18 * auVar465._44_4_ | (uint)!bVar18 * auVar466._44_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xc) & 1);
            auVar468._48_4_ = (uint)bVar18 * auVar465._48_4_ | (uint)!bVar18 * auVar466._48_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xd) & 1);
            auVar468._52_4_ = (uint)bVar18 * auVar465._52_4_ | (uint)!bVar18 * auVar466._52_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xe) & 1);
            auVar468._56_4_ = (uint)bVar18 * auVar465._56_4_ | (uint)!bVar18 * auVar466._56_4_;
            bVar18 = SUB81(uVar390 >> 0xf,0);
            auVar468._60_4_ = (uint)bVar18 * auVar465._60_4_ | (uint)!bVar18 * auVar466._60_4_;
            auVar464 = vfmadd231ps_avx512f(auVar464,auVar468,auVar461);
            auVar464 = vfmadd231ps_avx512f(auVar464,auVar468,auVar462);
            auVar465 = vmulps_avx512f(auVar464,auVar464);
            auVar466 = vfmadd213ps_avx512f(auVar464,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])afVar357);
            auVar466 = vfmadd213ps_avx512f(auVar466,auVar464,(undefined1  [64])afVar358);
            auVar466 = vfmadd213ps_avx512f(auVar466,auVar464,(undefined1  [64])afVar359);
            auVar466 = vfmadd213ps_avx512f(auVar466,auVar464,(undefined1  [64])afVar360);
            auVar466 = vfmadd213ps_avx512f(auVar466,auVar464,(undefined1  [64])afVar361);
            auVar464 = vfmadd213ps_avx512f(auVar466,auVar465,auVar464);
            auVar464 = vaddps_avx512f(auVar464,(undefined1  [64])afVar355);
            auVar465 = vcvttps2dq_avx512f(auVar468);
            auVar465 = vpaddd_avx512f(auVar465,auVar463);
            auVar465 = vpslld_avx512f(auVar465,0x17);
            auVar464 = vfmadd213ps_avx512f(auVar465,auVar464,auVar460);
            auVar465 = vmaxps_avx512f(auVar464,(undefined1  [64])_ps512_min_norm_pos);
            auVar466 = vpsrld_avx512f(auVar465,0x17);
            auVar465 = vpternlogd_avx512f(auVar465,(undefined1  [64])afVar361,
                                          (undefined1  [64])_ps512_inv_mant_mask,0xec);
            uVar390 = vcmpps_avx512f(auVar465,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar469 = vsubps_avx512f(auVar465,(undefined1  [64])afVar355);
            auVar465 = vaddps_avx512f(auVar469,auVar465);
            bVar18 = (bool)((byte)uVar390 & 1);
            auVar470._0_4_ = (uint)bVar18 * auVar465._0_4_ | (uint)!bVar18 * auVar469._0_4_;
            bVar18 = (bool)((byte)(uVar390 >> 1) & 1);
            auVar470._4_4_ = (uint)bVar18 * auVar465._4_4_ | (uint)!bVar18 * auVar469._4_4_;
            bVar18 = (bool)((byte)(uVar390 >> 2) & 1);
            auVar470._8_4_ = (uint)bVar18 * auVar465._8_4_ | (uint)!bVar18 * auVar469._8_4_;
            bVar18 = (bool)((byte)(uVar390 >> 3) & 1);
            auVar470._12_4_ = (uint)bVar18 * auVar465._12_4_ | (uint)!bVar18 * auVar469._12_4_;
            bVar18 = (bool)((byte)(uVar390 >> 4) & 1);
            auVar470._16_4_ = (uint)bVar18 * auVar465._16_4_ | (uint)!bVar18 * auVar469._16_4_;
            bVar18 = (bool)((byte)(uVar390 >> 5) & 1);
            auVar470._20_4_ = (uint)bVar18 * auVar465._20_4_ | (uint)!bVar18 * auVar469._20_4_;
            bVar18 = (bool)((byte)(uVar390 >> 6) & 1);
            auVar470._24_4_ = (uint)bVar18 * auVar465._24_4_ | (uint)!bVar18 * auVar469._24_4_;
            bVar18 = (bool)((byte)(uVar390 >> 7) & 1);
            auVar470._28_4_ = (uint)bVar18 * auVar465._28_4_ | (uint)!bVar18 * auVar469._28_4_;
            bVar19 = (byte)(uVar390 >> 8);
            bVar18 = (bool)(bVar19 & 1);
            auVar470._32_4_ = (uint)bVar18 * auVar465._32_4_ | (uint)!bVar18 * auVar469._32_4_;
            bVar18 = (bool)((byte)(uVar390 >> 9) & 1);
            auVar470._36_4_ = (uint)bVar18 * auVar465._36_4_ | (uint)!bVar18 * auVar469._36_4_;
            bVar18 = (bool)((byte)(uVar390 >> 10) & 1);
            auVar470._40_4_ = (uint)bVar18 * auVar465._40_4_ | (uint)!bVar18 * auVar469._40_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xb) & 1);
            auVar470._44_4_ = (uint)bVar18 * auVar465._44_4_ | (uint)!bVar18 * auVar469._44_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xc) & 1);
            auVar470._48_4_ = (uint)bVar18 * auVar465._48_4_ | (uint)!bVar18 * auVar469._48_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xd) & 1);
            auVar470._52_4_ = (uint)bVar18 * auVar465._52_4_ | (uint)!bVar18 * auVar469._52_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xe) & 1);
            auVar470._56_4_ = (uint)bVar18 * auVar465._56_4_ | (uint)!bVar18 * auVar469._56_4_;
            bVar18 = SUB81(uVar390 >> 0xf,0);
            auVar470._60_4_ = (uint)bVar18 * auVar465._60_4_ | (uint)!bVar18 * auVar469._60_4_;
            auVar465 = vmulps_avx512f(auVar470,auVar470);
            auVar469 = vfmadd132ps_avx512f(auVar470,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p2)
            ;
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p3)
            ;
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p4)
            ;
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p5)
            ;
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p6)
            ;
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p7)
            ;
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar470,(undefined1  [64])_ps512_cephes_log_p8)
            ;
            auVar471 = vmulps_avx512f(auVar465,auVar470);
            auVar469 = vfmadd213ps_avx512f(auVar471,auVar469,auVar470);
            uVar374 = vcmpps_avx512f(auVar464,auVar565,2);
            auVar464 = vpsubd_avx512f(auVar466,auVar463);
            auVar464 = vcvtdq2ps_avx512f(auVar464);
            auVar466 = vaddps_avx512f(auVar464,(undefined1  [64])afVar355);
            bVar18 = (bool)((byte)uVar390 & 1);
            auVar472._0_4_ = (uint)bVar18 * auVar464._0_4_ | (uint)!bVar18 * auVar466._0_4_;
            bVar18 = (bool)((byte)(uVar390 >> 1) & 1);
            auVar472._4_4_ = (uint)bVar18 * auVar464._4_4_ | (uint)!bVar18 * auVar466._4_4_;
            bVar18 = (bool)((byte)(uVar390 >> 2) & 1);
            auVar472._8_4_ = (uint)bVar18 * auVar464._8_4_ | (uint)!bVar18 * auVar466._8_4_;
            bVar18 = (bool)((byte)(uVar390 >> 3) & 1);
            auVar472._12_4_ = (uint)bVar18 * auVar464._12_4_ | (uint)!bVar18 * auVar466._12_4_;
            bVar18 = (bool)((byte)(uVar390 >> 4) & 1);
            auVar472._16_4_ = (uint)bVar18 * auVar464._16_4_ | (uint)!bVar18 * auVar466._16_4_;
            bVar18 = (bool)((byte)(uVar390 >> 5) & 1);
            auVar472._20_4_ = (uint)bVar18 * auVar464._20_4_ | (uint)!bVar18 * auVar466._20_4_;
            bVar18 = (bool)((byte)(uVar390 >> 6) & 1);
            auVar472._24_4_ = (uint)bVar18 * auVar464._24_4_ | (uint)!bVar18 * auVar466._24_4_;
            bVar18 = (bool)((byte)(uVar390 >> 7) & 1);
            auVar472._28_4_ = (uint)bVar18 * auVar464._28_4_ | (uint)!bVar18 * auVar466._28_4_;
            bVar18 = (bool)(bVar19 & 1);
            auVar472._32_4_ = (uint)bVar18 * auVar464._32_4_ | (uint)!bVar18 * auVar466._32_4_;
            bVar18 = (bool)((byte)(uVar390 >> 9) & 1);
            auVar472._36_4_ = (uint)bVar18 * auVar464._36_4_ | (uint)!bVar18 * auVar466._36_4_;
            bVar18 = (bool)((byte)(uVar390 >> 10) & 1);
            auVar472._40_4_ = (uint)bVar18 * auVar464._40_4_ | (uint)!bVar18 * auVar466._40_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xb) & 1);
            auVar472._44_4_ = (uint)bVar18 * auVar464._44_4_ | (uint)!bVar18 * auVar466._44_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xc) & 1);
            auVar472._48_4_ = (uint)bVar18 * auVar464._48_4_ | (uint)!bVar18 * auVar466._48_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xd) & 1);
            auVar472._52_4_ = (uint)bVar18 * auVar464._52_4_ | (uint)!bVar18 * auVar466._52_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xe) & 1);
            auVar472._56_4_ = (uint)bVar18 * auVar464._56_4_ | (uint)!bVar18 * auVar466._56_4_;
            bVar18 = SUB81(uVar390 >> 0xf,0);
            auVar472._60_4_ = (uint)bVar18 * auVar464._60_4_ | (uint)!bVar18 * auVar466._60_4_;
            auVar464 = vfmadd231ps_avx512f(auVar469,auVar472,(undefined1  [64])_ps512_cephes_log_q1)
            ;
            auVar464 = vfmadd231ps_avx512f(auVar464,auVar465,local_78);
            in_ZMM16 = vfmadd231ps_avx512f(auVar464,auVar472,(undefined1  [64])_ps512_cephes_log_q2)
            ;
            auVar464 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
            auVar465 = vmulps_avx512f(in_ZMM16,auVar464);
            auVar466 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            bVar18 = (bool)((byte)uVar374 & 1);
            auVar473._0_4_ = (uint)bVar18 * auVar466._0_4_ | (uint)!bVar18 * auVar465._0_4_;
            bVar18 = (bool)((byte)(uVar374 >> 1) & 1);
            auVar473._4_4_ = (uint)bVar18 * auVar466._4_4_ | (uint)!bVar18 * auVar465._4_4_;
            bVar18 = (bool)((byte)(uVar374 >> 2) & 1);
            auVar473._8_4_ = (uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar465._8_4_;
            bVar18 = (bool)((byte)(uVar374 >> 3) & 1);
            auVar473._12_4_ = (uint)bVar18 * auVar466._12_4_ | (uint)!bVar18 * auVar465._12_4_;
            bVar18 = (bool)((byte)(uVar374 >> 4) & 1);
            auVar473._16_4_ = (uint)bVar18 * auVar466._16_4_ | (uint)!bVar18 * auVar465._16_4_;
            bVar18 = (bool)((byte)(uVar374 >> 5) & 1);
            auVar473._20_4_ = (uint)bVar18 * auVar466._20_4_ | (uint)!bVar18 * auVar465._20_4_;
            bVar18 = (bool)((byte)(uVar374 >> 6) & 1);
            auVar473._24_4_ = (uint)bVar18 * auVar466._24_4_ | (uint)!bVar18 * auVar465._24_4_;
            bVar18 = (bool)((byte)(uVar374 >> 7) & 1);
            auVar473._28_4_ = (uint)bVar18 * auVar466._28_4_ | (uint)!bVar18 * auVar465._28_4_;
            bVar18 = (bool)((byte)(uVar374 >> 8) & 1);
            auVar473._32_4_ = (uint)bVar18 * auVar466._32_4_ | (uint)!bVar18 * auVar465._32_4_;
            bVar18 = (bool)((byte)(uVar374 >> 9) & 1);
            auVar473._36_4_ = (uint)bVar18 * auVar466._36_4_ | (uint)!bVar18 * auVar465._36_4_;
            bVar18 = (bool)((byte)(uVar374 >> 10) & 1);
            auVar473._40_4_ = (uint)bVar18 * auVar466._40_4_ | (uint)!bVar18 * auVar465._40_4_;
            bVar18 = (bool)((byte)(uVar374 >> 0xb) & 1);
            auVar473._44_4_ = (uint)bVar18 * auVar466._44_4_ | (uint)!bVar18 * auVar465._44_4_;
            bVar18 = (bool)((byte)(uVar374 >> 0xc) & 1);
            auVar473._48_4_ = (uint)bVar18 * auVar466._48_4_ | (uint)!bVar18 * auVar465._48_4_;
            bVar18 = (bool)((byte)(uVar374 >> 0xd) & 1);
            auVar473._52_4_ = (uint)bVar18 * auVar466._52_4_ | (uint)!bVar18 * auVar465._52_4_;
            bVar18 = (bool)((byte)(uVar374 >> 0xe) & 1);
            auVar473._56_4_ = (uint)bVar18 * auVar466._56_4_ | (uint)!bVar18 * auVar465._56_4_;
            bVar18 = SUB81(uVar374 >> 0xf,0);
            auVar473._60_4_ = (uint)bVar18 * auVar466._60_4_ | (uint)!bVar18 * auVar465._60_4_;
            auVar465 = vminps_avx512f(auVar473,(undefined1  [64])::_ps512_exp_hi);
            auVar465 = vmaxps_avx512f(auVar465,(undefined1  [64])::_ps512_exp_lo);
            auVar466 = vfmadd213ps_avx512f((undefined1  [64])afVar356,auVar465,
                                           (undefined1  [64])afVar361);
            auVar469 = vrndscaleps_avx512f(auVar466,1);
            uVar390 = vcmpps_avx512f(auVar466,auVar469,1);
            auVar466 = vsubps_avx512f(auVar469,(undefined1  [64])afVar355);
            bVar18 = (bool)((byte)uVar390 & 1);
            auVar474._0_4_ = (uint)bVar18 * auVar466._0_4_ | (uint)!bVar18 * auVar469._0_4_;
            bVar18 = (bool)((byte)(uVar390 >> 1) & 1);
            auVar474._4_4_ = (uint)bVar18 * auVar466._4_4_ | (uint)!bVar18 * auVar469._4_4_;
            bVar18 = (bool)((byte)(uVar390 >> 2) & 1);
            auVar474._8_4_ = (uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar469._8_4_;
            bVar18 = (bool)((byte)(uVar390 >> 3) & 1);
            auVar474._12_4_ = (uint)bVar18 * auVar466._12_4_ | (uint)!bVar18 * auVar469._12_4_;
            bVar18 = (bool)((byte)(uVar390 >> 4) & 1);
            auVar474._16_4_ = (uint)bVar18 * auVar466._16_4_ | (uint)!bVar18 * auVar469._16_4_;
            bVar18 = (bool)((byte)(uVar390 >> 5) & 1);
            auVar474._20_4_ = (uint)bVar18 * auVar466._20_4_ | (uint)!bVar18 * auVar469._20_4_;
            bVar18 = (bool)((byte)(uVar390 >> 6) & 1);
            auVar474._24_4_ = (uint)bVar18 * auVar466._24_4_ | (uint)!bVar18 * auVar469._24_4_;
            bVar18 = (bool)((byte)(uVar390 >> 7) & 1);
            auVar474._28_4_ = (uint)bVar18 * auVar466._28_4_ | (uint)!bVar18 * auVar469._28_4_;
            bVar18 = (bool)((byte)(uVar390 >> 8) & 1);
            auVar474._32_4_ = (uint)bVar18 * auVar466._32_4_ | (uint)!bVar18 * auVar469._32_4_;
            bVar18 = (bool)((byte)(uVar390 >> 9) & 1);
            auVar474._36_4_ = (uint)bVar18 * auVar466._36_4_ | (uint)!bVar18 * auVar469._36_4_;
            bVar18 = (bool)((byte)(uVar390 >> 10) & 1);
            auVar474._40_4_ = (uint)bVar18 * auVar466._40_4_ | (uint)!bVar18 * auVar469._40_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xb) & 1);
            auVar474._44_4_ = (uint)bVar18 * auVar466._44_4_ | (uint)!bVar18 * auVar469._44_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xc) & 1);
            auVar474._48_4_ = (uint)bVar18 * auVar466._48_4_ | (uint)!bVar18 * auVar469._48_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xd) & 1);
            auVar474._52_4_ = (uint)bVar18 * auVar466._52_4_ | (uint)!bVar18 * auVar469._52_4_;
            bVar18 = (bool)((byte)(uVar390 >> 0xe) & 1);
            auVar474._56_4_ = (uint)bVar18 * auVar466._56_4_ | (uint)!bVar18 * auVar469._56_4_;
            bVar18 = SUB81(uVar390 >> 0xf,0);
            auVar474._60_4_ = (uint)bVar18 * auVar466._60_4_ | (uint)!bVar18 * auVar469._60_4_;
            auVar465 = vfmadd231ps_avx512f(auVar465,auVar474,auVar461);
            auVar465 = vfmadd231ps_avx512f(auVar465,auVar474,auVar462);
            auVar466 = vmulps_avx512f(auVar465,auVar465);
            auVar469 = vfmadd213ps_avx512f(auVar465,(undefined1  [64])::_ps512_cephes_exp_p0,
                                           (undefined1  [64])afVar357);
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar465,(undefined1  [64])afVar358);
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar465,(undefined1  [64])afVar359);
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar465,(undefined1  [64])afVar360);
            auVar469 = vfmadd213ps_avx512f(auVar469,auVar465,(undefined1  [64])afVar361);
            auVar465 = vfmadd213ps_avx512f(auVar469,auVar466,auVar465);
            auVar465 = vaddps_avx512f(auVar465,(undefined1  [64])afVar355);
            auVar466 = vcvttps2dq_avx512f(auVar474);
            auVar466 = vpaddd_avx512f(auVar466,auVar463);
            auVar466 = vpslld_avx512f(auVar466,0x17);
            auVar465 = vfmadd213ps_avx512f(auVar466,auVar465,auVar460);
            auVar465 = vdivps_avx512f(auVar460,auVar465);
            auVar464 = vfnmsub213ps_avx512f(auVar465,auVar464,auVar460);
            in_ZMM17 = ::_ps512_exp_hi;
            in_ZMM18 = ::_ps512_exp_lo;
            goto LAB_004cc1a0;
          case 6:
            puVar395 = (uint *)(this->super_Convolution1D).activation_params.data;
            auVar464 = vbroadcastss_avx512f(ZEXT416(*puVar395));
            uVar399 = puVar395[1];
            auVar345._4_4_ = uVar399;
            auVar345._0_4_ = uVar399;
            auVar345._8_4_ = uVar399;
            auVar345._12_4_ = uVar399;
            auVar345._16_4_ = uVar399;
            auVar345._20_4_ = uVar399;
            auVar345._24_4_ = uVar399;
            auVar345._28_4_ = uVar399;
            auVar345._32_4_ = uVar399;
            auVar345._36_4_ = uVar399;
            auVar345._40_4_ = uVar399;
            auVar345._44_4_ = uVar399;
            auVar345._48_4_ = uVar399;
            auVar345._52_4_ = uVar399;
            auVar345._56_4_ = uVar399;
            auVar345._60_4_ = uVar399;
            auVar464 = vfmadd213ps_avx512f(auVar464,auVar533,auVar345);
            auVar464 = vmaxps_avx512f(auVar464,auVar565);
            auVar464 = vminps_avx512f(auVar464,auVar460);
LAB_004cc1a0:
            auVar476 = vmulps_avx512f(auVar464,auVar533);
          }
          auVar429 = auVar476._0_16_;
          if (iVar409 == 1) {
            *(int *)*local_2e8 = auVar476._0_4_;
            uVar4 = vextractps_avx(auVar429,1);
            *(undefined4 *)((long)*local_2e8 + lVar413 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,2);
            *(undefined4 *)((long)*local_2e8 + lVar366 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,3);
            *(undefined4 *)((long)*local_2e8 + lVar367 * 4) = uVar4;
            auVar429 = auVar476._16_16_;
            *(int *)((long)*local_2e8 + (long)(iVar381 * 4) * 4) = auVar476._16_4_;
            uVar4 = vextractps_avx(auVar429,1);
            *(undefined4 *)((long)*local_2e8 + (long)(iVar381 * 5) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,2);
            *(undefined4 *)((long)*local_2e8 + (long)(iVar381 * 6) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,3);
            *(undefined4 *)((long)*local_2e8 + (long)(iVar381 * 7) * 4) = uVar4;
            auVar429 = vextracti32x4_avx512f(auVar476,2);
            *(int *)((long)*local_2e8 + (long)(iVar381 * 8) * 4) = auVar429._0_4_;
            uVar4 = vextractps_avx(auVar429,1);
            *(undefined4 *)((long)*local_2e8 + (long)(iVar381 * 9) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,2);
            *(undefined4 *)((long)*local_2e8 + (long)(iVar381 * 10) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,3);
            *(undefined4 *)((long)*local_2e8 + (long)(iVar381 * 0xb) * 4) = uVar4;
            auVar429 = vextracti32x4_avx512f(auVar476,3);
            *(int *)((long)*local_2e8 + local_c0 * 4) = auVar429._0_4_;
            uVar4 = vextractps_avx(auVar429,1);
            *(undefined4 *)((long)*local_2e8 + local_c8 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,2);
            *(undefined4 *)((long)*local_2e8 + local_d0 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,3);
            *(undefined4 *)((long)*local_2e8 + local_d8 * 4) = uVar4;
            local_2e8 = (undefined1 (*) [64])((long)*local_2e8 + 4);
          }
          else if (iVar409 == 4) {
            *(undefined1 (*) [16])*local_2e8 = auVar429;
            auVar429 = vextractf32x4_avx512f(auVar476,1);
            *(undefined1 (*) [16])((long)*local_2e8 + lVar413 * 4) = auVar429;
            auVar429 = vextractf32x4_avx512f(auVar476,2);
            *(undefined1 (*) [16])((long)*local_2e8 + lVar366 * 4) = auVar429;
            auVar429 = vextractf32x4_avx512f(auVar476,3);
            *(undefined1 (*) [16])((long)*local_2e8 + lVar367 * 4) = auVar429;
            local_2e8 = (undefined1 (*) [64])((long)*local_2e8 + 0x10);
          }
          else if (iVar409 == 8) {
            *(undefined1 (*) [32])*local_2e8 = auVar476._0_32_;
            auVar446 = vextractf64x4_avx512f(auVar476,1);
            *(undefined1 (*) [32])((long)*local_2e8 + lVar413 * 4) = auVar446;
            local_2e8 = (undefined1 (*) [64])((long)*local_2e8 + 0x20);
          }
          else if (iVar409 == 0x10) {
            *local_2e8 = auVar476;
            local_2e8 = local_2e8 + 1;
          }
          iVar403 = iVar403 + local_188.elempack * iVar6;
          local_2d8 = (undefined1 (*) [32])((long)local_2d8 + lVar3);
          local_288 = local_288 + lVar3;
        }
      }
      uVar399 = iVar380 * 0x10;
      local_138 = (ulong)uVar399;
      uVar368 = (long)(iVar386 + iVar380 * -0x10) / 8;
      local_130 = uVar368 & 0xffffffff;
      lVar9 = uVar417 * 4;
      lVar410 = lVar388 * lVar9;
      lVar414 = lVar421 * lVar9;
      lVar419 = uVar417 * 0x20;
      uVar391 = 0;
      uVar396 = 0;
      if (0 < (int)uVar368) {
        uVar396 = uVar368 & 0xffffffff;
      }
      local_120 = (long)(int)uVar399;
      auVar459 = vmovdqu64_avx512f(local_b8);
      lVar369 = auVar459._0_8_;
      lVar418 = vpextrq_avx(auVar459._0_16_,1);
      lVar389 = vpextrq_avx(auVar459._16_16_,1);
      lVar404 = vpextrq_avx(auVar428,1);
      local_128 = lVar394 * 4;
      auVar446._8_4_ = 0x3f000000;
      auVar446._0_8_ = 0x3f0000003f000000;
      auVar446._12_4_ = 0x3f000000;
      auVar446._16_4_ = 0x3f000000;
      auVar446._20_4_ = 0x3f000000;
      auVar446._24_4_ = 0x3f000000;
      auVar446._28_4_ = 0x3f000000;
      auVar445._8_4_ = 0x3fb8aa3b;
      auVar445._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar445._12_4_ = 0x3fb8aa3b;
      auVar445._16_4_ = 0x3fb8aa3b;
      auVar445._20_4_ = 0x3fb8aa3b;
      auVar445._24_4_ = 0x3fb8aa3b;
      auVar445._28_4_ = 0x3fb8aa3b;
      auVar536._8_4_ = 0x3f800000;
      auVar536._0_8_ = 0x3f8000003f800000;
      auVar536._12_4_ = 0x3f800000;
      auVar536._16_4_ = 0x3f800000;
      auVar536._20_4_ = 0x3f800000;
      auVar536._24_4_ = 0x3f800000;
      auVar536._28_4_ = 0x3f800000;
      auVar539._8_4_ = 0x3f318000;
      auVar539._0_8_ = 0x3f3180003f318000;
      auVar539._12_4_ = 0x3f318000;
      auVar539._16_4_ = 0x3f318000;
      auVar539._20_4_ = 0x3f318000;
      auVar539._24_4_ = 0x3f318000;
      auVar539._28_4_ = 0x3f318000;
      auVar544._8_4_ = 0x39506967;
      auVar544._0_8_ = 0x3950696739506967;
      auVar544._12_4_ = 0x39506967;
      auVar544._16_4_ = 0x39506967;
      auVar544._20_4_ = 0x39506967;
      auVar544._24_4_ = 0x39506967;
      auVar544._28_4_ = 0x39506967;
      auVar546._8_4_ = 0x3ab743ce;
      auVar546._0_8_ = 0x3ab743ce3ab743ce;
      auVar546._12_4_ = 0x3ab743ce;
      auVar546._16_4_ = 0x3ab743ce;
      auVar546._20_4_ = 0x3ab743ce;
      auVar546._24_4_ = 0x3ab743ce;
      auVar546._28_4_ = 0x3ab743ce;
      auVar553._8_4_ = 0x3c088908;
      auVar553._0_8_ = 0x3c0889083c088908;
      auVar553._12_4_ = 0x3c088908;
      auVar553._16_4_ = 0x3c088908;
      auVar553._20_4_ = 0x3c088908;
      auVar553._24_4_ = 0x3c088908;
      auVar553._28_4_ = 0x3c088908;
      auVar558._8_4_ = 0x3d2aa9c1;
      auVar558._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar558._12_4_ = 0x3d2aa9c1;
      auVar558._16_4_ = 0x3d2aa9c1;
      auVar558._20_4_ = 0x3d2aa9c1;
      auVar558._24_4_ = 0x3d2aa9c1;
      auVar558._28_4_ = 0x3d2aa9c1;
      auVar560._8_4_ = 0x3e2aaaaa;
      auVar560._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar560._12_4_ = 0x3e2aaaaa;
      auVar560._16_4_ = 0x3e2aaaaa;
      auVar560._20_4_ = 0x3e2aaaaa;
      auVar560._24_4_ = 0x3e2aaaaa;
      auVar560._28_4_ = 0x3e2aaaaa;
      auVar562._8_4_ = 0x3f800000;
      auVar562._0_8_ = 0x3f8000003f800000;
      auVar562._12_4_ = 0x3f800000;
      auVar562._16_4_ = 0x3f800000;
      auVar562._20_4_ = 0x3f800000;
      auVar562._24_4_ = 0x3f800000;
      auVar562._28_4_ = 0x3f800000;
      auVar564._8_4_ = 0xb95e8083;
      auVar564._0_8_ = 0xb95e8083b95e8083;
      auVar564._12_4_ = 0xb95e8083;
      auVar564._16_4_ = 0xb95e8083;
      auVar564._20_4_ = 0xb95e8083;
      auVar564._24_4_ = 0xb95e8083;
      auVar564._28_4_ = 0xb95e8083;
      for (; uVar391 != uVar396; uVar391 = uVar391 + 1) {
        uVar390 = local_120 + uVar391 * 8;
        uVar408 = top_blob->w;
        iVar380 = top_blob->elempack;
        uVar385 = (int)uVar390 >> 0x1f;
        local_2d8 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)uVar385 << 0x20 | uVar390 & 0xffffffff) /
                                (long)iVar380) * (long)(int)uVar408 * top_blob->elemsize +
                    (long)top_blob->data);
        uVar374 = (ulong)uVar385 << 0x20 | uVar390 & 0xffffffff;
        lVar397 = (long)local_188.h * (long)local_188.elempack;
        local_2a8 = 0;
        uVar371 = 0;
        if (0 < (int)uVar408) {
          uVar371 = (ulong)uVar408;
        }
        iVar409 = 0;
        local_2d0 = local_128;
        for (uVar398 = 0; uVar398 != uVar371; uVar398 = uVar398 + 1) {
          auVar461 = ZEXT1664((undefined1  [16])0x0);
          auVar462 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar7 != (void *)0x0) {
            auVar462 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar7 + uVar390 * 4));
          }
          pauVar411 = (undefined1 (*) [32])
                      ((this->weight_data_tm).cstep *
                       (long)(((int)((long)uVar374 % 0x10) >> 3) + (int)((long)uVar374 / 0x10)) *
                       (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar403 = local_188.elempack * iVar6 * (int)uVar398;
          lVar392 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar415 = local_2d0 + (long)local_188.data;
          puVar370 = (undefined4 *)((long)local_188.data + local_2a8);
          uVar400 = 0;
          auVar429 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar429);
          auVar429 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = (float  [16])ZEXT1664(auVar429);
          while( true ) {
            local_350 = (int)lVar397;
            if (local_350 <= (int)((uint)uVar400 | 0xf)) break;
            lVar372 = (int)((long)((ulong)(uint)((int)(uint)uVar400 >> 0x1f) << 0x20 |
                                  uVar400 & 0xffffffff) / (long)local_188.elempack) * lVar392;
            if (local_188.elempack == 0x10) {
              puVar373 = (undefined4 *)((long)local_188.data + lVar372 + (long)iVar409 * 4);
              uVar393 = uVar417;
              pauVar401 = pauVar411;
              while (iVar362 = (int)uVar393, uVar393 = (ulong)(iVar362 - 1), iVar362 != 0) {
                in_ZMM26 = ZEXT3264(pauVar401[6]);
                in_ZMM28 = ZEXT3264(pauVar401[8]);
                auVar565 = ZEXT3264(pauVar401[9]);
                auVar460 = ZEXT3264(pauVar401[10]);
                in_ZMM31 = ZEXT3264(pauVar401[0xd]);
                uVar4 = *puVar373;
                auVar143._4_4_ = uVar4;
                auVar143._0_4_ = uVar4;
                auVar143._8_4_ = uVar4;
                auVar143._12_4_ = uVar4;
                auVar143._16_4_ = uVar4;
                auVar143._20_4_ = uVar4;
                auVar143._24_4_ = uVar4;
                auVar143._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar143);
                uVar4 = puVar373[1];
                auVar144._4_4_ = uVar4;
                auVar144._0_4_ = uVar4;
                auVar144._8_4_ = uVar4;
                auVar144._12_4_ = uVar4;
                auVar144._16_4_ = uVar4;
                auVar144._20_4_ = uVar4;
                auVar144._24_4_ = uVar4;
                auVar144._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar144);
                uVar4 = puVar373[2];
                auVar145._4_4_ = uVar4;
                auVar145._0_4_ = uVar4;
                auVar145._8_4_ = uVar4;
                auVar145._12_4_ = uVar4;
                auVar145._16_4_ = uVar4;
                auVar145._20_4_ = uVar4;
                auVar145._24_4_ = uVar4;
                auVar145._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar145);
                uVar4 = puVar373[3];
                auVar146._4_4_ = uVar4;
                auVar146._0_4_ = uVar4;
                auVar146._8_4_ = uVar4;
                auVar146._12_4_ = uVar4;
                auVar146._16_4_ = uVar4;
                auVar146._20_4_ = uVar4;
                auVar146._24_4_ = uVar4;
                auVar146._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar146);
                uVar4 = puVar373[4];
                auVar147._4_4_ = uVar4;
                auVar147._0_4_ = uVar4;
                auVar147._8_4_ = uVar4;
                auVar147._12_4_ = uVar4;
                auVar147._16_4_ = uVar4;
                auVar147._20_4_ = uVar4;
                auVar147._24_4_ = uVar4;
                auVar147._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar147);
                uVar4 = puVar373[5];
                auVar148._4_4_ = uVar4;
                auVar148._0_4_ = uVar4;
                auVar148._8_4_ = uVar4;
                auVar148._12_4_ = uVar4;
                auVar148._16_4_ = uVar4;
                auVar148._20_4_ = uVar4;
                auVar148._24_4_ = uVar4;
                auVar148._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar148);
                uVar4 = puVar373[6];
                auVar149._4_4_ = uVar4;
                auVar149._0_4_ = uVar4;
                auVar149._8_4_ = uVar4;
                auVar149._12_4_ = uVar4;
                auVar149._16_4_ = uVar4;
                auVar149._20_4_ = uVar4;
                auVar149._24_4_ = uVar4;
                auVar149._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar149);
                uVar4 = puVar373[7];
                auVar150._4_4_ = uVar4;
                auVar150._0_4_ = uVar4;
                auVar150._8_4_ = uVar4;
                auVar150._12_4_ = uVar4;
                auVar150._16_4_ = uVar4;
                auVar150._20_4_ = uVar4;
                auVar150._24_4_ = uVar4;
                auVar150._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar150);
                uVar4 = puVar373[8];
                auVar151._4_4_ = uVar4;
                auVar151._0_4_ = uVar4;
                auVar151._8_4_ = uVar4;
                auVar151._12_4_ = uVar4;
                auVar151._16_4_ = uVar4;
                auVar151._20_4_ = uVar4;
                auVar151._24_4_ = uVar4;
                auVar151._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[8],auVar151);
                uVar4 = puVar373[9];
                auVar152._4_4_ = uVar4;
                auVar152._0_4_ = uVar4;
                auVar152._8_4_ = uVar4;
                auVar152._12_4_ = uVar4;
                auVar152._16_4_ = uVar4;
                auVar152._20_4_ = uVar4;
                auVar152._24_4_ = uVar4;
                auVar152._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[9],auVar152);
                uVar4 = puVar373[10];
                auVar153._4_4_ = uVar4;
                auVar153._0_4_ = uVar4;
                auVar153._8_4_ = uVar4;
                auVar153._12_4_ = uVar4;
                auVar153._16_4_ = uVar4;
                auVar153._20_4_ = uVar4;
                auVar153._24_4_ = uVar4;
                auVar153._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[10],auVar153);
                uVar4 = puVar373[0xb];
                auVar154._4_4_ = uVar4;
                auVar154._0_4_ = uVar4;
                auVar154._8_4_ = uVar4;
                auVar154._12_4_ = uVar4;
                auVar154._16_4_ = uVar4;
                auVar154._20_4_ = uVar4;
                auVar154._24_4_ = uVar4;
                auVar154._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xb],auVar154);
                uVar4 = puVar373[0xc];
                auVar155._4_4_ = uVar4;
                auVar155._0_4_ = uVar4;
                auVar155._8_4_ = uVar4;
                auVar155._12_4_ = uVar4;
                auVar155._16_4_ = uVar4;
                auVar155._20_4_ = uVar4;
                auVar155._24_4_ = uVar4;
                auVar155._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[0xc],auVar155);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar373[0xd];
                auVar156._4_4_ = uVar4;
                auVar156._0_4_ = uVar4;
                auVar156._8_4_ = uVar4;
                auVar156._12_4_ = uVar4;
                auVar156._16_4_ = uVar4;
                auVar156._20_4_ = uVar4;
                auVar156._24_4_ = uVar4;
                auVar156._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[0xd],auVar156);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar373[0xe];
                auVar157._4_4_ = uVar4;
                auVar157._0_4_ = uVar4;
                auVar157._8_4_ = uVar4;
                auVar157._12_4_ = uVar4;
                auVar157._16_4_ = uVar4;
                auVar157._20_4_ = uVar4;
                auVar157._24_4_ = uVar4;
                auVar157._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[0xe],auVar157);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar373[0xf];
                auVar158._4_4_ = uVar4;
                auVar158._0_4_ = uVar4;
                auVar158._8_4_ = uVar4;
                auVar158._12_4_ = uVar4;
                auVar158._16_4_ = uVar4;
                auVar158._20_4_ = uVar4;
                auVar158._24_4_ = uVar4;
                auVar158._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xf],auVar158);
                auVar461 = ZEXT3264(auVar447);
                pauVar401 = pauVar401 + 0x10;
                puVar373 = puVar373 + lVar424;
              }
              pauVar411 = pauVar411 + uVar417 * 0x10;
            }
            else {
              puVar373 = (undefined4 *)((long)local_188.data + lVar372 + (long)iVar403 * 4);
            }
            if (local_188.elempack == 8) {
              puVar407 = puVar373 + 7;
              uVar393 = uVar417;
              pauVar401 = pauVar411;
              while (iVar362 = (int)uVar393, uVar393 = (ulong)(iVar362 - 1), iVar362 != 0) {
                in_ZMM26 = ZEXT3264(pauVar401[10]);
                in_ZMM28 = ZEXT3264(pauVar401[0xc]);
                auVar565 = ZEXT3264(pauVar401[0xd]);
                auVar460 = ZEXT3264(pauVar401[0xe]);
                in_ZMM31 = ZEXT3264(pauVar401[0xf]);
                uVar4 = puVar407[-7];
                auVar159._4_4_ = uVar4;
                auVar159._0_4_ = uVar4;
                auVar159._8_4_ = uVar4;
                auVar159._12_4_ = uVar4;
                auVar159._16_4_ = uVar4;
                auVar159._20_4_ = uVar4;
                auVar159._24_4_ = uVar4;
                auVar159._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar159);
                uVar4 = puVar407[-6];
                auVar160._4_4_ = uVar4;
                auVar160._0_4_ = uVar4;
                auVar160._8_4_ = uVar4;
                auVar160._12_4_ = uVar4;
                auVar160._16_4_ = uVar4;
                auVar160._20_4_ = uVar4;
                auVar160._24_4_ = uVar4;
                auVar160._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar160);
                uVar4 = puVar407[-5];
                auVar161._4_4_ = uVar4;
                auVar161._0_4_ = uVar4;
                auVar161._8_4_ = uVar4;
                auVar161._12_4_ = uVar4;
                auVar161._16_4_ = uVar4;
                auVar161._20_4_ = uVar4;
                auVar161._24_4_ = uVar4;
                auVar161._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar161);
                uVar4 = puVar407[-4];
                auVar162._4_4_ = uVar4;
                auVar162._0_4_ = uVar4;
                auVar162._8_4_ = uVar4;
                auVar162._12_4_ = uVar4;
                auVar162._16_4_ = uVar4;
                auVar162._20_4_ = uVar4;
                auVar162._24_4_ = uVar4;
                auVar162._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar162);
                uVar4 = puVar407[-3];
                auVar163._4_4_ = uVar4;
                auVar163._0_4_ = uVar4;
                auVar163._8_4_ = uVar4;
                auVar163._12_4_ = uVar4;
                auVar163._16_4_ = uVar4;
                auVar163._20_4_ = uVar4;
                auVar163._24_4_ = uVar4;
                auVar163._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar163);
                uVar4 = puVar407[-2];
                auVar164._4_4_ = uVar4;
                auVar164._0_4_ = uVar4;
                auVar164._8_4_ = uVar4;
                auVar164._12_4_ = uVar4;
                auVar164._16_4_ = uVar4;
                auVar164._20_4_ = uVar4;
                auVar164._24_4_ = uVar4;
                auVar164._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar164);
                uVar4 = puVar407[-1];
                auVar165._4_4_ = uVar4;
                auVar165._0_4_ = uVar4;
                auVar165._8_4_ = uVar4;
                auVar165._12_4_ = uVar4;
                auVar165._16_4_ = uVar4;
                auVar165._20_4_ = uVar4;
                auVar165._24_4_ = uVar4;
                auVar165._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar165);
                uVar4 = *puVar407;
                auVar166._4_4_ = uVar4;
                auVar166._0_4_ = uVar4;
                auVar166._8_4_ = uVar4;
                auVar166._12_4_ = uVar4;
                auVar166._16_4_ = uVar4;
                auVar166._20_4_ = uVar4;
                auVar166._24_4_ = uVar4;
                auVar166._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar166);
                uVar4 = puVar407[lVar394 + -7];
                auVar167._4_4_ = uVar4;
                auVar167._0_4_ = uVar4;
                auVar167._8_4_ = uVar4;
                auVar167._12_4_ = uVar4;
                auVar167._16_4_ = uVar4;
                auVar167._20_4_ = uVar4;
                auVar167._24_4_ = uVar4;
                auVar167._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[8],auVar167);
                uVar4 = puVar407[lVar394 + -6];
                auVar168._4_4_ = uVar4;
                auVar168._0_4_ = uVar4;
                auVar168._8_4_ = uVar4;
                auVar168._12_4_ = uVar4;
                auVar168._16_4_ = uVar4;
                auVar168._20_4_ = uVar4;
                auVar168._24_4_ = uVar4;
                auVar168._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[9],auVar168);
                uVar4 = puVar407[lVar394 + -5];
                auVar169._4_4_ = uVar4;
                auVar169._0_4_ = uVar4;
                auVar169._8_4_ = uVar4;
                auVar169._12_4_ = uVar4;
                auVar169._16_4_ = uVar4;
                auVar169._20_4_ = uVar4;
                auVar169._24_4_ = uVar4;
                auVar169._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[10],auVar169);
                uVar4 = puVar407[lVar394 + -4];
                auVar170._4_4_ = uVar4;
                auVar170._0_4_ = uVar4;
                auVar170._8_4_ = uVar4;
                auVar170._12_4_ = uVar4;
                auVar170._16_4_ = uVar4;
                auVar170._20_4_ = uVar4;
                auVar170._24_4_ = uVar4;
                auVar170._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xb],auVar170);
                uVar4 = puVar407[lVar394 + -3];
                auVar171._4_4_ = uVar4;
                auVar171._0_4_ = uVar4;
                auVar171._8_4_ = uVar4;
                auVar171._12_4_ = uVar4;
                auVar171._16_4_ = uVar4;
                auVar171._20_4_ = uVar4;
                auVar171._24_4_ = uVar4;
                auVar171._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[0xc],auVar171);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar407[lVar394 + -2];
                auVar172._4_4_ = uVar4;
                auVar172._0_4_ = uVar4;
                auVar172._8_4_ = uVar4;
                auVar172._12_4_ = uVar4;
                auVar172._16_4_ = uVar4;
                auVar172._20_4_ = uVar4;
                auVar172._24_4_ = uVar4;
                auVar172._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[0xd],auVar172);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar407[lVar394 + -1];
                auVar173._4_4_ = uVar4;
                auVar173._0_4_ = uVar4;
                auVar173._8_4_ = uVar4;
                auVar173._12_4_ = uVar4;
                auVar173._16_4_ = uVar4;
                auVar173._20_4_ = uVar4;
                auVar173._24_4_ = uVar4;
                auVar173._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[0xe],auVar173);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar407[lVar394];
                auVar174._4_4_ = uVar4;
                auVar174._0_4_ = uVar4;
                auVar174._8_4_ = uVar4;
                auVar174._12_4_ = uVar4;
                auVar174._16_4_ = uVar4;
                auVar174._20_4_ = uVar4;
                auVar174._24_4_ = uVar4;
                auVar174._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xf],auVar174);
                auVar461 = ZEXT3264(auVar447);
                pauVar401 = pauVar401 + 0x10;
                puVar407 = puVar407 + lVar388;
              }
              puVar373 = (undefined4 *)((long)puVar373 + lVar410);
              pauVar411 = pauVar411 + uVar417 * 0x10;
            }
            if (local_188.elempack == 4) {
              puVar407 = puVar373 + 3;
              uVar393 = uVar417;
              pauVar401 = pauVar411;
              while (iVar362 = (int)uVar393, uVar393 = (ulong)(iVar362 - 1), iVar362 != 0) {
                in_ZMM26 = ZEXT3264(pauVar401[10]);
                in_ZMM28 = ZEXT3264(pauVar401[0xc]);
                auVar565 = ZEXT3264(pauVar401[0xd]);
                auVar460 = ZEXT3264(pauVar401[0xe]);
                in_ZMM31 = ZEXT3264(pauVar401[0xf]);
                uVar4 = puVar407[-3];
                auVar175._4_4_ = uVar4;
                auVar175._0_4_ = uVar4;
                auVar175._8_4_ = uVar4;
                auVar175._12_4_ = uVar4;
                auVar175._16_4_ = uVar4;
                auVar175._20_4_ = uVar4;
                auVar175._24_4_ = uVar4;
                auVar175._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar175);
                uVar4 = puVar407[-2];
                auVar176._4_4_ = uVar4;
                auVar176._0_4_ = uVar4;
                auVar176._8_4_ = uVar4;
                auVar176._12_4_ = uVar4;
                auVar176._16_4_ = uVar4;
                auVar176._20_4_ = uVar4;
                auVar176._24_4_ = uVar4;
                auVar176._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar176);
                uVar4 = puVar407[-1];
                auVar177._4_4_ = uVar4;
                auVar177._0_4_ = uVar4;
                auVar177._8_4_ = uVar4;
                auVar177._12_4_ = uVar4;
                auVar177._16_4_ = uVar4;
                auVar177._20_4_ = uVar4;
                auVar177._24_4_ = uVar4;
                auVar177._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar177);
                uVar4 = *puVar407;
                auVar178._4_4_ = uVar4;
                auVar178._0_4_ = uVar4;
                auVar178._8_4_ = uVar4;
                auVar178._12_4_ = uVar4;
                auVar178._16_4_ = uVar4;
                auVar178._20_4_ = uVar4;
                auVar178._24_4_ = uVar4;
                auVar178._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar178);
                uVar4 = puVar407[lVar394 + -3];
                auVar179._4_4_ = uVar4;
                auVar179._0_4_ = uVar4;
                auVar179._8_4_ = uVar4;
                auVar179._12_4_ = uVar4;
                auVar179._16_4_ = uVar4;
                auVar179._20_4_ = uVar4;
                auVar179._24_4_ = uVar4;
                auVar179._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar179);
                uVar4 = puVar407[lVar394 + -2];
                auVar180._4_4_ = uVar4;
                auVar180._0_4_ = uVar4;
                auVar180._8_4_ = uVar4;
                auVar180._12_4_ = uVar4;
                auVar180._16_4_ = uVar4;
                auVar180._20_4_ = uVar4;
                auVar180._24_4_ = uVar4;
                auVar180._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar180);
                uVar4 = puVar407[lVar394 + -1];
                auVar181._4_4_ = uVar4;
                auVar181._0_4_ = uVar4;
                auVar181._8_4_ = uVar4;
                auVar181._12_4_ = uVar4;
                auVar181._16_4_ = uVar4;
                auVar181._20_4_ = uVar4;
                auVar181._24_4_ = uVar4;
                auVar181._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar181);
                uVar4 = puVar407[lVar394];
                auVar182._4_4_ = uVar4;
                auVar182._0_4_ = uVar4;
                auVar182._8_4_ = uVar4;
                auVar182._12_4_ = uVar4;
                auVar182._16_4_ = uVar4;
                auVar182._20_4_ = uVar4;
                auVar182._24_4_ = uVar4;
                auVar182._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar182);
                uVar4 = puVar407[lVar369 + -3];
                auVar183._4_4_ = uVar4;
                auVar183._0_4_ = uVar4;
                auVar183._8_4_ = uVar4;
                auVar183._12_4_ = uVar4;
                auVar183._16_4_ = uVar4;
                auVar183._20_4_ = uVar4;
                auVar183._24_4_ = uVar4;
                auVar183._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[8],auVar183);
                uVar4 = puVar407[lVar369 + -2];
                auVar184._4_4_ = uVar4;
                auVar184._0_4_ = uVar4;
                auVar184._8_4_ = uVar4;
                auVar184._12_4_ = uVar4;
                auVar184._16_4_ = uVar4;
                auVar184._20_4_ = uVar4;
                auVar184._24_4_ = uVar4;
                auVar184._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[9],auVar184);
                uVar4 = puVar407[lVar369 + -1];
                auVar185._4_4_ = uVar4;
                auVar185._0_4_ = uVar4;
                auVar185._8_4_ = uVar4;
                auVar185._12_4_ = uVar4;
                auVar185._16_4_ = uVar4;
                auVar185._20_4_ = uVar4;
                auVar185._24_4_ = uVar4;
                auVar185._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[10],auVar185);
                uVar4 = puVar407[lVar369];
                auVar186._4_4_ = uVar4;
                auVar186._0_4_ = uVar4;
                auVar186._8_4_ = uVar4;
                auVar186._12_4_ = uVar4;
                auVar186._16_4_ = uVar4;
                auVar186._20_4_ = uVar4;
                auVar186._24_4_ = uVar4;
                auVar186._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xb],auVar186);
                uVar4 = puVar407[lVar418 + -3];
                auVar187._4_4_ = uVar4;
                auVar187._0_4_ = uVar4;
                auVar187._8_4_ = uVar4;
                auVar187._12_4_ = uVar4;
                auVar187._16_4_ = uVar4;
                auVar187._20_4_ = uVar4;
                auVar187._24_4_ = uVar4;
                auVar187._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[0xc],auVar187);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar407[lVar418 + -2];
                auVar188._4_4_ = uVar4;
                auVar188._0_4_ = uVar4;
                auVar188._8_4_ = uVar4;
                auVar188._12_4_ = uVar4;
                auVar188._16_4_ = uVar4;
                auVar188._20_4_ = uVar4;
                auVar188._24_4_ = uVar4;
                auVar188._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[0xd],auVar188);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar407[lVar418 + -1];
                auVar189._4_4_ = uVar4;
                auVar189._0_4_ = uVar4;
                auVar189._8_4_ = uVar4;
                auVar189._12_4_ = uVar4;
                auVar189._16_4_ = uVar4;
                auVar189._20_4_ = uVar4;
                auVar189._24_4_ = uVar4;
                auVar189._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[0xe],auVar189);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar407[lVar418];
                auVar190._4_4_ = uVar4;
                auVar190._0_4_ = uVar4;
                auVar190._8_4_ = uVar4;
                auVar190._12_4_ = uVar4;
                auVar190._16_4_ = uVar4;
                auVar190._20_4_ = uVar4;
                auVar190._24_4_ = uVar4;
                auVar190._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xf],auVar190);
                auVar461 = ZEXT3264(auVar447);
                pauVar401 = pauVar401 + 0x10;
                puVar407 = puVar407 + lVar421;
              }
              puVar373 = (undefined4 *)((long)puVar373 + lVar414);
              pauVar411 = pauVar411 + uVar417 * 0x10;
            }
            uVar393 = uVar417;
            pauVar401 = pauVar411;
            if (local_188.elempack == 1) {
              while ((int)uVar393 != 0) {
                in_ZMM26 = ZEXT3264(pauVar401[10]);
                in_ZMM28 = ZEXT3264(pauVar401[0xc]);
                auVar565 = ZEXT3264(pauVar401[0xd]);
                auVar460 = ZEXT3264(pauVar401[0xe]);
                in_ZMM31 = ZEXT3264(pauVar401[0xf]);
                uVar4 = *puVar373;
                auVar191._4_4_ = uVar4;
                auVar191._0_4_ = uVar4;
                auVar191._8_4_ = uVar4;
                auVar191._12_4_ = uVar4;
                auVar191._16_4_ = uVar4;
                auVar191._20_4_ = uVar4;
                auVar191._24_4_ = uVar4;
                auVar191._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar191);
                uVar4 = puVar373[lVar394];
                auVar192._4_4_ = uVar4;
                auVar192._0_4_ = uVar4;
                auVar192._8_4_ = uVar4;
                auVar192._12_4_ = uVar4;
                auVar192._16_4_ = uVar4;
                auVar192._20_4_ = uVar4;
                auVar192._24_4_ = uVar4;
                auVar192._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar192);
                uVar4 = puVar373[lVar369];
                auVar193._4_4_ = uVar4;
                auVar193._0_4_ = uVar4;
                auVar193._8_4_ = uVar4;
                auVar193._12_4_ = uVar4;
                auVar193._16_4_ = uVar4;
                auVar193._20_4_ = uVar4;
                auVar193._24_4_ = uVar4;
                auVar193._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar193);
                uVar4 = puVar373[lVar418];
                auVar194._4_4_ = uVar4;
                auVar194._0_4_ = uVar4;
                auVar194._8_4_ = uVar4;
                auVar194._12_4_ = uVar4;
                auVar194._16_4_ = uVar4;
                auVar194._20_4_ = uVar4;
                auVar194._24_4_ = uVar4;
                auVar194._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar194);
                uVar4 = puVar373[auVar459._16_8_];
                auVar195._4_4_ = uVar4;
                auVar195._0_4_ = uVar4;
                auVar195._8_4_ = uVar4;
                auVar195._12_4_ = uVar4;
                auVar195._16_4_ = uVar4;
                auVar195._20_4_ = uVar4;
                auVar195._24_4_ = uVar4;
                auVar195._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar195);
                uVar4 = puVar373[lVar389];
                auVar196._4_4_ = uVar4;
                auVar196._0_4_ = uVar4;
                auVar196._8_4_ = uVar4;
                auVar196._12_4_ = uVar4;
                auVar196._16_4_ = uVar4;
                auVar196._20_4_ = uVar4;
                auVar196._24_4_ = uVar4;
                auVar196._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar196);
                uVar4 = puVar373[lVar527];
                auVar197._4_4_ = uVar4;
                auVar197._0_4_ = uVar4;
                auVar197._8_4_ = uVar4;
                auVar197._12_4_ = uVar4;
                auVar197._16_4_ = uVar4;
                auVar197._20_4_ = uVar4;
                auVar197._24_4_ = uVar4;
                auVar197._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar197);
                uVar4 = puVar373[lVar8];
                auVar198._4_4_ = uVar4;
                auVar198._0_4_ = uVar4;
                auVar198._8_4_ = uVar4;
                auVar198._12_4_ = uVar4;
                auVar198._16_4_ = uVar4;
                auVar198._20_4_ = uVar4;
                auVar198._24_4_ = uVar4;
                auVar198._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar198);
                uVar4 = puVar373[lVar528];
                auVar199._4_4_ = uVar4;
                auVar199._0_4_ = uVar4;
                auVar199._8_4_ = uVar4;
                auVar199._12_4_ = uVar4;
                auVar199._16_4_ = uVar4;
                auVar199._20_4_ = uVar4;
                auVar199._24_4_ = uVar4;
                auVar199._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[8],auVar199);
                uVar4 = puVar373[lVar383];
                auVar200._4_4_ = uVar4;
                auVar200._0_4_ = uVar4;
                auVar200._8_4_ = uVar4;
                auVar200._12_4_ = uVar4;
                auVar200._16_4_ = uVar4;
                auVar200._20_4_ = uVar4;
                auVar200._24_4_ = uVar4;
                auVar200._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar401[9],auVar200);
                uVar4 = puVar373[lVar495];
                auVar201._4_4_ = uVar4;
                auVar201._0_4_ = uVar4;
                auVar201._8_4_ = uVar4;
                auVar201._12_4_ = uVar4;
                auVar201._16_4_ = uVar4;
                auVar201._20_4_ = uVar4;
                auVar201._24_4_ = uVar4;
                auVar201._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar401[10],auVar201);
                uVar4 = puVar373[lVar404];
                auVar202._4_4_ = uVar4;
                auVar202._0_4_ = uVar4;
                auVar202._8_4_ = uVar4;
                auVar202._12_4_ = uVar4;
                auVar202._16_4_ = uVar4;
                auVar202._20_4_ = uVar4;
                auVar202._24_4_ = uVar4;
                auVar202._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xb],auVar202);
                uVar4 = puVar373[lVar529];
                auVar203._4_4_ = uVar4;
                auVar203._0_4_ = uVar4;
                auVar203._8_4_ = uVar4;
                auVar203._12_4_ = uVar4;
                auVar203._16_4_ = uVar4;
                auVar203._20_4_ = uVar4;
                auVar203._24_4_ = uVar4;
                auVar203._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[0xc],auVar203);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar373[lVar376];
                auVar204._4_4_ = uVar4;
                auVar204._0_4_ = uVar4;
                auVar204._8_4_ = uVar4;
                auVar204._12_4_ = uVar4;
                auVar204._16_4_ = uVar4;
                auVar204._20_4_ = uVar4;
                auVar204._24_4_ = uVar4;
                auVar204._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[0xd],auVar204);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar373[lVar364];
                auVar205._4_4_ = uVar4;
                auVar205._0_4_ = uVar4;
                auVar205._8_4_ = uVar4;
                auVar205._12_4_ = uVar4;
                auVar205._16_4_ = uVar4;
                auVar205._20_4_ = uVar4;
                auVar205._24_4_ = uVar4;
                auVar205._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[0xe],auVar205);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar373[lVar365];
                auVar206._4_4_ = uVar4;
                auVar206._0_4_ = uVar4;
                auVar206._8_4_ = uVar4;
                auVar206._12_4_ = uVar4;
                auVar206._16_4_ = uVar4;
                auVar206._20_4_ = uVar4;
                auVar206._24_4_ = uVar4;
                auVar206._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[0xf],auVar206);
                auVar461 = ZEXT3264(auVar447);
                puVar373 = puVar373 + lVar425;
                uVar393 = (ulong)((int)uVar393 - 1);
                pauVar401 = pauVar401 + 0x10;
              }
              pauVar411 = pauVar411 + uVar417 * 0x10;
            }
            uVar400 = uVar400 + 0x10;
            lVar415 = lVar415 + lVar392 * 0x10;
            puVar370 = puVar370 + lVar392 * 4;
          }
          for (; (int)((uint)uVar400 | 7) < local_350; uVar400 = uVar400 + 8) {
            lVar372 = (int)((long)((ulong)(uint)((int)(uint)uVar400 >> 0x1f) << 0x20 |
                                  uVar400 & 0xffffffff) / (long)local_188.elempack) * lVar392;
            if (local_188.elempack == 8) {
              puVar373 = (undefined4 *)((long)local_188.data + lVar372 + (long)iVar409 * 4);
              uVar393 = uVar417;
              pauVar401 = pauVar411;
              while (iVar362 = (int)uVar393, uVar393 = (ulong)(iVar362 - 1), iVar362 != 0) {
                uVar4 = *puVar373;
                auVar447._4_4_ = uVar4;
                auVar447._0_4_ = uVar4;
                auVar447._8_4_ = uVar4;
                auVar447._12_4_ = uVar4;
                auVar447._16_4_ = uVar4;
                auVar447._20_4_ = uVar4;
                auVar447._24_4_ = uVar4;
                auVar447._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar447);
                uVar4 = puVar373[1];
                auVar448._4_4_ = uVar4;
                auVar448._0_4_ = uVar4;
                auVar448._8_4_ = uVar4;
                auVar448._12_4_ = uVar4;
                auVar448._16_4_ = uVar4;
                auVar448._20_4_ = uVar4;
                auVar448._24_4_ = uVar4;
                auVar448._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar448);
                uVar4 = puVar373[2];
                auVar449._4_4_ = uVar4;
                auVar449._0_4_ = uVar4;
                auVar449._8_4_ = uVar4;
                auVar449._12_4_ = uVar4;
                auVar449._16_4_ = uVar4;
                auVar449._20_4_ = uVar4;
                auVar449._24_4_ = uVar4;
                auVar449._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar449);
                uVar4 = puVar373[3];
                auVar450._4_4_ = uVar4;
                auVar450._0_4_ = uVar4;
                auVar450._8_4_ = uVar4;
                auVar450._12_4_ = uVar4;
                auVar450._16_4_ = uVar4;
                auVar450._20_4_ = uVar4;
                auVar450._24_4_ = uVar4;
                auVar450._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar450);
                uVar4 = puVar373[4];
                auVar451._4_4_ = uVar4;
                auVar451._0_4_ = uVar4;
                auVar451._8_4_ = uVar4;
                auVar451._12_4_ = uVar4;
                auVar451._16_4_ = uVar4;
                auVar451._20_4_ = uVar4;
                auVar451._24_4_ = uVar4;
                auVar451._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar451);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar373[5];
                auVar452._4_4_ = uVar4;
                auVar452._0_4_ = uVar4;
                auVar452._8_4_ = uVar4;
                auVar452._12_4_ = uVar4;
                auVar452._16_4_ = uVar4;
                auVar452._20_4_ = uVar4;
                auVar452._24_4_ = uVar4;
                auVar452._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar452);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar373[6];
                auVar518._4_4_ = uVar4;
                auVar518._0_4_ = uVar4;
                auVar518._8_4_ = uVar4;
                auVar518._12_4_ = uVar4;
                auVar518._16_4_ = uVar4;
                auVar518._20_4_ = uVar4;
                auVar518._24_4_ = uVar4;
                auVar518._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar518);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar373[7];
                auVar207._4_4_ = uVar4;
                auVar207._0_4_ = uVar4;
                auVar207._8_4_ = uVar4;
                auVar207._12_4_ = uVar4;
                auVar207._16_4_ = uVar4;
                auVar207._20_4_ = uVar4;
                auVar207._24_4_ = uVar4;
                auVar207._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar207);
                auVar461 = ZEXT3264(auVar447);
                pauVar401 = pauVar401 + 8;
                puVar373 = puVar373 + lVar388;
              }
              pauVar411 = pauVar411 + uVar417 * 8;
            }
            else {
              puVar373 = (undefined4 *)((long)local_188.data + lVar372 + (long)iVar403 * 4);
            }
            if (local_188.elempack == 4) {
              puVar407 = puVar373 + 3;
              uVar393 = uVar417;
              pauVar401 = pauVar411;
              while (iVar362 = (int)uVar393, uVar393 = (ulong)(iVar362 - 1), iVar362 != 0) {
                uVar4 = puVar407[-3];
                auVar208._4_4_ = uVar4;
                auVar208._0_4_ = uVar4;
                auVar208._8_4_ = uVar4;
                auVar208._12_4_ = uVar4;
                auVar208._16_4_ = uVar4;
                auVar208._20_4_ = uVar4;
                auVar208._24_4_ = uVar4;
                auVar208._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar208);
                uVar4 = puVar407[-2];
                auVar209._4_4_ = uVar4;
                auVar209._0_4_ = uVar4;
                auVar209._8_4_ = uVar4;
                auVar209._12_4_ = uVar4;
                auVar209._16_4_ = uVar4;
                auVar209._20_4_ = uVar4;
                auVar209._24_4_ = uVar4;
                auVar209._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar209);
                uVar4 = puVar407[-1];
                auVar210._4_4_ = uVar4;
                auVar210._0_4_ = uVar4;
                auVar210._8_4_ = uVar4;
                auVar210._12_4_ = uVar4;
                auVar210._16_4_ = uVar4;
                auVar210._20_4_ = uVar4;
                auVar210._24_4_ = uVar4;
                auVar210._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar210);
                uVar4 = *puVar407;
                auVar211._4_4_ = uVar4;
                auVar211._0_4_ = uVar4;
                auVar211._8_4_ = uVar4;
                auVar211._12_4_ = uVar4;
                auVar211._16_4_ = uVar4;
                auVar211._20_4_ = uVar4;
                auVar211._24_4_ = uVar4;
                auVar211._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar211);
                uVar4 = puVar407[lVar394 + -3];
                auVar212._4_4_ = uVar4;
                auVar212._0_4_ = uVar4;
                auVar212._8_4_ = uVar4;
                auVar212._12_4_ = uVar4;
                auVar212._16_4_ = uVar4;
                auVar212._20_4_ = uVar4;
                auVar212._24_4_ = uVar4;
                auVar212._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar212);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar407[lVar394 + -2];
                auVar213._4_4_ = uVar4;
                auVar213._0_4_ = uVar4;
                auVar213._8_4_ = uVar4;
                auVar213._12_4_ = uVar4;
                auVar213._16_4_ = uVar4;
                auVar213._20_4_ = uVar4;
                auVar213._24_4_ = uVar4;
                auVar213._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar213);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar407[lVar394 + -1];
                auVar214._4_4_ = uVar4;
                auVar214._0_4_ = uVar4;
                auVar214._8_4_ = uVar4;
                auVar214._12_4_ = uVar4;
                auVar214._16_4_ = uVar4;
                auVar214._20_4_ = uVar4;
                auVar214._24_4_ = uVar4;
                auVar214._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar214);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar407[lVar394];
                auVar215._4_4_ = uVar4;
                auVar215._0_4_ = uVar4;
                auVar215._8_4_ = uVar4;
                auVar215._12_4_ = uVar4;
                auVar215._16_4_ = uVar4;
                auVar215._20_4_ = uVar4;
                auVar215._24_4_ = uVar4;
                auVar215._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar215);
                auVar461 = ZEXT3264(auVar447);
                pauVar401 = pauVar401 + 8;
                puVar407 = puVar407 + lVar421;
              }
              puVar373 = (undefined4 *)((long)puVar373 + lVar414);
              pauVar411 = pauVar411 + uVar417 * 8;
            }
            uVar393 = uVar417;
            pauVar401 = pauVar411;
            if (local_188.elempack == 1) {
              while ((int)uVar393 != 0) {
                uVar4 = *puVar373;
                auVar216._4_4_ = uVar4;
                auVar216._0_4_ = uVar4;
                auVar216._8_4_ = uVar4;
                auVar216._12_4_ = uVar4;
                auVar216._16_4_ = uVar4;
                auVar216._20_4_ = uVar4;
                auVar216._24_4_ = uVar4;
                auVar216._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar216);
                uVar4 = puVar373[lVar394];
                auVar217._4_4_ = uVar4;
                auVar217._0_4_ = uVar4;
                auVar217._8_4_ = uVar4;
                auVar217._12_4_ = uVar4;
                auVar217._16_4_ = uVar4;
                auVar217._20_4_ = uVar4;
                auVar217._24_4_ = uVar4;
                auVar217._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar217);
                uVar4 = puVar373[lVar369];
                auVar218._4_4_ = uVar4;
                auVar218._0_4_ = uVar4;
                auVar218._8_4_ = uVar4;
                auVar218._12_4_ = uVar4;
                auVar218._16_4_ = uVar4;
                auVar218._20_4_ = uVar4;
                auVar218._24_4_ = uVar4;
                auVar218._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar218);
                uVar4 = puVar373[lVar418];
                auVar219._4_4_ = uVar4;
                auVar219._0_4_ = uVar4;
                auVar219._8_4_ = uVar4;
                auVar219._12_4_ = uVar4;
                auVar219._16_4_ = uVar4;
                auVar219._20_4_ = uVar4;
                auVar219._24_4_ = uVar4;
                auVar219._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar219);
                uVar4 = puVar373[auVar459._16_8_];
                auVar220._4_4_ = uVar4;
                auVar220._0_4_ = uVar4;
                auVar220._8_4_ = uVar4;
                auVar220._12_4_ = uVar4;
                auVar220._16_4_ = uVar4;
                auVar220._20_4_ = uVar4;
                auVar220._24_4_ = uVar4;
                auVar220._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar447,pauVar401[4],auVar220);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar373[lVar389];
                auVar221._4_4_ = uVar4;
                auVar221._0_4_ = uVar4;
                auVar221._8_4_ = uVar4;
                auVar221._12_4_ = uVar4;
                auVar221._16_4_ = uVar4;
                auVar221._20_4_ = uVar4;
                auVar221._24_4_ = uVar4;
                auVar221._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar448,pauVar401[5],auVar221);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar373[lVar527];
                auVar222._4_4_ = uVar4;
                auVar222._0_4_ = uVar4;
                auVar222._8_4_ = uVar4;
                auVar222._12_4_ = uVar4;
                auVar222._16_4_ = uVar4;
                auVar222._20_4_ = uVar4;
                auVar222._24_4_ = uVar4;
                auVar222._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar449,pauVar401[6],auVar222);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar373[lVar8];
                auVar223._4_4_ = uVar4;
                auVar223._0_4_ = uVar4;
                auVar223._8_4_ = uVar4;
                auVar223._12_4_ = uVar4;
                auVar223._16_4_ = uVar4;
                auVar223._20_4_ = uVar4;
                auVar223._24_4_ = uVar4;
                auVar223._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar450,pauVar401[7],auVar223);
                auVar461 = ZEXT3264(auVar447);
                puVar373 = puVar373 + lVar425;
                uVar393 = (ulong)((int)uVar393 - 1);
                pauVar401 = pauVar401 + 8;
              }
              pauVar411 = pauVar411 + uVar417 * 8;
            }
            lVar415 = lVar415 + lVar392 * 8;
            puVar370 = puVar370 + lVar392 * 2;
          }
          for (; (int)((uint)uVar400 | 3) < local_350; uVar400 = uVar400 + 4) {
            lVar372 = (int)((long)((ulong)(uint)((int)(uint)uVar400 >> 0x1f) << 0x20 |
                                  uVar400 & 0xffffffff) / (long)local_188.elempack) * lVar392;
            if (local_188.elempack == 4) {
              puVar373 = (undefined4 *)((long)local_188.data + lVar372 + (long)iVar409 * 4);
              uVar393 = uVar417;
              pauVar401 = pauVar411;
              while (iVar362 = (int)uVar393, uVar393 = (ulong)(iVar362 - 1), iVar362 != 0) {
                uVar4 = *puVar373;
                auVar224._4_4_ = uVar4;
                auVar224._0_4_ = uVar4;
                auVar224._8_4_ = uVar4;
                auVar224._12_4_ = uVar4;
                auVar224._16_4_ = uVar4;
                auVar224._20_4_ = uVar4;
                auVar224._24_4_ = uVar4;
                auVar224._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar224);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar373[1];
                auVar225._4_4_ = uVar4;
                auVar225._0_4_ = uVar4;
                auVar225._8_4_ = uVar4;
                auVar225._12_4_ = uVar4;
                auVar225._16_4_ = uVar4;
                auVar225._20_4_ = uVar4;
                auVar225._24_4_ = uVar4;
                auVar225._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar225);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar373[2];
                auVar226._4_4_ = uVar4;
                auVar226._0_4_ = uVar4;
                auVar226._8_4_ = uVar4;
                auVar226._12_4_ = uVar4;
                auVar226._16_4_ = uVar4;
                auVar226._20_4_ = uVar4;
                auVar226._24_4_ = uVar4;
                auVar226._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar226);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar373[3];
                auVar227._4_4_ = uVar4;
                auVar227._0_4_ = uVar4;
                auVar227._8_4_ = uVar4;
                auVar227._12_4_ = uVar4;
                auVar227._16_4_ = uVar4;
                auVar227._20_4_ = uVar4;
                auVar227._24_4_ = uVar4;
                auVar227._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar227);
                auVar461 = ZEXT3264(auVar447);
                pauVar401 = pauVar401 + 4;
                puVar373 = puVar373 + lVar421;
              }
              pauVar411 = pauVar411 + uVar417 * 4;
            }
            else {
              puVar373 = (undefined4 *)((long)local_188.data + lVar372 + (long)iVar403 * 4);
            }
            uVar393 = uVar417;
            pauVar401 = pauVar411;
            if (local_188.elempack == 1) {
              while ((int)uVar393 != 0) {
                uVar4 = *puVar373;
                auVar228._4_4_ = uVar4;
                auVar228._0_4_ = uVar4;
                auVar228._8_4_ = uVar4;
                auVar228._12_4_ = uVar4;
                auVar228._16_4_ = uVar4;
                auVar228._20_4_ = uVar4;
                auVar228._24_4_ = uVar4;
                auVar228._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar228);
                auVar462 = ZEXT3264(auVar447);
                uVar4 = puVar373[lVar394];
                auVar229._4_4_ = uVar4;
                auVar229._0_4_ = uVar4;
                auVar229._8_4_ = uVar4;
                auVar229._12_4_ = uVar4;
                auVar229._16_4_ = uVar4;
                auVar229._20_4_ = uVar4;
                auVar229._24_4_ = uVar4;
                auVar229._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar229);
                in_ZMM17 = (float  [16])ZEXT3264(auVar447);
                uVar4 = puVar373[lVar369];
                auVar230._4_4_ = uVar4;
                auVar230._0_4_ = uVar4;
                auVar230._8_4_ = uVar4;
                auVar230._12_4_ = uVar4;
                auVar230._16_4_ = uVar4;
                auVar230._20_4_ = uVar4;
                auVar230._24_4_ = uVar4;
                auVar230._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar401[2],auVar230);
                in_ZMM16 = ZEXT3264(auVar447);
                uVar4 = puVar373[lVar418];
                auVar231._4_4_ = uVar4;
                auVar231._0_4_ = uVar4;
                auVar231._8_4_ = uVar4;
                auVar231._12_4_ = uVar4;
                auVar231._16_4_ = uVar4;
                auVar231._20_4_ = uVar4;
                auVar231._24_4_ = uVar4;
                auVar231._28_4_ = uVar4;
                auVar447 = vfmadd231ps_avx512vl(auVar461._0_32_,pauVar401[3],auVar231);
                auVar461 = ZEXT3264(auVar447);
                puVar373 = puVar373 + lVar425;
                uVar393 = (ulong)((int)uVar393 - 1);
                pauVar401 = pauVar401 + 4;
              }
              pauVar411 = pauVar411 + uVar417 * 4;
            }
            lVar415 = lVar415 + lVar392 * 4;
            puVar370 = puVar370 + lVar392;
          }
          for (; (long)(uVar400 | 1) < lVar397; uVar400 = uVar400 + 2) {
            lVar372 = 0;
            uVar393 = uVar417;
            pauVar401 = pauVar411;
            while (iVar403 = (int)uVar393, uVar393 = (ulong)(iVar403 - 1), iVar403 != 0) {
              uVar4 = *(undefined4 *)((long)puVar370 + lVar372);
              auVar232._4_4_ = uVar4;
              auVar232._0_4_ = uVar4;
              auVar232._8_4_ = uVar4;
              auVar232._12_4_ = uVar4;
              auVar232._16_4_ = uVar4;
              auVar232._20_4_ = uVar4;
              auVar232._24_4_ = uVar4;
              auVar232._28_4_ = uVar4;
              auVar447 = vfmadd231ps_avx512vl(auVar462._0_32_,*pauVar401,auVar232);
              auVar462 = ZEXT3264(auVar447);
              uVar4 = *(undefined4 *)(lVar415 + lVar372);
              auVar233._4_4_ = uVar4;
              auVar233._0_4_ = uVar4;
              auVar233._8_4_ = uVar4;
              auVar233._12_4_ = uVar4;
              auVar233._16_4_ = uVar4;
              auVar233._20_4_ = uVar4;
              auVar233._24_4_ = uVar4;
              auVar233._28_4_ = uVar4;
              auVar447 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar401[1],auVar233);
              in_ZMM17 = (float  [16])ZEXT3264(auVar447);
              pauVar401 = pauVar401 + 2;
              lVar372 = lVar372 + lVar426;
            }
            pauVar411 = pauVar411 + uVar417 * 2;
            lVar415 = lVar415 + lVar392 * 2;
            puVar370 = (undefined4 *)((long)puVar370 + lVar392 * 2);
          }
          for (; puVar373 = puVar370, uVar393 = uVar417, pauVar401 = pauVar411,
              (long)uVar400 < lVar397; uVar400 = uVar400 + 1) {
            while ((int)uVar393 != 0) {
              uVar4 = *puVar373;
              auVar502._4_4_ = uVar4;
              auVar502._0_4_ = uVar4;
              auVar502._8_4_ = uVar4;
              auVar502._12_4_ = uVar4;
              auVar502._16_4_ = uVar4;
              auVar502._20_4_ = uVar4;
              auVar502._24_4_ = uVar4;
              auVar502._28_4_ = uVar4;
              auVar429 = vfmadd231ps_fma(auVar462._0_32_,auVar502,*pauVar401);
              auVar462 = ZEXT1664(auVar429);
              puVar373 = puVar373 + lVar425;
              uVar393 = (ulong)((int)uVar393 - 1);
              pauVar401 = pauVar401 + 1;
            }
            pauVar411 = pauVar411 + uVar417;
            puVar370 = (undefined4 *)((long)puVar370 + lVar392);
          }
          auVar447 = vaddps_avx512vl(in_ZMM16._0_32_,auVar461._0_32_);
          auVar448 = vaddps_avx512vl(in_ZMM17._0_32_,auVar462._0_32_);
          auVar490._0_4_ = auVar447._0_4_ + auVar448._0_4_;
          auVar490._4_4_ = auVar447._4_4_ + auVar448._4_4_;
          auVar490._8_4_ = auVar447._8_4_ + auVar448._8_4_;
          auVar490._12_4_ = auVar447._12_4_ + auVar448._12_4_;
          auVar490._16_4_ = auVar447._16_4_ + auVar448._16_4_;
          auVar490._20_4_ = auVar447._20_4_ + auVar448._20_4_;
          auVar490._24_4_ = auVar447._24_4_ + auVar448._24_4_;
          auVar490._28_4_ = auVar447._28_4_ + auVar448._28_4_;
          if (5 < iVar423 - 1U) goto LAB_004cd355;
          auVar447 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar457 = vmaxps_avx(auVar490,auVar447);
          switch(iVar423) {
          case 2:
            auVar447 = vminps_avx(auVar490,auVar447);
            uVar4 = *(this->super_Convolution1D).activation_params.data;
            auVar253._4_4_ = uVar4;
            auVar253._0_4_ = uVar4;
            auVar253._8_4_ = uVar4;
            auVar253._12_4_ = uVar4;
            auVar253._16_4_ = uVar4;
            auVar253._20_4_ = uVar4;
            auVar253._24_4_ = uVar4;
            auVar253._28_4_ = uVar4;
            auVar457 = vfmadd231ps_avx512vl(auVar457,auVar447,auVar253);
            break;
          case 3:
            puVar370 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
            uVar4 = *puVar370;
            auVar251._4_4_ = uVar4;
            auVar251._0_4_ = uVar4;
            auVar251._8_4_ = uVar4;
            auVar251._12_4_ = uVar4;
            auVar251._16_4_ = uVar4;
            auVar251._20_4_ = uVar4;
            auVar251._24_4_ = uVar4;
            auVar251._28_4_ = uVar4;
            auVar447 = vmaxps_avx512vl(auVar490,auVar251);
            uVar4 = puVar370[1];
            auVar252._4_4_ = uVar4;
            auVar252._0_4_ = uVar4;
            auVar252._8_4_ = uVar4;
            auVar252._12_4_ = uVar4;
            auVar252._16_4_ = uVar4;
            auVar252._20_4_ = uVar4;
            auVar252._24_4_ = uVar4;
            auVar252._28_4_ = uVar4;
            auVar457 = vminps_avx512vl(auVar447,auVar252);
            break;
          case 4:
            auVar247._8_4_ = 0x80000000;
            auVar247._0_8_ = 0x8000000080000000;
            auVar247._12_4_ = 0x80000000;
            auVar247._16_4_ = 0x80000000;
            auVar247._20_4_ = 0x80000000;
            auVar247._24_4_ = 0x80000000;
            auVar247._28_4_ = 0x80000000;
            auVar447 = vxorps_avx512vl(auVar490,auVar247);
            auVar248._8_4_ = 0x42b0c0a5;
            auVar248._0_8_ = 0x42b0c0a542b0c0a5;
            auVar248._12_4_ = 0x42b0c0a5;
            auVar248._16_4_ = 0x42b0c0a5;
            auVar248._20_4_ = 0x42b0c0a5;
            auVar248._24_4_ = 0x42b0c0a5;
            auVar248._28_4_ = 0x42b0c0a5;
            auVar447 = vminps_avx512vl(auVar447,auVar248);
            auVar249._8_4_ = 0xc2b0c0a5;
            auVar249._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar249._12_4_ = 0xc2b0c0a5;
            auVar249._16_4_ = 0xc2b0c0a5;
            auVar249._20_4_ = 0xc2b0c0a5;
            auVar249._24_4_ = 0xc2b0c0a5;
            auVar249._28_4_ = 0xc2b0c0a5;
            auVar448 = vmaxps_avx512vl(auVar447,auVar249);
            auVar429 = vfmadd231ps_fma(auVar446,auVar448,auVar445);
            auVar447 = vroundps_avx(ZEXT1632(auVar429),1);
            uVar400 = vcmpps_avx512vl(ZEXT1632(auVar429),auVar447,1);
            auVar449 = vsubps_avx512vl(auVar447,auVar536);
            bVar18 = (bool)((byte)uVar400 & 1);
            auVar458._0_4_ = (float)((uint)bVar18 * auVar449._0_4_ | (uint)!bVar18 * auVar447._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
            auVar458._4_4_ = (float)((uint)bVar18 * auVar449._4_4_ | (uint)!bVar18 * auVar447._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 2) & 1);
            auVar458._8_4_ = (float)((uint)bVar18 * auVar449._8_4_ | (uint)!bVar18 * auVar447._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 3) & 1);
            auVar458._12_4_ =
                 (float)((uint)bVar18 * auVar449._12_4_ | (uint)!bVar18 * auVar447._12_4_);
            bVar18 = (bool)((byte)(uVar400 >> 4) & 1);
            auVar458._16_4_ =
                 (float)((uint)bVar18 * auVar449._16_4_ | (uint)!bVar18 * auVar447._16_4_);
            bVar18 = (bool)((byte)(uVar400 >> 5) & 1);
            auVar458._20_4_ =
                 (float)((uint)bVar18 * auVar449._20_4_ | (uint)!bVar18 * auVar447._20_4_);
            bVar18 = (bool)((byte)(uVar400 >> 6) & 1);
            auVar458._24_4_ =
                 (float)((uint)bVar18 * auVar449._24_4_ | (uint)!bVar18 * auVar447._24_4_);
            bVar18 = SUB81(uVar400 >> 7,0);
            auVar458._28_4_ =
                 (float)((uint)bVar18 * auVar449._28_4_ | (uint)!bVar18 * auVar447._28_4_);
            auVar429 = vfmsub231ps_fma(auVar448,auVar458,auVar539);
            auVar250._8_4_ = 0x395e8083;
            auVar250._0_8_ = 0x395e8083395e8083;
            auVar250._12_4_ = 0x395e8083;
            auVar250._16_4_ = 0x395e8083;
            auVar250._20_4_ = 0x395e8083;
            auVar250._24_4_ = 0x395e8083;
            auVar250._28_4_ = 0x395e8083;
            auVar447 = vfmsub231ps_avx512vl(ZEXT1632(auVar429),auVar458,auVar250);
            auVar503._0_4_ = auVar447._0_4_ * auVar447._0_4_;
            auVar503._4_4_ = auVar447._4_4_ * auVar447._4_4_;
            auVar503._8_4_ = auVar447._8_4_ * auVar447._8_4_;
            auVar503._12_4_ = auVar447._12_4_ * auVar447._12_4_;
            auVar503._16_4_ = auVar447._16_4_ * auVar447._16_4_;
            auVar503._20_4_ = auVar447._20_4_ * auVar447._20_4_;
            auVar503._24_4_ = auVar447._24_4_ * auVar447._24_4_;
            auVar503._28_4_ = 0;
            auVar429 = vfmadd213ps_fma(auVar544,auVar447,auVar546);
            auVar429 = vfmadd213ps_fma(ZEXT1632(auVar429),auVar447,auVar553);
            auVar429 = vfmadd213ps_fma(ZEXT1632(auVar429),auVar447,auVar558);
            auVar429 = vfmadd213ps_fma(ZEXT1632(auVar429),auVar447,auVar560);
            auVar429 = vfmadd213ps_fma(ZEXT1632(auVar429),auVar447,auVar446);
            auVar429 = vfmadd213ps_fma(ZEXT1632(auVar429),auVar503,auVar447);
            auVar491._0_4_ = auVar429._0_4_ + 1.0;
            auVar491._4_4_ = auVar429._4_4_ + 1.0;
            auVar491._8_4_ = auVar429._8_4_ + 1.0;
            auVar491._12_4_ = auVar429._12_4_ + 1.0;
            auVar491._16_4_ = 0x3f800000;
            auVar491._20_4_ = 0x3f800000;
            auVar491._24_4_ = 0x3f800000;
            auVar491._28_4_ = 0x3f800000;
            auVar504._0_4_ = (int)auVar458._0_4_;
            auVar504._4_4_ = (int)auVar458._4_4_;
            auVar504._8_4_ = (int)auVar458._8_4_;
            auVar504._12_4_ = (int)auVar458._12_4_;
            auVar504._16_4_ = (int)auVar458._16_4_;
            auVar504._20_4_ = (int)auVar458._20_4_;
            auVar504._24_4_ = (int)auVar458._24_4_;
            auVar504._28_4_ = (int)auVar458._28_4_;
            auVar447 = vpslld_avx2(auVar504,0x17);
            auVar447 = vpaddd_avx2(auVar562,auVar447);
            auVar429 = vfmadd213ps_fma(auVar447,auVar491,auVar536);
            auVar457 = vdivps_avx(auVar536,ZEXT1632(auVar429));
            break;
          case 5:
            auVar449 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar448 = vminps_avx512vl(auVar490,auVar449);
            auVar450 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar451 = vmaxps_avx512vl(auVar448,auVar450);
            auVar429 = vfmadd213ps_fma(auVar445,auVar451,auVar446);
            auVar448 = vroundps_avx(ZEXT1632(auVar429),1);
            uVar400 = vcmpps_avx512vl(ZEXT1632(auVar429),auVar448,1);
            auVar452 = vsubps_avx512vl(auVar448,auVar536);
            bVar18 = (bool)((byte)uVar400 & 1);
            auVar453._0_4_ = (float)((uint)bVar18 * auVar452._0_4_ | (uint)!bVar18 * auVar448._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
            auVar453._4_4_ = (float)((uint)bVar18 * auVar452._4_4_ | (uint)!bVar18 * auVar448._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 2) & 1);
            auVar453._8_4_ = (float)((uint)bVar18 * auVar452._8_4_ | (uint)!bVar18 * auVar448._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 3) & 1);
            auVar453._12_4_ =
                 (float)((uint)bVar18 * auVar452._12_4_ | (uint)!bVar18 * auVar448._12_4_);
            bVar18 = (bool)((byte)(uVar400 >> 4) & 1);
            auVar453._16_4_ =
                 (float)((uint)bVar18 * auVar452._16_4_ | (uint)!bVar18 * auVar448._16_4_);
            bVar18 = (bool)((byte)(uVar400 >> 5) & 1);
            auVar453._20_4_ =
                 (float)((uint)bVar18 * auVar452._20_4_ | (uint)!bVar18 * auVar448._20_4_);
            bVar18 = (bool)((byte)(uVar400 >> 6) & 1);
            auVar453._24_4_ =
                 (float)((uint)bVar18 * auVar452._24_4_ | (uint)!bVar18 * auVar448._24_4_);
            bVar18 = SUB81(uVar400 >> 7,0);
            auVar453._28_4_ =
                 (float)((uint)bVar18 * auVar452._28_4_ | (uint)!bVar18 * auVar448._28_4_);
            auVar429 = vfmsub231ps_fma(auVar451,auVar453,auVar539);
            auVar429 = vfnmsub231ps_fma(ZEXT1632(auVar429),auVar453,auVar564);
            auVar451 = ZEXT1632(auVar429);
            auVar448 = vfmadd213ps_avx512vl(auVar544,auVar451,auVar546);
            auVar448 = vfmadd213ps_avx512vl(auVar448,auVar451,auVar553);
            auVar448 = vfmadd213ps_avx512vl(auVar448,auVar451,auVar558);
            auVar451 = ZEXT1632(auVar429);
            auVar448 = vfmadd213ps_avx512vl(auVar448,auVar451,auVar560);
            auVar448 = vfmadd213ps_avx512vl(auVar448,auVar451,auVar446);
            auVar448 = vfmadd213ps_avx512vl
                                 (auVar448,ZEXT1632(CONCAT412(auVar429._12_4_ * auVar429._12_4_,
                                                              CONCAT48(auVar429._8_4_ *
                                                                       auVar429._8_4_,
                                                                       CONCAT44(auVar429._4_4_ *
                                                                                auVar429._4_4_,
                                                                                auVar429._0_4_ *
                                                                                auVar429._0_4_)))),
                                  auVar451);
            auVar451 = vaddps_avx512vl(auVar448,auVar536);
            auVar517._0_4_ = (int)auVar453._0_4_;
            auVar517._4_4_ = (int)auVar453._4_4_;
            auVar517._8_4_ = (int)auVar453._8_4_;
            auVar517._12_4_ = (int)auVar453._12_4_;
            auVar517._16_4_ = (int)auVar453._16_4_;
            auVar517._20_4_ = (int)auVar453._20_4_;
            auVar517._24_4_ = (int)auVar453._24_4_;
            auVar517._28_4_ = (int)auVar453._28_4_;
            auVar448 = vpslld_avx2(auVar517,0x17);
            auVar448 = vpaddd_avx2(auVar562,auVar448);
            auVar429 = vfmadd213ps_fma(auVar448,auVar451,auVar536);
            uVar400 = vcmpps_avx512vl(ZEXT1632(auVar429),auVar447,2);
            auVar235._8_4_ = 0x800000;
            auVar235._0_8_ = 0x80000000800000;
            auVar235._12_4_ = 0x800000;
            auVar235._16_4_ = 0x800000;
            auVar235._20_4_ = 0x800000;
            auVar235._24_4_ = 0x800000;
            auVar235._28_4_ = 0x800000;
            auVar447 = vmaxps_avx512vl(ZEXT1632(auVar429),auVar235);
            auVar518 = vpsrld_avx2(auVar447,0x17);
            auVar542._8_4_ = 0x807fffff;
            auVar542._0_8_ = 0x807fffff807fffff;
            auVar542._12_4_ = 0x807fffff;
            auVar542._16_4_ = 0x807fffff;
            auVar542._20_4_ = 0x807fffff;
            auVar542._24_4_ = 0x807fffff;
            auVar542._28_4_ = 0x807fffff;
            auVar236._8_4_ = 0x3f000000;
            auVar236._0_8_ = 0x3f0000003f000000;
            auVar236._12_4_ = 0x3f000000;
            auVar236._16_4_ = 0x3f000000;
            auVar236._20_4_ = 0x3f000000;
            auVar236._24_4_ = 0x3f000000;
            auVar236._28_4_ = 0x3f000000;
            auVar447 = vpternlogd_avx512vl(auVar447,auVar542,auVar236,0xea);
            auVar237._8_4_ = 0x3f3504f3;
            auVar237._0_8_ = 0x3f3504f33f3504f3;
            auVar237._12_4_ = 0x3f3504f3;
            auVar237._16_4_ = 0x3f3504f3;
            auVar237._20_4_ = 0x3f3504f3;
            auVar237._24_4_ = 0x3f3504f3;
            auVar237._28_4_ = 0x3f3504f3;
            uVar393 = vcmpps_avx512vl(auVar447,auVar237,1);
            auVar448 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar451 = vaddps_avx512vl(auVar447,auVar448);
            auVar452 = vaddps_avx512vl(auVar451,auVar447);
            bVar18 = (bool)((byte)uVar393 & 1);
            auVar454._0_4_ = (float)((uint)bVar18 * auVar452._0_4_ | (uint)!bVar18 * auVar451._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar393 >> 1) & 1);
            auVar454._4_4_ = (float)((uint)bVar18 * auVar452._4_4_ | (uint)!bVar18 * auVar451._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar393 >> 2) & 1);
            auVar454._8_4_ = (float)((uint)bVar18 * auVar452._8_4_ | (uint)!bVar18 * auVar451._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar393 >> 3) & 1);
            auVar454._12_4_ =
                 (float)((uint)bVar18 * auVar452._12_4_ | (uint)!bVar18 * auVar451._12_4_);
            bVar18 = (bool)((byte)(uVar393 >> 4) & 1);
            auVar454._16_4_ =
                 (float)((uint)bVar18 * auVar452._16_4_ | (uint)!bVar18 * auVar451._16_4_);
            bVar18 = (bool)((byte)(uVar393 >> 5) & 1);
            auVar454._20_4_ =
                 (float)((uint)bVar18 * auVar452._20_4_ | (uint)!bVar18 * auVar451._20_4_);
            bVar18 = (bool)((byte)(uVar393 >> 6) & 1);
            auVar454._24_4_ =
                 (float)((uint)bVar18 * auVar452._24_4_ | (uint)!bVar18 * auVar451._24_4_);
            bVar18 = SUB81(uVar393 >> 7,0);
            auVar454._28_4_ = (uint)bVar18 * auVar452._28_4_ | (uint)!bVar18 * auVar451._28_4_;
            auVar350._4_4_ = auVar454._4_4_ * auVar454._4_4_;
            auVar350._0_4_ = auVar454._0_4_ * auVar454._0_4_;
            auVar350._8_4_ = auVar454._8_4_ * auVar454._8_4_;
            auVar350._12_4_ = auVar454._12_4_ * auVar454._12_4_;
            auVar350._16_4_ = auVar454._16_4_ * auVar454._16_4_;
            auVar350._20_4_ = auVar454._20_4_ * auVar454._20_4_;
            auVar350._24_4_ = auVar454._24_4_ * auVar454._24_4_;
            auVar350._28_4_ = auVar447._28_4_;
            auVar447 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
            auVar238._8_4_ = 0xbdebd1b8;
            auVar238._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar238._12_4_ = 0xbdebd1b8;
            auVar238._16_4_ = 0xbdebd1b8;
            auVar238._20_4_ = 0xbdebd1b8;
            auVar238._24_4_ = 0xbdebd1b8;
            auVar238._28_4_ = 0xbdebd1b8;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar238);
            auVar239._8_4_ = 0x3def251a;
            auVar239._0_8_ = 0x3def251a3def251a;
            auVar239._12_4_ = 0x3def251a;
            auVar239._16_4_ = 0x3def251a;
            auVar239._20_4_ = 0x3def251a;
            auVar239._24_4_ = 0x3def251a;
            auVar239._28_4_ = 0x3def251a;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar239);
            auVar240._8_4_ = 0xbdfe5d4f;
            auVar240._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar240._12_4_ = 0xbdfe5d4f;
            auVar240._16_4_ = 0xbdfe5d4f;
            auVar240._20_4_ = 0xbdfe5d4f;
            auVar240._24_4_ = 0xbdfe5d4f;
            auVar240._28_4_ = 0xbdfe5d4f;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar240);
            auVar241._8_4_ = 0x3e11e9bf;
            auVar241._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar241._12_4_ = 0x3e11e9bf;
            auVar241._16_4_ = 0x3e11e9bf;
            auVar241._20_4_ = 0x3e11e9bf;
            auVar241._24_4_ = 0x3e11e9bf;
            auVar241._28_4_ = 0x3e11e9bf;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar241);
            auVar242._8_4_ = 0xbe2aae50;
            auVar242._0_8_ = 0xbe2aae50be2aae50;
            auVar242._12_4_ = 0xbe2aae50;
            auVar242._16_4_ = 0xbe2aae50;
            auVar242._20_4_ = 0xbe2aae50;
            auVar242._24_4_ = 0xbe2aae50;
            auVar242._28_4_ = 0xbe2aae50;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar242);
            auVar243._8_4_ = 0x3e4cceac;
            auVar243._0_8_ = 0x3e4cceac3e4cceac;
            auVar243._12_4_ = 0x3e4cceac;
            auVar243._16_4_ = 0x3e4cceac;
            auVar243._20_4_ = 0x3e4cceac;
            auVar243._24_4_ = 0x3e4cceac;
            auVar243._28_4_ = 0x3e4cceac;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar243);
            auVar244._8_4_ = 0xbe7ffffc;
            auVar244._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar244._12_4_ = 0xbe7ffffc;
            auVar244._16_4_ = 0xbe7ffffc;
            auVar244._20_4_ = 0xbe7ffffc;
            auVar244._24_4_ = 0xbe7ffffc;
            auVar244._28_4_ = 0xbe7ffffc;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar244);
            auVar245._8_4_ = 0x3eaaaaaa;
            auVar245._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar245._12_4_ = 0x3eaaaaaa;
            auVar245._16_4_ = 0x3eaaaaaa;
            auVar245._20_4_ = 0x3eaaaaaa;
            auVar245._24_4_ = 0x3eaaaaaa;
            auVar245._28_4_ = 0x3eaaaaaa;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar454,auVar245);
            auVar451 = vmulps_avx512vl(auVar350,auVar454);
            auVar451 = vmulps_avx512vl(auVar451,auVar447);
            auVar246._8_4_ = 0xffffff82;
            auVar246._0_8_ = 0xffffff82ffffff82;
            auVar246._12_4_ = 0xffffff82;
            auVar246._16_4_ = 0xffffff82;
            auVar246._20_4_ = 0xffffff82;
            auVar246._24_4_ = 0xffffff82;
            auVar246._28_4_ = 0xffffff82;
            auVar447 = vpaddd_avx512vl(auVar518,auVar246);
            auVar447 = vcvtdq2ps_avx(auVar447);
            auVar452 = vsubps_avx512vl(auVar447,auVar536);
            bVar18 = (bool)((byte)uVar393 & 1);
            auVar455._0_4_ = (uint)bVar18 * auVar452._0_4_ | (uint)!bVar18 * auVar447._0_4_;
            bVar18 = (bool)((byte)(uVar393 >> 1) & 1);
            auVar455._4_4_ = (uint)bVar18 * auVar452._4_4_ | (uint)!bVar18 * auVar447._4_4_;
            bVar18 = (bool)((byte)(uVar393 >> 2) & 1);
            auVar455._8_4_ = (uint)bVar18 * auVar452._8_4_ | (uint)!bVar18 * auVar447._8_4_;
            bVar18 = (bool)((byte)(uVar393 >> 3) & 1);
            auVar455._12_4_ = (uint)bVar18 * auVar452._12_4_ | (uint)!bVar18 * auVar447._12_4_;
            bVar18 = (bool)((byte)(uVar393 >> 4) & 1);
            auVar455._16_4_ = (uint)bVar18 * auVar452._16_4_ | (uint)!bVar18 * auVar447._16_4_;
            bVar18 = (bool)((byte)(uVar393 >> 5) & 1);
            auVar455._20_4_ = (uint)bVar18 * auVar452._20_4_ | (uint)!bVar18 * auVar447._20_4_;
            bVar18 = (bool)((byte)(uVar393 >> 6) & 1);
            auVar455._24_4_ = (uint)bVar18 * auVar452._24_4_ | (uint)!bVar18 * auVar447._24_4_;
            bVar18 = SUB81(uVar393 >> 7,0);
            auVar455._28_4_ = (uint)bVar18 * auVar452._28_4_ | (uint)!bVar18 * auVar447._28_4_;
            auVar447 = vfmadd231ps_avx512vl(auVar451,auVar455,auVar564);
            auVar447 = vfmsub231ps_avx512vl(auVar447,auVar446,auVar350);
            auVar447 = vsubps_avx512vl(auVar447,auVar454);
            auVar429 = vfmsub231ps_fma(auVar447,auVar539,auVar455);
            auVar451 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
            in_ZMM17 = (float  [16])ZEXT3264(auVar451);
            auVar447 = vmulps_avx512vl(ZEXT1632(auVar429),auVar451);
            auVar452 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar18 = (bool)((byte)uVar400 & 1);
            auVar456._0_4_ = (uint)bVar18 * auVar452._0_4_ | (uint)!bVar18 * auVar447._0_4_;
            bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
            auVar456._4_4_ = (uint)bVar18 * auVar452._4_4_ | (uint)!bVar18 * auVar447._4_4_;
            bVar18 = (bool)((byte)(uVar400 >> 2) & 1);
            auVar456._8_4_ = (uint)bVar18 * auVar452._8_4_ | (uint)!bVar18 * auVar447._8_4_;
            bVar18 = (bool)((byte)(uVar400 >> 3) & 1);
            auVar456._12_4_ = (uint)bVar18 * auVar452._12_4_ | (uint)!bVar18 * auVar447._12_4_;
            bVar18 = (bool)((byte)(uVar400 >> 4) & 1);
            auVar456._16_4_ = (uint)bVar18 * auVar452._16_4_ | (uint)!bVar18 * auVar447._16_4_;
            bVar18 = (bool)((byte)(uVar400 >> 5) & 1);
            auVar456._20_4_ = (uint)bVar18 * auVar452._20_4_ | (uint)!bVar18 * auVar447._20_4_;
            bVar18 = (bool)((byte)(uVar400 >> 6) & 1);
            auVar456._24_4_ = (uint)bVar18 * auVar452._24_4_ | (uint)!bVar18 * auVar447._24_4_;
            bVar18 = SUB81(uVar400 >> 7,0);
            auVar456._28_4_ = (uint)bVar18 * auVar452._28_4_ | (uint)!bVar18 * auVar447._28_4_;
            auVar447 = vminps_avx512vl(auVar456,auVar449);
            auVar449 = vmaxps_avx512vl(auVar447,auVar450);
            auVar429 = vfmadd213ps_fma(auVar445,auVar449,auVar446);
            auVar447 = vroundps_avx(ZEXT1632(auVar429),1);
            uVar400 = vcmpps_avx512vl(ZEXT1632(auVar429),auVar447,1);
            auVar450 = vsubps_avx512vl(auVar447,auVar536);
            bVar18 = (bool)((byte)uVar400 & 1);
            auVar457._0_4_ = (float)((uint)bVar18 * auVar450._0_4_ | (uint)!bVar18 * auVar447._0_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
            auVar457._4_4_ = (float)((uint)bVar18 * auVar450._4_4_ | (uint)!bVar18 * auVar447._4_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 2) & 1);
            auVar457._8_4_ = (float)((uint)bVar18 * auVar450._8_4_ | (uint)!bVar18 * auVar447._8_4_)
            ;
            bVar18 = (bool)((byte)(uVar400 >> 3) & 1);
            auVar457._12_4_ =
                 (float)((uint)bVar18 * auVar450._12_4_ | (uint)!bVar18 * auVar447._12_4_);
            bVar18 = (bool)((byte)(uVar400 >> 4) & 1);
            auVar457._16_4_ =
                 (float)((uint)bVar18 * auVar450._16_4_ | (uint)!bVar18 * auVar447._16_4_);
            bVar18 = (bool)((byte)(uVar400 >> 5) & 1);
            auVar457._20_4_ =
                 (float)((uint)bVar18 * auVar450._20_4_ | (uint)!bVar18 * auVar447._20_4_);
            bVar18 = (bool)((byte)(uVar400 >> 6) & 1);
            auVar457._24_4_ =
                 (float)((uint)bVar18 * auVar450._24_4_ | (uint)!bVar18 * auVar447._24_4_);
            bVar18 = SUB81(uVar400 >> 7,0);
            auVar457._28_4_ =
                 (float)((uint)bVar18 * auVar450._28_4_ | (uint)!bVar18 * auVar447._28_4_);
            auVar429 = vfmsub231ps_fma(auVar449,auVar457,auVar539);
            auVar429 = vfnmsub231ps_fma(ZEXT1632(auVar429),auVar457,auVar564);
            auVar449 = ZEXT1632(auVar429);
            auVar447 = vfmadd213ps_avx512vl(auVar544,auVar449,auVar546);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar449,auVar553);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar449,auVar558);
            auVar449 = ZEXT1632(auVar429);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar449,auVar560);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar449,auVar446);
            auVar447 = vfmadd213ps_avx512vl
                                 (auVar447,ZEXT1632(CONCAT412(auVar429._12_4_ * auVar429._12_4_,
                                                              CONCAT48(auVar429._8_4_ *
                                                                       auVar429._8_4_,
                                                                       CONCAT44(auVar429._4_4_ *
                                                                                auVar429._4_4_,
                                                                                auVar429._0_4_ *
                                                                                auVar429._0_4_)))),
                                  auVar449);
            in_ZMM16 = ZEXT3264(auVar447);
            auVar449 = vaddps_avx512vl(auVar447,auVar536);
            auVar519._0_4_ = (int)auVar457._0_4_;
            auVar519._4_4_ = (int)auVar457._4_4_;
            auVar519._8_4_ = (int)auVar457._8_4_;
            auVar519._12_4_ = (int)auVar457._12_4_;
            auVar519._16_4_ = (int)auVar457._16_4_;
            auVar519._20_4_ = (int)auVar457._20_4_;
            auVar519._24_4_ = (int)auVar457._24_4_;
            auVar519._28_4_ = (int)auVar457._28_4_;
            auVar447 = vpslld_avx2(auVar519,0x17);
            auVar447 = vpaddd_avx2(auVar562,auVar447);
            auVar429 = vfmadd213ps_fma(auVar447,auVar449,auVar536);
            auVar447 = vdivps_avx(auVar536,ZEXT1632(auVar429));
            auVar447 = vfnmadd213ps_avx512vl(auVar447,auVar451,auVar448);
            auVar444 = auVar447._0_28_;
            goto LAB_004cd34d;
          case 6:
            puVar370 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
            uVar4 = *puVar370;
            auVar505._4_4_ = uVar4;
            auVar505._0_4_ = uVar4;
            auVar505._8_4_ = uVar4;
            auVar505._12_4_ = uVar4;
            auVar505._16_4_ = uVar4;
            auVar505._20_4_ = uVar4;
            auVar505._24_4_ = uVar4;
            auVar505._28_4_ = uVar4;
            uVar4 = puVar370[1];
            auVar234._4_4_ = uVar4;
            auVar234._0_4_ = uVar4;
            auVar234._8_4_ = uVar4;
            auVar234._12_4_ = uVar4;
            auVar234._16_4_ = uVar4;
            auVar234._20_4_ = uVar4;
            auVar234._24_4_ = uVar4;
            auVar234._28_4_ = uVar4;
            auVar448 = vfmadd213ps_avx512vl(auVar505,auVar490,auVar234);
            auVar447 = vmaxps_avx(auVar448,auVar447);
            auVar447 = vminps_avx(auVar447,auVar536);
            auVar444 = auVar447._0_28_;
LAB_004cd34d:
            auVar354._4_4_ = auVar444._4_4_ * auVar490._4_4_;
            auVar354._0_4_ = auVar444._0_4_ * auVar490._0_4_;
            auVar354._8_4_ = auVar444._8_4_ * auVar490._8_4_;
            auVar354._12_4_ = auVar444._12_4_ * auVar490._12_4_;
            auVar354._16_4_ = auVar444._16_4_ * auVar490._16_4_;
            auVar354._20_4_ = auVar444._20_4_ * auVar490._20_4_;
            auVar354._24_4_ = auVar444._24_4_ * auVar490._24_4_;
            auVar354._28_4_ = auVar457._28_4_;
            auVar457 = auVar354;
          }
          auVar490 = auVar457;
LAB_004cd355:
          auVar478 = auVar490._16_16_;
          auVar429 = auVar490._0_16_;
          if (iVar380 == 1) {
            *(int *)*local_2d8 = auVar490._0_4_;
            uVar4 = vextractps_avx(auVar429,1);
            *(undefined4 *)((long)*local_2d8 + lVar413 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,2);
            *(undefined4 *)((long)*local_2d8 + lVar366 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar429,3);
            *(undefined4 *)((long)*local_2d8 + lVar367 * 4) = uVar4;
            *(int *)((long)*local_2d8 + (long)(iVar381 * 4) * 4) = auVar490._16_4_;
            uVar4 = vextractps_avx(auVar478,1);
            *(undefined4 *)((long)*local_2d8 + (long)(iVar381 * 5) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar478,2);
            *(undefined4 *)((long)*local_2d8 + (long)(iVar381 * 6) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar478,3);
            *(undefined4 *)((long)*local_2d8 + (long)(iVar381 * 7) * 4) = uVar4;
            local_2d8 = (undefined1 (*) [32])((long)*local_2d8 + 4);
          }
          else if (iVar380 == 4) {
            *(undefined1 (*) [16])*local_2d8 = auVar429;
            *(undefined1 (*) [16])((long)*local_2d8 + lVar413 * 4) = auVar478;
            local_2d8 = (undefined1 (*) [32])((long)*local_2d8 + 0x10);
          }
          else if (iVar380 == 8) {
            *local_2d8 = auVar490;
            local_2d8 = local_2d8 + 1;
          }
          iVar409 = iVar409 + local_188.elempack * iVar6;
          local_2d0 = local_2d0 + lVar3;
          local_2a8 = local_2a8 + lVar3;
        }
      }
      iVar380 = uVar399 + (int)uVar368 * 8;
      uVar368 = (long)(iVar386 - iVar380) / 4;
      lVar404 = uVar417 * 0x10;
      uVar396 = 0;
      iVar381 = (int)uVar368;
      uVar391 = 0;
      if (0 < iVar381) {
        uVar391 = uVar368 & 0xffffffff;
      }
      auVar459 = vmovdqu64_avx512f(local_b8);
      lVar397 = auVar459._0_8_;
      lVar389 = vpextrq_avx(auVar459._0_16_,1);
      lVar369 = vpextrq_avx(auVar459._16_16_,1);
      lVar418 = vpextrq_avx(auVar428,1);
      auVar478._8_4_ = 0x3f000000;
      auVar478._0_8_ = 0x3f0000003f000000;
      auVar478._12_4_ = 0x3f000000;
      auVar483._8_4_ = 0x3fb8aa3b;
      auVar483._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar483._12_4_ = 0x3fb8aa3b;
      auVar496._8_4_ = 0x3f318000;
      auVar496._0_8_ = 0x3f3180003f318000;
      auVar496._12_4_ = 0x3f318000;
      auVar521._8_4_ = 0x39506967;
      auVar521._0_8_ = 0x3950696739506967;
      auVar521._12_4_ = 0x39506967;
      auVar530._8_4_ = 0x3ab743ce;
      auVar530._0_8_ = 0x3ab743ce3ab743ce;
      auVar530._12_4_ = 0x3ab743ce;
      auVar534._8_4_ = 0x3c088908;
      auVar534._0_8_ = 0x3c0889083c088908;
      auVar534._12_4_ = 0x3c088908;
      auVar538._8_4_ = 0x3d2aa9c1;
      auVar538._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar538._12_4_ = 0x3d2aa9c1;
      auVar541._8_4_ = 0x3e2aaaaa;
      auVar541._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar541._12_4_ = 0x3e2aaaaa;
      auVar543._8_4_ = 0x3f800000;
      auVar543._0_8_ = 0x3f8000003f800000;
      auVar543._12_4_ = 0x3f800000;
      auVar545._8_4_ = 0xb95e8083;
      auVar545._0_8_ = 0xb95e8083b95e8083;
      auVar545._12_4_ = 0xb95e8083;
      auVar429 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar428 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      for (; uVar396 != uVar391; uVar396 = uVar396 + 1) {
        uVar368 = (long)iVar380 + uVar396 * 4;
        uVar399 = top_blob->w;
        iVar409 = top_blob->elempack;
        uVar408 = (int)uVar368 >> 0x1f;
        local_2e0 = (undefined1 (*) [16])
                    ((long)(int)((long)((ulong)uVar408 << 0x20 | uVar368 & 0xffffffff) /
                                (long)iVar409) * (long)(int)uVar399 * top_blob->elemsize +
                    (long)top_blob->data);
        uVar390 = (ulong)uVar408 << 0x20 | uVar368 & 0xffffffff;
        lVar415 = (long)local_188.h * (long)local_188.elempack;
        local_2d0 = 0;
        uVar374 = 0;
        if (0 < (int)uVar399) {
          uVar374 = (ulong)uVar399;
        }
        iVar403 = 0;
        lVar392 = lVar394 * 4;
        for (uVar371 = 0; uVar371 != uVar374; uVar371 = uVar371 + 1) {
          auVar430 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
          auVar461 = ZEXT1664(auVar430);
          auVar430 = vxorps_avx512vl(auVar565._0_16_,auVar565._0_16_);
          if (pvVar7 != (void *)0x0) {
            auVar430 = *(undefined1 (*) [16])((long)pvVar7 + uVar368 * 4);
          }
          auVar462 = ZEXT1664(auVar430);
          pauVar406 = (undefined1 (*) [16])
                      ((this->weight_data_tm).cstep *
                       (long)(((int)((long)((ulong)uVar408 << 0x20 | uVar368 & 0xffffffff) % 8) >> 2
                              ) + (int)((long)uVar390 / 0x10) +
                             (int)(char)((char)((long)uVar390 % 0x10) / '\b')) *
                       (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar362 = local_188.elempack * iVar6 * (int)uVar371;
          lVar372 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar416 = lVar392 + (long)local_188.data;
          puVar370 = (undefined4 *)((long)local_188.data + local_2d0);
          uVar398 = 0;
          auVar430 = vxorps_avx512vl(auVar460._0_16_,auVar460._0_16_);
          auVar460 = ZEXT1664(auVar430);
          auVar430 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
          in_ZMM31 = ZEXT1664(auVar430);
          while( true ) {
            local_350 = (int)lVar415;
            if (local_350 <= (int)((uint)uVar398 | 0xf)) break;
            lVar375 = (int)((long)((ulong)(uint)((int)(uint)uVar398 >> 0x1f) << 0x20 |
                                  uVar398 & 0xffffffff) / (long)local_188.elempack) * lVar372;
            if (local_188.elempack == 0x10) {
              puVar373 = (undefined4 *)((long)local_188.data + lVar375 + (long)iVar403 * 4);
              uVar400 = uVar417;
              pauVar402 = pauVar406;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = *puVar373;
                auVar21._4_4_ = uVar4;
                auVar21._0_4_ = uVar4;
                auVar21._8_4_ = uVar4;
                auVar21._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar21);
                uVar4 = puVar373[1];
                auVar22._4_4_ = uVar4;
                auVar22._0_4_ = uVar4;
                auVar22._8_4_ = uVar4;
                auVar22._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar22);
                uVar4 = puVar373[2];
                auVar23._4_4_ = uVar4;
                auVar23._0_4_ = uVar4;
                auVar23._8_4_ = uVar4;
                auVar23._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar23);
                uVar4 = puVar373[3];
                auVar24._4_4_ = uVar4;
                auVar24._0_4_ = uVar4;
                auVar24._8_4_ = uVar4;
                auVar24._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar24);
                uVar4 = puVar373[4];
                auVar25._4_4_ = uVar4;
                auVar25._0_4_ = uVar4;
                auVar25._8_4_ = uVar4;
                auVar25._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar25);
                uVar4 = puVar373[5];
                auVar26._4_4_ = uVar4;
                auVar26._0_4_ = uVar4;
                auVar26._8_4_ = uVar4;
                auVar26._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar26);
                uVar4 = puVar373[6];
                auVar27._4_4_ = uVar4;
                auVar27._0_4_ = uVar4;
                auVar27._8_4_ = uVar4;
                auVar27._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar27);
                uVar4 = puVar373[7];
                auVar28._4_4_ = uVar4;
                auVar28._0_4_ = uVar4;
                auVar28._8_4_ = uVar4;
                auVar28._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar28);
                uVar4 = puVar373[8];
                auVar29._4_4_ = uVar4;
                auVar29._0_4_ = uVar4;
                auVar29._8_4_ = uVar4;
                auVar29._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[8],auVar29);
                uVar4 = puVar373[9];
                auVar30._4_4_ = uVar4;
                auVar30._0_4_ = uVar4;
                auVar30._8_4_ = uVar4;
                auVar30._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[9],auVar30);
                uVar4 = puVar373[10];
                auVar31._4_4_ = uVar4;
                auVar31._0_4_ = uVar4;
                auVar31._8_4_ = uVar4;
                auVar31._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[10],auVar31);
                uVar4 = puVar373[0xb];
                auVar32._4_4_ = uVar4;
                auVar32._0_4_ = uVar4;
                auVar32._8_4_ = uVar4;
                auVar32._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xb],auVar32);
                uVar4 = puVar373[0xc];
                auVar33._4_4_ = uVar4;
                auVar33._0_4_ = uVar4;
                auVar33._8_4_ = uVar4;
                auVar33._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[0xc],auVar33);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar373[0xd];
                auVar34._4_4_ = uVar4;
                auVar34._0_4_ = uVar4;
                auVar34._8_4_ = uVar4;
                auVar34._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[0xd],auVar34);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar373[0xe];
                auVar35._4_4_ = uVar4;
                auVar35._0_4_ = uVar4;
                auVar35._8_4_ = uVar4;
                auVar35._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[0xe],auVar35);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar373[0xf];
                auVar36._4_4_ = uVar4;
                auVar36._0_4_ = uVar4;
                auVar36._8_4_ = uVar4;
                auVar36._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xf],auVar36);
                auVar461 = ZEXT1664(auVar430);
                pauVar402 = pauVar402 + 0x10;
                puVar373 = puVar373 + lVar424;
              }
              pauVar406 = pauVar406 + uVar417 * 0x10;
            }
            else {
              puVar373 = (undefined4 *)((long)local_188.data + lVar375 + (long)iVar362 * 4);
            }
            if (local_188.elempack == 8) {
              puVar407 = puVar373 + 7;
              uVar400 = uVar417;
              pauVar402 = pauVar406;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = puVar407[-7];
                auVar37._4_4_ = uVar4;
                auVar37._0_4_ = uVar4;
                auVar37._8_4_ = uVar4;
                auVar37._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar37);
                uVar4 = puVar407[-6];
                auVar38._4_4_ = uVar4;
                auVar38._0_4_ = uVar4;
                auVar38._8_4_ = uVar4;
                auVar38._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar38);
                uVar4 = puVar407[-5];
                auVar39._4_4_ = uVar4;
                auVar39._0_4_ = uVar4;
                auVar39._8_4_ = uVar4;
                auVar39._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar39);
                uVar4 = puVar407[-4];
                auVar40._4_4_ = uVar4;
                auVar40._0_4_ = uVar4;
                auVar40._8_4_ = uVar4;
                auVar40._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar40);
                uVar4 = puVar407[-3];
                auVar41._4_4_ = uVar4;
                auVar41._0_4_ = uVar4;
                auVar41._8_4_ = uVar4;
                auVar41._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar41);
                uVar4 = puVar407[-2];
                auVar42._4_4_ = uVar4;
                auVar42._0_4_ = uVar4;
                auVar42._8_4_ = uVar4;
                auVar42._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar42);
                uVar4 = puVar407[-1];
                auVar43._4_4_ = uVar4;
                auVar43._0_4_ = uVar4;
                auVar43._8_4_ = uVar4;
                auVar43._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar43);
                uVar4 = *puVar407;
                auVar44._4_4_ = uVar4;
                auVar44._0_4_ = uVar4;
                auVar44._8_4_ = uVar4;
                auVar44._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar44);
                uVar4 = puVar407[lVar394 + -7];
                auVar45._4_4_ = uVar4;
                auVar45._0_4_ = uVar4;
                auVar45._8_4_ = uVar4;
                auVar45._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[8],auVar45);
                uVar4 = puVar407[lVar394 + -6];
                auVar46._4_4_ = uVar4;
                auVar46._0_4_ = uVar4;
                auVar46._8_4_ = uVar4;
                auVar46._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[9],auVar46);
                uVar4 = puVar407[lVar394 + -5];
                auVar47._4_4_ = uVar4;
                auVar47._0_4_ = uVar4;
                auVar47._8_4_ = uVar4;
                auVar47._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[10],auVar47);
                uVar4 = puVar407[lVar394 + -4];
                auVar48._4_4_ = uVar4;
                auVar48._0_4_ = uVar4;
                auVar48._8_4_ = uVar4;
                auVar48._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xb],auVar48);
                uVar4 = puVar407[lVar394 + -3];
                auVar49._4_4_ = uVar4;
                auVar49._0_4_ = uVar4;
                auVar49._8_4_ = uVar4;
                auVar49._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[0xc],auVar49);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar394 + -2];
                auVar50._4_4_ = uVar4;
                auVar50._0_4_ = uVar4;
                auVar50._8_4_ = uVar4;
                auVar50._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[0xd],auVar50);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar394 + -1];
                auVar51._4_4_ = uVar4;
                auVar51._0_4_ = uVar4;
                auVar51._8_4_ = uVar4;
                auVar51._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[0xe],auVar51);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar394];
                auVar52._4_4_ = uVar4;
                auVar52._0_4_ = uVar4;
                auVar52._8_4_ = uVar4;
                auVar52._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xf],auVar52);
                auVar461 = ZEXT1664(auVar430);
                pauVar402 = pauVar402 + 0x10;
                puVar407 = puVar407 + lVar388;
              }
              puVar373 = (undefined4 *)((long)puVar373 + lVar410);
              pauVar406 = pauVar406 + uVar417 * 0x10;
            }
            if (local_188.elempack == 4) {
              puVar407 = puVar373 + 3;
              uVar400 = uVar417;
              pauVar402 = pauVar406;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = puVar407[-3];
                auVar53._4_4_ = uVar4;
                auVar53._0_4_ = uVar4;
                auVar53._8_4_ = uVar4;
                auVar53._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar53);
                uVar4 = puVar407[-2];
                auVar54._4_4_ = uVar4;
                auVar54._0_4_ = uVar4;
                auVar54._8_4_ = uVar4;
                auVar54._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar54);
                uVar4 = puVar407[-1];
                auVar55._4_4_ = uVar4;
                auVar55._0_4_ = uVar4;
                auVar55._8_4_ = uVar4;
                auVar55._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar55);
                uVar4 = *puVar407;
                auVar56._4_4_ = uVar4;
                auVar56._0_4_ = uVar4;
                auVar56._8_4_ = uVar4;
                auVar56._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar56);
                uVar4 = puVar407[lVar394 + -3];
                auVar57._4_4_ = uVar4;
                auVar57._0_4_ = uVar4;
                auVar57._8_4_ = uVar4;
                auVar57._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar57);
                uVar4 = puVar407[lVar394 + -2];
                auVar58._4_4_ = uVar4;
                auVar58._0_4_ = uVar4;
                auVar58._8_4_ = uVar4;
                auVar58._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar58);
                uVar4 = puVar407[lVar394 + -1];
                auVar59._4_4_ = uVar4;
                auVar59._0_4_ = uVar4;
                auVar59._8_4_ = uVar4;
                auVar59._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar59);
                uVar4 = puVar407[lVar394];
                auVar60._4_4_ = uVar4;
                auVar60._0_4_ = uVar4;
                auVar60._8_4_ = uVar4;
                auVar60._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar60);
                uVar4 = puVar407[lVar397 + -3];
                auVar61._4_4_ = uVar4;
                auVar61._0_4_ = uVar4;
                auVar61._8_4_ = uVar4;
                auVar61._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[8],auVar61);
                uVar4 = puVar407[lVar397 + -2];
                auVar62._4_4_ = uVar4;
                auVar62._0_4_ = uVar4;
                auVar62._8_4_ = uVar4;
                auVar62._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[9],auVar62);
                uVar4 = puVar407[lVar397 + -1];
                auVar63._4_4_ = uVar4;
                auVar63._0_4_ = uVar4;
                auVar63._8_4_ = uVar4;
                auVar63._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[10],auVar63);
                uVar4 = puVar407[lVar397];
                auVar64._4_4_ = uVar4;
                auVar64._0_4_ = uVar4;
                auVar64._8_4_ = uVar4;
                auVar64._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xb],auVar64);
                uVar4 = puVar407[lVar389 + -3];
                auVar65._4_4_ = uVar4;
                auVar65._0_4_ = uVar4;
                auVar65._8_4_ = uVar4;
                auVar65._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[0xc],auVar65);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar389 + -2];
                auVar66._4_4_ = uVar4;
                auVar66._0_4_ = uVar4;
                auVar66._8_4_ = uVar4;
                auVar66._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[0xd],auVar66);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar389 + -1];
                auVar67._4_4_ = uVar4;
                auVar67._0_4_ = uVar4;
                auVar67._8_4_ = uVar4;
                auVar67._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[0xe],auVar67);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar389];
                auVar68._4_4_ = uVar4;
                auVar68._0_4_ = uVar4;
                auVar68._8_4_ = uVar4;
                auVar68._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xf],auVar68);
                auVar461 = ZEXT1664(auVar430);
                pauVar402 = pauVar402 + 0x10;
                puVar407 = puVar407 + lVar421;
              }
              puVar373 = (undefined4 *)((long)puVar373 + lVar414);
              pauVar406 = pauVar406 + uVar417 * 0x10;
            }
            uVar400 = uVar417;
            pauVar402 = pauVar406;
            if (local_188.elempack == 1) {
              while ((int)uVar400 != 0) {
                uVar4 = *puVar373;
                auVar69._4_4_ = uVar4;
                auVar69._0_4_ = uVar4;
                auVar69._8_4_ = uVar4;
                auVar69._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar69);
                uVar4 = puVar373[lVar394];
                auVar70._4_4_ = uVar4;
                auVar70._0_4_ = uVar4;
                auVar70._8_4_ = uVar4;
                auVar70._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar70);
                uVar4 = puVar373[lVar397];
                auVar71._4_4_ = uVar4;
                auVar71._0_4_ = uVar4;
                auVar71._8_4_ = uVar4;
                auVar71._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar71);
                uVar4 = puVar373[lVar389];
                auVar72._4_4_ = uVar4;
                auVar72._0_4_ = uVar4;
                auVar72._8_4_ = uVar4;
                auVar72._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar72);
                uVar4 = puVar373[auVar459._16_8_];
                auVar73._4_4_ = uVar4;
                auVar73._0_4_ = uVar4;
                auVar73._8_4_ = uVar4;
                auVar73._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar73);
                uVar4 = puVar373[lVar369];
                auVar74._4_4_ = uVar4;
                auVar74._0_4_ = uVar4;
                auVar74._8_4_ = uVar4;
                auVar74._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar74);
                uVar4 = puVar373[lVar527];
                auVar75._4_4_ = uVar4;
                auVar75._0_4_ = uVar4;
                auVar75._8_4_ = uVar4;
                auVar75._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar75);
                uVar4 = puVar373[lVar8];
                auVar76._4_4_ = uVar4;
                auVar76._0_4_ = uVar4;
                auVar76._8_4_ = uVar4;
                auVar76._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar76);
                uVar4 = puVar373[lVar528];
                auVar77._4_4_ = uVar4;
                auVar77._0_4_ = uVar4;
                auVar77._8_4_ = uVar4;
                auVar77._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[8],auVar77);
                uVar4 = puVar373[lVar383];
                auVar78._4_4_ = uVar4;
                auVar78._0_4_ = uVar4;
                auVar78._8_4_ = uVar4;
                auVar78._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(auVar431,pauVar402[9],auVar78);
                uVar4 = puVar373[lVar495];
                auVar79._4_4_ = uVar4;
                auVar79._0_4_ = uVar4;
                auVar79._8_4_ = uVar4;
                auVar79._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar402[10],auVar79);
                uVar4 = puVar373[lVar418];
                auVar80._4_4_ = uVar4;
                auVar80._0_4_ = uVar4;
                auVar80._8_4_ = uVar4;
                auVar80._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xb],auVar80);
                uVar4 = puVar373[lVar529];
                auVar81._4_4_ = uVar4;
                auVar81._0_4_ = uVar4;
                auVar81._8_4_ = uVar4;
                auVar81._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[0xc],auVar81);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar376];
                auVar82._4_4_ = uVar4;
                auVar82._0_4_ = uVar4;
                auVar82._8_4_ = uVar4;
                auVar82._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[0xd],auVar82);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar364];
                auVar83._4_4_ = uVar4;
                auVar83._0_4_ = uVar4;
                auVar83._8_4_ = uVar4;
                auVar83._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[0xe],auVar83);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar365];
                auVar84._4_4_ = uVar4;
                auVar84._0_4_ = uVar4;
                auVar84._8_4_ = uVar4;
                auVar84._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[0xf],auVar84);
                auVar461 = ZEXT1664(auVar430);
                puVar373 = puVar373 + lVar425;
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar402 = pauVar402 + 0x10;
              }
              pauVar406 = pauVar406 + uVar417 * 0x10;
            }
            uVar398 = uVar398 + 0x10;
            lVar416 = lVar416 + lVar372 * 0x10;
            puVar370 = puVar370 + lVar372 * 4;
          }
          for (; (int)((uint)uVar398 | 7) < local_350; uVar398 = uVar398 + 8) {
            lVar375 = (int)((long)((ulong)(uint)((int)(uint)uVar398 >> 0x1f) << 0x20 |
                                  uVar398 & 0xffffffff) / (long)local_188.elempack) * lVar372;
            if (local_188.elempack == 8) {
              puVar373 = (undefined4 *)((long)local_188.data + lVar375 + (long)iVar403 * 4);
              uVar400 = uVar417;
              pauVar402 = pauVar406;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = *puVar373;
                auVar430._4_4_ = uVar4;
                auVar430._0_4_ = uVar4;
                auVar430._8_4_ = uVar4;
                auVar430._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar430);
                uVar4 = puVar373[1];
                auVar431._4_4_ = uVar4;
                auVar431._0_4_ = uVar4;
                auVar431._8_4_ = uVar4;
                auVar431._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar431);
                uVar4 = puVar373[2];
                auVar432._4_4_ = uVar4;
                auVar432._0_4_ = uVar4;
                auVar432._8_4_ = uVar4;
                auVar432._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar432);
                uVar4 = puVar373[3];
                auVar433._4_4_ = uVar4;
                auVar433._0_4_ = uVar4;
                auVar433._8_4_ = uVar4;
                auVar433._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar433);
                uVar4 = puVar373[4];
                auVar434._4_4_ = uVar4;
                auVar434._0_4_ = uVar4;
                auVar434._8_4_ = uVar4;
                auVar434._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar434);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar373[5];
                auVar435._4_4_ = uVar4;
                auVar435._0_4_ = uVar4;
                auVar435._8_4_ = uVar4;
                auVar435._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar435);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar373[6];
                auVar85._4_4_ = uVar4;
                auVar85._0_4_ = uVar4;
                auVar85._8_4_ = uVar4;
                auVar85._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar85);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar373[7];
                auVar86._4_4_ = uVar4;
                auVar86._0_4_ = uVar4;
                auVar86._8_4_ = uVar4;
                auVar86._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar86);
                auVar461 = ZEXT1664(auVar430);
                pauVar402 = pauVar402 + 8;
                puVar373 = puVar373 + lVar388;
              }
              pauVar406 = pauVar406 + uVar417 * 8;
            }
            else {
              puVar373 = (undefined4 *)((long)local_188.data + lVar375 + (long)iVar362 * 4);
            }
            if (local_188.elempack == 4) {
              puVar407 = puVar373 + 3;
              uVar400 = uVar417;
              pauVar402 = pauVar406;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = puVar407[-3];
                auVar87._4_4_ = uVar4;
                auVar87._0_4_ = uVar4;
                auVar87._8_4_ = uVar4;
                auVar87._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar87);
                uVar4 = puVar407[-2];
                auVar88._4_4_ = uVar4;
                auVar88._0_4_ = uVar4;
                auVar88._8_4_ = uVar4;
                auVar88._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar88);
                uVar4 = puVar407[-1];
                auVar89._4_4_ = uVar4;
                auVar89._0_4_ = uVar4;
                auVar89._8_4_ = uVar4;
                auVar89._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar89);
                uVar4 = *puVar407;
                auVar90._4_4_ = uVar4;
                auVar90._0_4_ = uVar4;
                auVar90._8_4_ = uVar4;
                auVar90._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar90);
                uVar4 = puVar407[lVar394 + -3];
                auVar91._4_4_ = uVar4;
                auVar91._0_4_ = uVar4;
                auVar91._8_4_ = uVar4;
                auVar91._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar91);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar394 + -2];
                auVar92._4_4_ = uVar4;
                auVar92._0_4_ = uVar4;
                auVar92._8_4_ = uVar4;
                auVar92._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar92);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar394 + -1];
                auVar93._4_4_ = uVar4;
                auVar93._0_4_ = uVar4;
                auVar93._8_4_ = uVar4;
                auVar93._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar93);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar407[lVar394];
                auVar94._4_4_ = uVar4;
                auVar94._0_4_ = uVar4;
                auVar94._8_4_ = uVar4;
                auVar94._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar94);
                auVar461 = ZEXT1664(auVar430);
                pauVar402 = pauVar402 + 8;
                puVar407 = puVar407 + lVar421;
              }
              pauVar406 = pauVar406 + uVar417 * 8;
              puVar373 = (undefined4 *)((long)puVar373 + lVar414);
            }
            uVar400 = uVar417;
            pauVar402 = pauVar406;
            if (local_188.elempack == 1) {
              while ((int)uVar400 != 0) {
                uVar4 = *puVar373;
                auVar95._4_4_ = uVar4;
                auVar95._0_4_ = uVar4;
                auVar95._8_4_ = uVar4;
                auVar95._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar95);
                uVar4 = puVar373[lVar394];
                auVar96._4_4_ = uVar4;
                auVar96._0_4_ = uVar4;
                auVar96._8_4_ = uVar4;
                auVar96._12_4_ = uVar4;
                auVar431 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar96);
                uVar4 = puVar373[lVar397];
                auVar97._4_4_ = uVar4;
                auVar97._0_4_ = uVar4;
                auVar97._8_4_ = uVar4;
                auVar97._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar97);
                uVar4 = puVar373[lVar389];
                auVar98._4_4_ = uVar4;
                auVar98._0_4_ = uVar4;
                auVar98._8_4_ = uVar4;
                auVar98._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar98);
                uVar4 = puVar373[auVar459._16_8_];
                auVar99._4_4_ = uVar4;
                auVar99._0_4_ = uVar4;
                auVar99._8_4_ = uVar4;
                auVar99._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar430,pauVar402[4],auVar99);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar369];
                auVar100._4_4_ = uVar4;
                auVar100._0_4_ = uVar4;
                auVar100._8_4_ = uVar4;
                auVar100._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar431,pauVar402[5],auVar100);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar527];
                auVar101._4_4_ = uVar4;
                auVar101._0_4_ = uVar4;
                auVar101._8_4_ = uVar4;
                auVar101._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar432,pauVar402[6],auVar101);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar8];
                auVar102._4_4_ = uVar4;
                auVar102._0_4_ = uVar4;
                auVar102._8_4_ = uVar4;
                auVar102._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar433,pauVar402[7],auVar102);
                auVar461 = ZEXT1664(auVar430);
                puVar373 = puVar373 + lVar425;
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar402 = pauVar402 + 8;
              }
              pauVar406 = pauVar406 + uVar417 * 8;
            }
            lVar416 = lVar416 + lVar372 * 8;
            puVar370 = puVar370 + lVar372 * 2;
          }
          for (; (int)((uint)uVar398 | 3) < local_350; uVar398 = uVar398 + 4) {
            lVar375 = (int)((long)((ulong)(uint)((int)(uint)uVar398 >> 0x1f) << 0x20 |
                                  uVar398 & 0xffffffff) / (long)local_188.elempack) * lVar372;
            if (local_188.elempack == 4) {
              puVar373 = (undefined4 *)((long)local_188.data + lVar375 + (long)iVar403 * 4);
              uVar400 = uVar417;
              pauVar402 = pauVar406;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                uVar4 = *puVar373;
                auVar103._4_4_ = uVar4;
                auVar103._0_4_ = uVar4;
                auVar103._8_4_ = uVar4;
                auVar103._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar103);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar373[1];
                auVar104._4_4_ = uVar4;
                auVar104._0_4_ = uVar4;
                auVar104._8_4_ = uVar4;
                auVar104._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar104);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar373[2];
                auVar105._4_4_ = uVar4;
                auVar105._0_4_ = uVar4;
                auVar105._8_4_ = uVar4;
                auVar105._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar105);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar373[3];
                auVar106._4_4_ = uVar4;
                auVar106._0_4_ = uVar4;
                auVar106._8_4_ = uVar4;
                auVar106._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar106);
                auVar461 = ZEXT1664(auVar430);
                pauVar402 = pauVar402 + 4;
                puVar373 = puVar373 + lVar421;
              }
              pauVar406 = pauVar406 + uVar417 * 4;
            }
            else {
              puVar373 = (undefined4 *)((long)local_188.data + lVar375 + (long)iVar362 * 4);
            }
            uVar400 = uVar417;
            pauVar402 = pauVar406;
            if (local_188.elempack == 1) {
              while ((int)uVar400 != 0) {
                uVar4 = *puVar373;
                auVar107._4_4_ = uVar4;
                auVar107._0_4_ = uVar4;
                auVar107._8_4_ = uVar4;
                auVar107._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar107);
                auVar462 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar394];
                auVar108._4_4_ = uVar4;
                auVar108._0_4_ = uVar4;
                auVar108._8_4_ = uVar4;
                auVar108._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar108);
                in_ZMM31 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar397];
                auVar109._4_4_ = uVar4;
                auVar109._0_4_ = uVar4;
                auVar109._8_4_ = uVar4;
                auVar109._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar460._0_16_,pauVar402[2],auVar109);
                auVar460 = ZEXT1664(auVar430);
                uVar4 = puVar373[lVar389];
                auVar110._4_4_ = uVar4;
                auVar110._0_4_ = uVar4;
                auVar110._8_4_ = uVar4;
                auVar110._12_4_ = uVar4;
                auVar430 = vfmadd231ps_avx512vl(auVar461._0_16_,pauVar402[3],auVar110);
                auVar461 = ZEXT1664(auVar430);
                puVar373 = puVar373 + lVar425;
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar402 = pauVar402 + 4;
              }
              pauVar406 = pauVar406 + uVar417 * 4;
            }
            lVar416 = lVar416 + lVar372 * 4;
            puVar370 = puVar370 + lVar372;
          }
          for (; (long)(uVar398 | 1) < lVar415; uVar398 = uVar398 + 2) {
            lVar375 = 0;
            uVar400 = uVar417;
            pauVar402 = pauVar406;
            while (iVar362 = (int)uVar400, uVar400 = (ulong)(iVar362 - 1), iVar362 != 0) {
              uVar4 = *(undefined4 *)((long)puVar370 + lVar375);
              auVar111._4_4_ = uVar4;
              auVar111._0_4_ = uVar4;
              auVar111._8_4_ = uVar4;
              auVar111._12_4_ = uVar4;
              auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,*pauVar402,auVar111);
              auVar462 = ZEXT1664(auVar430);
              uVar4 = *(undefined4 *)(lVar416 + lVar375);
              auVar112._4_4_ = uVar4;
              auVar112._0_4_ = uVar4;
              auVar112._8_4_ = uVar4;
              auVar112._12_4_ = uVar4;
              auVar430 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar402[1],auVar112);
              in_ZMM31 = ZEXT1664(auVar430);
              pauVar402 = pauVar402 + 2;
              lVar375 = lVar375 + lVar426;
            }
            pauVar406 = pauVar406 + uVar417 * 2;
            lVar416 = lVar416 + lVar372 * 2;
            puVar370 = (undefined4 *)((long)puVar370 + lVar372 * 2);
          }
          for (; uVar400 = uVar417, puVar373 = puVar370, pauVar402 = pauVar406,
              (long)uVar398 < lVar415; uVar398 = uVar398 + 1) {
            while ((int)uVar400 != 0) {
              uVar4 = *puVar373;
              auVar509._4_4_ = uVar4;
              auVar509._0_4_ = uVar4;
              auVar509._8_4_ = uVar4;
              auVar509._12_4_ = uVar4;
              auVar430 = vfmadd231ps_avx512vl(auVar462._0_16_,auVar509,*pauVar402);
              auVar462 = ZEXT1664(auVar430);
              uVar400 = (ulong)((int)uVar400 - 1);
              puVar373 = puVar373 + lVar425;
              pauVar402 = pauVar402 + 1;
            }
            pauVar406 = pauVar406 + uVar417;
            puVar370 = (undefined4 *)((long)puVar370 + lVar372);
          }
          auVar430 = vaddps_avx512vl(auVar460._0_16_,auVar461._0_16_);
          auVar431 = vaddps_avx512vl(in_ZMM31._0_16_,auVar462._0_16_);
          auVar430 = vaddps_avx512vl(auVar430,auVar431);
          in_ZMM28 = ZEXT1664(auVar430);
          if (iVar423 - 1U < 6) {
            auVar431 = vmaxps_avx512vl(auVar430,auVar428);
            auVar565 = ZEXT1664(auVar431);
            switch(iVar423) {
            case 2:
              auVar430 = vminps_avx512vl(auVar430,auVar428);
              uVar4 = *(this->super_Convolution1D).activation_params.data;
              auVar136._4_4_ = uVar4;
              auVar136._0_4_ = uVar4;
              auVar136._8_4_ = uVar4;
              auVar136._12_4_ = uVar4;
              auVar430 = vfmadd231ps_avx512vl(auVar431,auVar430,auVar136);
              auVar565 = ZEXT1664(auVar430);
              break;
            case 3:
              puVar370 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
              uVar4 = *puVar370;
              auVar134._4_4_ = uVar4;
              auVar134._0_4_ = uVar4;
              auVar134._8_4_ = uVar4;
              auVar134._12_4_ = uVar4;
              auVar430 = vmaxps_avx512vl(auVar430,auVar134);
              uVar4 = puVar370[1];
              auVar135._4_4_ = uVar4;
              auVar135._0_4_ = uVar4;
              auVar135._8_4_ = uVar4;
              auVar135._12_4_ = uVar4;
              auVar430 = vminps_avx512vl(auVar430,auVar135);
              auVar565 = ZEXT1664(auVar430);
              break;
            case 4:
              auVar130._8_4_ = 0x80000000;
              auVar130._0_8_ = 0x8000000080000000;
              auVar130._12_4_ = 0x80000000;
              auVar430 = vxorps_avx512vl(auVar430,auVar130);
              auVar131._8_4_ = 0x42b0c0a5;
              auVar131._0_8_ = 0x42b0c0a542b0c0a5;
              auVar131._12_4_ = 0x42b0c0a5;
              auVar430 = vminps_avx512vl(auVar430,auVar131);
              auVar132._8_4_ = 0xc2b0c0a5;
              auVar132._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar132._12_4_ = 0xc2b0c0a5;
              auVar432 = vmaxps_avx512vl(auVar430,auVar132);
              auVar431 = vfmadd231ps_fma(auVar478,auVar432,auVar483);
              auVar557._0_4_ = (int)auVar431._0_4_;
              auVar557._4_4_ = (int)auVar431._4_4_;
              auVar557._8_4_ = (int)auVar431._8_4_;
              auVar557._12_4_ = (int)auVar431._12_4_;
              auVar430 = vcvtdq2ps_avx(auVar557);
              uVar398 = vcmpps_avx512vl(auVar431,auVar430,1);
              auVar561._8_4_ = 0x3f800000;
              auVar561._0_8_ = 0x3f8000003f800000;
              auVar561._12_4_ = 0x3f800000;
              auVar431 = vsubps_avx512vl(auVar430,auVar561);
              bVar18 = (bool)((byte)uVar398 & 1);
              auVar441._0_4_ =
                   (float)((uint)bVar18 * auVar431._0_4_ | (uint)!bVar18 * auVar430._0_4_);
              bVar18 = (bool)((byte)(uVar398 >> 1) & 1);
              auVar441._4_4_ =
                   (float)((uint)bVar18 * auVar431._4_4_ | (uint)!bVar18 * auVar430._4_4_);
              bVar18 = (bool)((byte)(uVar398 >> 2) & 1);
              auVar441._8_4_ =
                   (float)((uint)bVar18 * auVar431._8_4_ | (uint)!bVar18 * auVar430._8_4_);
              bVar18 = (bool)((byte)(uVar398 >> 3) & 1);
              auVar441._12_4_ =
                   (float)((uint)bVar18 * auVar431._12_4_ | (uint)!bVar18 * auVar430._12_4_);
              auVar430 = vfmsub231ps_fma(auVar432,auVar441,auVar496);
              auVar133._8_4_ = 0x395e8083;
              auVar133._0_8_ = 0x395e8083395e8083;
              auVar133._12_4_ = 0x395e8083;
              auVar431 = vfmsub231ps_avx512vl(auVar430,auVar441,auVar133);
              auVar551._0_4_ = auVar431._0_4_ * auVar431._0_4_;
              auVar551._4_4_ = auVar431._4_4_ * auVar431._4_4_;
              auVar551._8_4_ = auVar431._8_4_ * auVar431._8_4_;
              auVar551._12_4_ = auVar431._12_4_ * auVar431._12_4_;
              auVar430 = vfmadd213ps_fma(auVar521,auVar431,auVar530);
              auVar430 = vfmadd213ps_fma(auVar430,auVar431,auVar534);
              auVar430 = vfmadd213ps_fma(auVar430,auVar431,auVar538);
              auVar430 = vfmadd213ps_fma(auVar430,auVar431,auVar541);
              auVar430 = vfmadd213ps_fma(auVar430,auVar431,auVar478);
              auVar430 = vfmadd213ps_fma(auVar430,auVar551,auVar431);
              auVar512._0_4_ = auVar430._0_4_ + 1.0;
              auVar512._4_4_ = auVar430._4_4_ + 1.0;
              auVar512._8_4_ = auVar430._8_4_ + 1.0;
              auVar512._12_4_ = auVar430._12_4_ + 1.0;
              auVar552._0_4_ = (int)auVar441._0_4_;
              auVar552._4_4_ = (int)auVar441._4_4_;
              auVar552._8_4_ = (int)auVar441._8_4_;
              auVar552._12_4_ = (int)auVar441._12_4_;
              auVar430 = vpslld_avx(auVar552,0x17);
              auVar430 = vpaddd_avx(auVar430,auVar543);
              auVar430 = vfmadd213ps_fma(auVar430,auVar512,auVar561);
              auVar430 = vdivps_avx512vl(auVar561,auVar430);
              auVar565 = ZEXT1664(auVar430);
              break;
            case 5:
              auVar563._8_4_ = 0x42b0c0a5;
              auVar563._0_8_ = 0x42b0c0a542b0c0a5;
              auVar563._12_4_ = 0x42b0c0a5;
              auVar431 = vminps_avx512vl(auVar430,auVar563);
              auVar433 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
              auVar434 = vmaxps_avx512vl(auVar431,auVar433);
              auVar432 = vfmadd213ps_fma(auVar483,auVar434,auVar478);
              auVar554._0_4_ = (int)auVar432._0_4_;
              auVar554._4_4_ = (int)auVar432._4_4_;
              auVar554._8_4_ = (int)auVar432._8_4_;
              auVar554._12_4_ = (int)auVar432._12_4_;
              auVar431 = vcvtdq2ps_avx(auVar554);
              uVar398 = vcmpps_avx512vl(auVar432,auVar431,1);
              auVar435 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar432 = vsubps_avx512vl(auVar431,auVar435);
              bVar18 = (bool)((byte)uVar398 & 1);
              auVar436._0_4_ =
                   (float)((uint)bVar18 * auVar432._0_4_ | (uint)!bVar18 * auVar431._0_4_);
              bVar18 = (bool)((byte)(uVar398 >> 1) & 1);
              auVar436._4_4_ =
                   (float)((uint)bVar18 * auVar432._4_4_ | (uint)!bVar18 * auVar431._4_4_);
              bVar18 = (bool)((byte)(uVar398 >> 2) & 1);
              auVar436._8_4_ =
                   (float)((uint)bVar18 * auVar432._8_4_ | (uint)!bVar18 * auVar431._8_4_);
              bVar18 = (bool)((byte)(uVar398 >> 3) & 1);
              auVar436._12_4_ =
                   (float)((uint)bVar18 * auVar432._12_4_ | (uint)!bVar18 * auVar431._12_4_);
              auVar431 = vfmsub231ps_fma(auVar434,auVar436,auVar496);
              auVar432 = vfnmsub231ps_fma(auVar431,auVar436,auVar545);
              auVar547._0_4_ = auVar432._0_4_ * auVar432._0_4_;
              auVar547._4_4_ = auVar432._4_4_ * auVar432._4_4_;
              auVar547._8_4_ = auVar432._8_4_ * auVar432._8_4_;
              auVar547._12_4_ = auVar432._12_4_ * auVar432._12_4_;
              auVar431 = vfmadd213ps_fma(auVar521,auVar432,auVar530);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar534);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar538);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar541);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar478);
              auVar431 = vfmadd213ps_fma(auVar431,auVar547,auVar432);
              auVar432 = vaddps_avx512vl(auVar431,auVar435);
              auVar548._0_4_ = (int)auVar436._0_4_;
              auVar548._4_4_ = (int)auVar436._4_4_;
              auVar548._8_4_ = (int)auVar436._8_4_;
              auVar548._12_4_ = (int)auVar436._12_4_;
              auVar431 = vpslld_avx(auVar548,0x17);
              auVar431 = vpaddd_avx(auVar431,auVar543);
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar432,auVar435);
              uVar398 = vcmpps_avx512vl(auVar431,auVar428,2);
              auVar117._8_4_ = 0x800000;
              auVar117._0_8_ = 0x80000000800000;
              auVar117._12_4_ = 0x800000;
              auVar431 = vmaxps_avx512vl(auVar431,auVar117);
              auVar434 = vpsrld_avx(auVar431,0x17);
              auVar555._8_4_ = 0x807fffff;
              auVar555._0_8_ = 0x807fffff807fffff;
              auVar555._12_4_ = 0x807fffff;
              auVar118._8_4_ = 0x3f000000;
              auVar118._0_8_ = 0x3f0000003f000000;
              auVar118._12_4_ = 0x3f000000;
              auVar431 = vpternlogd_avx512vl(auVar431,auVar555,auVar118,0xea);
              auVar119._8_4_ = 0x3f3504f3;
              auVar119._0_8_ = 0x3f3504f33f3504f3;
              auVar119._12_4_ = 0x3f3504f3;
              uVar400 = vcmpps_avx512vl(auVar431,auVar119,1);
              auVar120._8_4_ = 0xbf800000;
              auVar120._0_8_ = 0xbf800000bf800000;
              auVar120._12_4_ = 0xbf800000;
              auVar432 = vaddps_avx512vl(auVar431,auVar120);
              auVar431 = vaddps_avx512vl(auVar432,auVar431);
              bVar18 = (bool)((byte)uVar400 & 1);
              auVar437._0_4_ =
                   (float)((uint)bVar18 * auVar431._0_4_ | (uint)!bVar18 * auVar432._0_4_);
              bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
              auVar437._4_4_ =
                   (float)((uint)bVar18 * auVar431._4_4_ | (uint)!bVar18 * auVar432._4_4_);
              bVar18 = (bool)((byte)(uVar400 >> 2) & 1);
              auVar437._8_4_ =
                   (float)((uint)bVar18 * auVar431._8_4_ | (uint)!bVar18 * auVar432._8_4_);
              bVar18 = (bool)((byte)(uVar400 >> 3) & 1);
              auVar437._12_4_ =
                   (float)((uint)bVar18 * auVar431._12_4_ | (uint)!bVar18 * auVar432._12_4_);
              auVar510._0_4_ = auVar437._0_4_ * auVar437._0_4_;
              auVar510._4_4_ = auVar437._4_4_ * auVar437._4_4_;
              auVar510._8_4_ = auVar437._8_4_ * auVar437._8_4_;
              auVar510._12_4_ = auVar437._12_4_ * auVar437._12_4_;
              auVar121._8_4_ = 0xbdebd1b8;
              auVar121._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar121._12_4_ = 0xbdebd1b8;
              auVar431 = vfmadd213ps_avx512vl(auVar429,auVar437,auVar121);
              auVar122._8_4_ = 0x3def251a;
              auVar122._0_8_ = 0x3def251a3def251a;
              auVar122._12_4_ = 0x3def251a;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar122);
              auVar123._8_4_ = 0xbdfe5d4f;
              auVar123._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar123._12_4_ = 0xbdfe5d4f;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar123);
              auVar124._8_4_ = 0x3e11e9bf;
              auVar124._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar124._12_4_ = 0x3e11e9bf;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar124);
              auVar125._8_4_ = 0xbe2aae50;
              auVar125._0_8_ = 0xbe2aae50be2aae50;
              auVar125._12_4_ = 0xbe2aae50;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar125);
              auVar126._8_4_ = 0x3e4cceac;
              auVar126._0_8_ = 0x3e4cceac3e4cceac;
              auVar126._12_4_ = 0x3e4cceac;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar126);
              auVar127._8_4_ = 0xbe7ffffc;
              auVar127._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar127._12_4_ = 0xbe7ffffc;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar127);
              auVar128._8_4_ = 0x3eaaaaaa;
              auVar128._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar128._12_4_ = 0x3eaaaaaa;
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar437,auVar128);
              auVar559._0_4_ = auVar437._0_4_ * auVar510._0_4_ * auVar431._0_4_;
              auVar559._4_4_ = auVar437._4_4_ * auVar510._4_4_ * auVar431._4_4_;
              auVar559._8_4_ = auVar437._8_4_ * auVar510._8_4_ * auVar431._8_4_;
              auVar559._12_4_ = auVar437._12_4_ * auVar510._12_4_ * auVar431._12_4_;
              auVar129._8_4_ = 0xffffff82;
              auVar129._0_8_ = 0xffffff82ffffff82;
              auVar129._12_4_ = 0xffffff82;
              auVar431 = vpaddd_avx512vl(auVar434,auVar129);
              auVar431 = vcvtdq2ps_avx(auVar431);
              auVar432 = vsubps_avx512vl(auVar431,auVar435);
              bVar18 = (bool)((byte)uVar400 & 1);
              auVar438._0_4_ = (uint)bVar18 * auVar432._0_4_ | (uint)!bVar18 * auVar431._0_4_;
              bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
              auVar438._4_4_ = (uint)bVar18 * auVar432._4_4_ | (uint)!bVar18 * auVar431._4_4_;
              bVar18 = (bool)((byte)(uVar400 >> 2) & 1);
              auVar438._8_4_ = (uint)bVar18 * auVar432._8_4_ | (uint)!bVar18 * auVar431._8_4_;
              bVar18 = (bool)((byte)(uVar400 >> 3) & 1);
              auVar438._12_4_ = (uint)bVar18 * auVar432._12_4_ | (uint)!bVar18 * auVar431._12_4_;
              auVar431 = vfmadd231ps_fma(auVar559,auVar438,auVar545);
              auVar431 = vfmsub231ps_fma(auVar431,auVar478,auVar510);
              auVar431 = vsubps_avx(auVar431,auVar437);
              auVar431 = vfnmadd231ps_fma(auVar431,auVar496,auVar438);
              auVar432 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar18 = (bool)((byte)uVar398 & 1);
              auVar439._0_4_ =
                   (uint)bVar18 * auVar432._0_4_ |
                   (uint)!bVar18 * (int)(auVar431._0_4_ + auVar431._0_4_);
              bVar18 = (bool)((byte)(uVar398 >> 1) & 1);
              auVar439._4_4_ =
                   (uint)bVar18 * auVar432._4_4_ |
                   (uint)!bVar18 * (int)(auVar431._4_4_ + auVar431._4_4_);
              bVar18 = (bool)((byte)(uVar398 >> 2) & 1);
              auVar439._8_4_ =
                   (uint)bVar18 * auVar432._8_4_ |
                   (uint)!bVar18 * (int)(auVar431._8_4_ + auVar431._8_4_);
              bVar18 = (bool)((byte)(uVar398 >> 3) & 1);
              auVar439._12_4_ =
                   (uint)bVar18 * auVar432._12_4_ |
                   (uint)!bVar18 * (int)(auVar431._12_4_ + auVar431._12_4_);
              auVar431 = vminps_avx(auVar563,auVar439);
              auVar433 = vmaxps_avx512vl(auVar431,auVar433);
              auVar432 = vfmadd213ps_fma(auVar483,auVar433,auVar478);
              auVar556._0_4_ = (int)auVar432._0_4_;
              auVar556._4_4_ = (int)auVar432._4_4_;
              auVar556._8_4_ = (int)auVar432._8_4_;
              auVar556._12_4_ = (int)auVar432._12_4_;
              auVar431 = vcvtdq2ps_avx(auVar556);
              uVar398 = vcmpps_avx512vl(auVar432,auVar431,1);
              auVar432 = vsubps_avx512vl(auVar431,auVar435);
              bVar18 = (bool)((byte)uVar398 & 1);
              auVar440._0_4_ =
                   (float)((uint)bVar18 * auVar432._0_4_ | (uint)!bVar18 * auVar431._0_4_);
              bVar18 = (bool)((byte)(uVar398 >> 1) & 1);
              auVar440._4_4_ =
                   (float)((uint)bVar18 * auVar432._4_4_ | (uint)!bVar18 * auVar431._4_4_);
              bVar18 = (bool)((byte)(uVar398 >> 2) & 1);
              auVar440._8_4_ =
                   (float)((uint)bVar18 * auVar432._8_4_ | (uint)!bVar18 * auVar431._8_4_);
              bVar18 = (bool)((byte)(uVar398 >> 3) & 1);
              auVar440._12_4_ =
                   (float)((uint)bVar18 * auVar432._12_4_ | (uint)!bVar18 * auVar431._12_4_);
              auVar431 = vfmsub231ps_fma(auVar433,auVar440,auVar496);
              auVar432 = vfnmsub231ps_fma(auVar431,auVar440,auVar545);
              auVar549._0_4_ = auVar432._0_4_ * auVar432._0_4_;
              auVar549._4_4_ = auVar432._4_4_ * auVar432._4_4_;
              auVar549._8_4_ = auVar432._8_4_ * auVar432._8_4_;
              auVar549._12_4_ = auVar432._12_4_ * auVar432._12_4_;
              auVar431 = vfmadd213ps_fma(auVar521,auVar432,auVar530);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar534);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar538);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar541);
              auVar431 = vfmadd213ps_fma(auVar431,auVar432,auVar478);
              auVar431 = vfmadd213ps_fma(auVar431,auVar549,auVar432);
              auVar432 = vaddps_avx512vl(auVar431,auVar435);
              auVar550._0_4_ = (int)auVar440._0_4_;
              auVar550._4_4_ = (int)auVar440._4_4_;
              auVar550._8_4_ = (int)auVar440._8_4_;
              auVar550._12_4_ = (int)auVar440._12_4_;
              auVar431 = vpslld_avx(auVar550,0x17);
              auVar431 = vpaddd_avx(auVar431,auVar543);
              auVar431 = vfmadd213ps_avx512vl(auVar431,auVar432,auVar435);
              auVar511._8_4_ = 0x40000000;
              auVar511._0_8_ = 0x4000000040000000;
              auVar511._12_4_ = 0x40000000;
              auVar431 = vdivps_avx512vl(auVar511,auVar431);
              auVar430 = vfmsub213ps_avx512vl(auVar431,auVar430,auVar430);
              auVar565 = ZEXT1664(auVar430);
              break;
            case 6:
              puVar370 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
              uVar4 = *puVar370;
              auVar513._4_4_ = uVar4;
              auVar513._0_4_ = uVar4;
              auVar513._8_4_ = uVar4;
              auVar513._12_4_ = uVar4;
              uVar4 = puVar370[1];
              auVar115._4_4_ = uVar4;
              auVar115._0_4_ = uVar4;
              auVar115._8_4_ = uVar4;
              auVar115._12_4_ = uVar4;
              auVar431 = vfmadd213ps_avx512vl(auVar513,auVar430,auVar115);
              auVar431 = vmaxps_avx512vl(auVar431,auVar428);
              auVar116._8_4_ = 0x3f800000;
              auVar116._0_8_ = 0x3f8000003f800000;
              auVar116._12_4_ = 0x3f800000;
              auVar431 = vminps_avx512vl(auVar431,auVar116);
              auVar430 = vmulps_avx512vl(auVar431,auVar430);
              auVar565 = ZEXT1664(auVar430);
            }
          }
          else {
            auVar565 = ZEXT1664(auVar430);
          }
          auVar430 = auVar565._0_16_;
          if (iVar409 == 1) {
            *(int *)*local_2e0 = auVar565._0_4_;
            uVar4 = vextractps_avx512f(auVar430,1);
            *(undefined4 *)((long)*local_2e0 + lVar413 * 4) = uVar4;
            uVar4 = vextractps_avx512f(auVar430,2);
            *(undefined4 *)((long)*local_2e0 + lVar366 * 4) = uVar4;
            uVar4 = vextractps_avx512f(auVar430,3);
            *(undefined4 *)((long)*local_2e0 + lVar367 * 4) = uVar4;
            local_2e0 = (undefined1 (*) [16])((long)*local_2e0 + 4);
          }
          else if (iVar409 == 4) {
            *local_2e0 = auVar430;
            local_2e0 = local_2e0 + 1;
          }
          iVar403 = iVar403 + local_188.elempack * iVar6;
          lVar392 = lVar392 + lVar3;
          local_2d0 = local_2d0 + lVar3;
        }
      }
      iVar380 = iVar380 + iVar381 * 4;
      uVar368 = (long)(iVar386 - iVar380) / 2;
      lVar366 = (long)local_188.h * (long)local_188.elempack;
      uVar399 = top_blob->w;
      lVar367 = (long)(int)uVar399 * top_blob->elemsize;
      pvVar10 = top_blob->data;
      iVar381 = local_188.elempack * iVar6;
      uVar391 = 0;
      uVar396 = 0;
      if (0 < (int)uVar399) {
        uVar396 = (ulong)uVar399;
      }
      iVar386 = (int)uVar368;
      uVar390 = 0;
      if (0 < iVar386) {
        uVar390 = uVar368 & 0xffffffff;
      }
      auVar461 = vmovdqu64_avx512f(local_b8);
      lVar413 = auVar461._0_8_;
      lVar388 = vpextrq_avx(auVar461._0_16_,1);
      auVar459 = _DAT_00544100;
      auVar460 = _DAT_00544140;
      for (; iVar409 = (int)uVar417, uVar391 != uVar390; uVar391 = uVar391 + 1) {
        uVar368 = (long)iVar380 + uVar391 * 2;
        uVar399 = (int)uVar368 >> 0x1f;
        uVar374 = (ulong)uVar399 << 0x20 | uVar368 & 0xffffffff;
        puVar373 = (undefined4 *)(uVar368 * lVar367 + (long)pvVar10);
        sVar11 = (this->weight_data_tm).cstep;
        sVar12 = (this->weight_data_tm).elemsize;
        puVar370 = (undefined4 *)(((long)iVar380 + uVar391 * 2 + 1) * lVar367 + (long)pvVar10);
        pvVar13 = (this->weight_data_tm).data;
        pfVar14 = (float *)(this->super_Convolution1D).activation_params.data;
        local_2c8 = 0;
        iVar403 = 0;
        local_348 = lVar394 * 4;
        for (uVar371 = 0; uVar371 != uVar396; uVar371 = uVar371 + 1) {
          if (pvVar7 == (void *)0x0) {
            fVar427 = 0.0;
            fVar493 = 0.0;
          }
          else {
            pfVar422 = (float *)((long)pvVar7 + uVar368 * 4);
            fVar427 = *pfVar422;
            fVar493 = pfVar422[1];
          }
          iVar362 = iVar381 * (int)uVar371;
          lVar383 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar421 = (long)local_188.data + local_348;
          puVar407 = (undefined4 *)((long)local_188.data + local_2c8);
          auVar462 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar398 = 0;
          auVar463 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar405 = (undefined1 (*) [64])
                      ((long)(((int)((long)((ulong)uVar399 << 0x20 | uVar368 & 0xffffffff) % 4) >> 1
                              ) + (int)((long)uVar374 / 0x10) +
                              (int)(char)((char)((long)uVar374 % 0x10) / '\b') +
                             (int)(char)((char)((long)((ulong)uVar399 << 0x20 | uVar368 & 0xffffffff
                                                      ) % 8) / '\x04')) * sVar11 * sVar12 +
                      (long)pvVar13);
          while( true ) {
            local_318 = (int)lVar366;
            if (local_318 <= (int)((uint)uVar398 | 0xf)) break;
            lVar376 = (int)((long)((ulong)(uint)((int)(uint)uVar398 >> 0x1f) << 0x20 |
                                  uVar398 & 0xffffffff) / (long)iVar5) * lVar383;
            if (iVar5 == 0x10) {
              pauVar377 = (undefined1 (*) [64])((long)local_188.data + lVar376 + (long)iVar403 * 4);
              uVar400 = uVar417;
              pauVar412 = pauVar405;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                auVar462 = vfmadd231ps_avx512f(auVar462,*pauVar377,*pauVar412);
                auVar463 = vfmadd231ps_avx512f(auVar463,*pauVar377,pauVar412[1]);
                pauVar412 = pauVar412 + 2;
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar424 * 4);
              }
              pauVar405 = pauVar405 + uVar417 * 2;
            }
            else {
              pauVar377 = (undefined1 (*) [64])((long)local_188.data + lVar376 + (long)iVar362 * 4);
            }
            uVar400 = uVar417;
            pauVar412 = pauVar377;
            pauVar420 = pauVar405;
            if (iVar5 == 8) {
              while ((int)uVar400 != 0) {
                auVar565 = vinsertf64x4_avx512f
                                     (ZEXT3264(*(undefined1 (*) [32])*pauVar412),
                                      *(undefined1 (*) [32])(*pauVar412 + lVar394 * 4),1);
                auVar462 = vfmadd231ps_avx512f(auVar462,auVar565,*pauVar420);
                auVar463 = vfmadd231ps_avx512f(auVar463,auVar565,pauVar420[1]);
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar412 = (undefined1 (*) [64])(*pauVar412 + lVar1);
                pauVar420 = pauVar420 + 2;
              }
              pauVar405 = pauVar405 + uVar417 * 2;
              pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar410);
            }
            uVar400 = uVar417;
            pauVar412 = pauVar377;
            pauVar420 = pauVar405;
            if (iVar5 == 4) {
              while ((int)uVar400 != 0) {
                auVar524._16_16_ = *(undefined1 (*) [16])(*pauVar412 + lVar388 * 4);
                auVar524._0_16_ = *(undefined1 (*) [16])(*pauVar412 + lVar413 * 4);
                auVar565 = vinsertf64x4_avx512f
                                     (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                           (*pauVar412 + lVar394 * 4),
                                                          *(undefined1 (*) [16])*pauVar412)),
                                      auVar524,1);
                auVar462 = vfmadd231ps_avx512f(auVar462,auVar565,*pauVar420);
                auVar463 = vfmadd231ps_avx512f(auVar463,auVar565,pauVar420[1]);
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar412 = (undefined1 (*) [64])(*pauVar412 + lVar2);
                pauVar420 = pauVar420 + 2;
              }
              pauVar405 = pauVar405 + uVar417 * 2;
              pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar414);
            }
            uVar400 = uVar417;
            pauVar412 = pauVar405;
            if (iVar5 == 1) {
              while ((int)uVar400 != 0) {
                auVar428 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar377 + lVar421 * 4));
                vgatherqps_avx512f(*(undefined8 *)(*pauVar377 + (long)pauVar412 * 4));
                auVar429 = vinsertps_avx(ZEXT416(*(uint *)*pauVar377),
                                         ZEXT416(*(uint *)(*pauVar377 + lVar394 * 4)),0x10);
                vpermt2pd_avx512f(auVar459,ZEXT1664(auVar429));
                auVar565 = vpermt2pd_avx512f(auVar460,ZEXT1664(auVar428));
                auVar533 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar377 + lVar364 * 4)));
                auVar477._56_4_ = auVar533._56_4_;
                auVar533 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar377 + lVar365 * 4)));
                auVar477._0_56_ = auVar565._0_56_;
                auVar477._60_4_ = auVar533._60_4_;
                auVar462 = vfmadd231ps_avx512f(auVar462,auVar477,*pauVar412);
                auVar463 = vfmadd231ps_avx512f(auVar463,auVar477,pauVar412[1]);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar426);
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar412 = pauVar412 + 2;
              }
              pauVar405 = pauVar405 + uVar417 * 2;
            }
            uVar398 = uVar398 + 0x10;
            lVar421 = lVar421 + lVar383 * 0x10;
            puVar407 = puVar407 + lVar383 * 4;
          }
          auVar446 = vextractf64x4_avx512f(auVar462,1);
          fVar492 = auVar462._4_4_ + auVar446._4_4_;
          auVar428._0_4_ = auVar462._0_4_ + auVar446._0_4_ + auVar462._16_4_ + auVar446._16_4_;
          auVar428._4_4_ = fVar492 + fVar492;
          auVar428._8_4_ = auVar462._8_4_ + auVar446._8_4_ + auVar462._24_4_ + auVar446._24_4_;
          auVar428._12_4_ = auVar462._12_4_ + auVar446._12_4_ + auVar462._28_4_ + auVar446._28_4_;
          auVar429 = vshufpd_avx(auVar428,auVar428,1);
          auVar484._0_4_ = auVar429._0_4_ + auVar428._0_4_;
          auVar484._4_4_ = auVar429._4_4_ + auVar428._4_4_;
          auVar484._8_4_ = auVar429._8_4_ + auVar428._8_4_;
          auVar484._12_4_ = auVar429._12_4_ + auVar428._12_4_;
          auVar446 = vextractf64x4_avx512f(auVar463,1);
          fVar492 = auVar463._4_4_ + auVar446._4_4_;
          auVar497._0_4_ = auVar463._0_4_ + auVar446._0_4_ + auVar463._16_4_ + auVar446._16_4_;
          auVar497._4_4_ = fVar492 + fVar492;
          auVar497._8_4_ = auVar463._8_4_ + auVar446._8_4_ + auVar463._24_4_ + auVar446._24_4_;
          auVar497._12_4_ = auVar463._12_4_ + auVar446._12_4_ + auVar463._28_4_ + auVar446._28_4_;
          auVar429 = vshufpd_avx(auVar497,auVar497,1);
          auVar498._0_4_ = auVar429._0_4_ + auVar497._0_4_;
          auVar498._4_4_ = auVar429._4_4_ + auVar497._4_4_;
          auVar498._8_4_ = auVar429._8_4_ + auVar497._8_4_;
          auVar498._12_4_ = auVar429._12_4_ + auVar497._12_4_;
          auVar462 = ZEXT864(0) << 0x20;
          auVar463 = ZEXT1664(ZEXT816(0) << 0x40);
          for (; (int)((uint)uVar398 | 7) < local_318; uVar398 = uVar398 + 8) {
            lVar376 = (int)((long)((ulong)(uint)((int)(uint)uVar398 >> 0x1f) << 0x20 |
                                  uVar398 & 0xffffffff) / (long)iVar5) * lVar383;
            if (iVar5 == 8) {
              pauVar411 = (undefined1 (*) [32])((long)local_188.data + lVar376 + (long)iVar403 * 4);
              uVar400 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                auVar429 = vfmadd231ps_fma(auVar462._0_32_,*pauVar411,
                                           *(undefined1 (*) [32])*pauVar377);
                auVar462 = ZEXT1664(auVar429);
                auVar429 = vfmadd231ps_fma(auVar463._0_32_,*pauVar411,
                                           *(undefined1 (*) [32])(*pauVar377 + 0x20));
                auVar463 = ZEXT1664(auVar429);
                pauVar377 = pauVar377 + 1;
                pauVar411 = (undefined1 (*) [32])(*pauVar411 + lVar1);
              }
              pauVar405 = pauVar405 + uVar417;
            }
            else {
              pauVar411 = (undefined1 (*) [32])((long)local_188.data + lVar376 + (long)iVar362 * 4);
            }
            uVar400 = uVar417;
            pauVar401 = pauVar411;
            pauVar377 = pauVar405;
            if (iVar5 == 4) {
              while ((int)uVar400 != 0) {
                auVar532._16_16_ = *(undefined1 (*) [16])(*pauVar401 + lVar394 * 4);
                auVar532._0_16_ = *(undefined1 (*) [16])*pauVar401;
                auVar429 = vfmadd231ps_fma(auVar462._0_32_,auVar532,*(undefined1 (*) [32])*pauVar377
                                          );
                auVar462 = ZEXT1664(auVar429);
                auVar429 = vfmadd231ps_fma(auVar463._0_32_,auVar532,
                                           *(undefined1 (*) [32])(*pauVar377 + 0x20));
                auVar463 = ZEXT1664(auVar429);
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar401 = (undefined1 (*) [32])(*pauVar401 + lVar2);
                pauVar377 = pauVar377 + 1;
              }
              pauVar405 = pauVar405 + uVar417;
              pauVar411 = (undefined1 (*) [32])(*pauVar411 + lVar414);
            }
            uVar400 = uVar417;
            pauVar377 = pauVar405;
            if (iVar5 == 1) {
              while ((int)uVar400 != 0) {
                auVar428 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar411 + (long)pauVar377 * 4));
                auVar429 = vinsertps_avx(ZEXT416(*(uint *)*pauVar411),
                                         ZEXT416(*(uint *)(*pauVar411 + lVar394 * 4)),0x10);
                auVar446 = vpermpd_avx2(ZEXT1632(auVar428),0xd0);
                auVar446 = vblendps_avx(auVar446,ZEXT1632(auVar429),3);
                uVar4 = *(undefined4 *)(*pauVar411 + lVar527 * 4);
                auVar537._4_4_ = uVar4;
                auVar537._0_4_ = uVar4;
                auVar537._8_4_ = uVar4;
                auVar537._12_4_ = uVar4;
                auVar537._16_4_ = uVar4;
                auVar537._20_4_ = uVar4;
                auVar537._24_4_ = uVar4;
                auVar537._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(*pauVar411 + lVar8 * 4);
                auVar540._4_4_ = uVar4;
                auVar540._0_4_ = uVar4;
                auVar540._8_4_ = uVar4;
                auVar540._12_4_ = uVar4;
                auVar540._16_4_ = uVar4;
                auVar540._20_4_ = uVar4;
                auVar540._24_4_ = uVar4;
                auVar540._28_4_ = uVar4;
                auVar446 = vblendps_avx(auVar446,auVar537,0x40);
                auVar446 = vblendps_avx(auVar446,auVar540,0x80);
                auVar429 = vfmadd231ps_fma(auVar462._0_32_,auVar446,*(undefined1 (*) [32])*pauVar377
                                          );
                auVar462 = ZEXT1664(auVar429);
                auVar429 = vfmadd231ps_fma(auVar463._0_32_,auVar446,
                                           *(undefined1 (*) [32])(*pauVar377 + 0x20));
                auVar463 = ZEXT1664(auVar429);
                pauVar411 = (undefined1 (*) [32])(*pauVar411 + lVar426);
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar377 = pauVar377 + 1;
              }
              pauVar405 = pauVar405 + uVar417;
            }
            lVar421 = lVar421 + lVar383 * 8;
            puVar407 = puVar407 + lVar383 * 2;
          }
          auVar514._0_4_ = auVar462._16_4_ + auVar462._0_4_;
          auVar514._4_4_ = auVar462._20_4_ + auVar462._4_4_;
          auVar514._8_4_ = auVar462._24_4_ + auVar462._8_4_;
          auVar514._12_4_ = auVar462._28_4_ + auVar462._12_4_;
          auVar429 = vshufpd_avx(auVar514,auVar514,1);
          auVar515._0_4_ = auVar429._0_4_ + auVar514._0_4_;
          auVar515._4_4_ = auVar429._4_4_ + auVar514._4_4_;
          auVar515._8_4_ = auVar429._8_4_ + auVar514._8_4_;
          auVar515._12_4_ = auVar429._12_4_ + auVar514._12_4_;
          auVar522._0_4_ = auVar463._16_4_ + auVar463._0_4_;
          auVar522._4_4_ = auVar463._20_4_ + auVar463._4_4_;
          auVar522._8_4_ = auVar463._24_4_ + auVar463._8_4_;
          auVar522._12_4_ = auVar463._28_4_ + auVar463._12_4_;
          auVar429 = vshufpd_avx(auVar522,auVar522,1);
          auVar523._0_4_ = auVar429._0_4_ + auVar522._0_4_;
          auVar523._4_4_ = auVar429._4_4_ + auVar522._4_4_;
          auVar523._8_4_ = auVar429._8_4_ + auVar522._8_4_;
          auVar523._12_4_ = auVar429._12_4_ + auVar522._12_4_;
          auVar462 = ZEXT864(0) << 0x40;
          auVar463 = ZEXT1664(ZEXT816(0) << 0x40);
          for (; (int)((uint)uVar398 | 3) < local_318; uVar398 = uVar398 + 4) {
            lVar376 = (int)((long)((ulong)(uint)((int)(uint)uVar398 >> 0x1f) << 0x20 |
                                  uVar398 & 0xffffffff) / (long)iVar5) * lVar383;
            if (iVar5 == 4) {
              pauVar406 = (undefined1 (*) [16])((long)local_188.data + lVar376 + (long)iVar403 * 4);
              uVar400 = uVar417;
              pauVar377 = pauVar405;
              while (iVar384 = (int)uVar400, uVar400 = (ulong)(iVar384 - 1), iVar384 != 0) {
                auVar429 = vfmadd231ps_fma(auVar462._0_16_,*pauVar406,
                                           *(undefined1 (*) [16])*pauVar377);
                auVar462 = ZEXT1664(auVar429);
                auVar429 = vfmadd231ps_fma(auVar463._0_16_,*pauVar406,
                                           *(undefined1 (*) [16])(*pauVar377 + 0x10));
                auVar463 = ZEXT1664(auVar429);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x20);
                pauVar406 = (undefined1 (*) [16])(*pauVar406 + lVar2);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar419);
            }
            else {
              pauVar406 = (undefined1 (*) [16])((long)local_188.data + lVar376 + (long)iVar362 * 4);
            }
            uVar400 = uVar417;
            pauVar377 = pauVar405;
            if (iVar5 == 1) {
              while ((int)uVar400 != 0) {
                auVar429 = vinsertps_avx(ZEXT416(*(uint *)*pauVar406),
                                         ZEXT416(*(uint *)(*pauVar406 + lVar394 * 4)),0x10);
                auVar429 = vinsertps_avx(auVar429,ZEXT416(*(uint *)(*pauVar406 + lVar413 * 4)),0x20)
                ;
                auVar429 = vinsertps_avx(auVar429,ZEXT416(*(uint *)(*pauVar406 + lVar388 * 4)),0x30)
                ;
                auVar428 = vfmadd231ps_fma(auVar462._0_16_,auVar429,*(undefined1 (*) [16])*pauVar377
                                          );
                auVar462 = ZEXT1664(auVar428);
                auVar429 = vfmadd231ps_fma(auVar463._0_16_,auVar429,
                                           *(undefined1 (*) [16])(*pauVar377 + 0x10));
                auVar463 = ZEXT1664(auVar429);
                pauVar406 = (undefined1 (*) [16])(*pauVar406 + lVar426);
                uVar400 = (ulong)((int)uVar400 - 1);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x20);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar419);
            }
            lVar421 = lVar421 + lVar383 * 4;
            puVar407 = puVar407 + lVar383;
          }
          auVar429 = vshufpd_avx(auVar462._0_16_,auVar462._0_16_,1);
          auVar531._0_4_ = auVar429._0_4_ + auVar462._0_4_;
          auVar531._4_4_ = auVar429._4_4_ + auVar462._4_4_;
          auVar531._8_4_ = auVar429._8_4_ + auVar462._8_4_;
          auVar531._12_4_ = auVar429._12_4_ + auVar462._12_4_;
          auVar429 = vshufpd_avx(auVar463._0_16_,auVar463._0_16_,1);
          auVar535._0_4_ = auVar429._0_4_ + auVar463._0_4_;
          auVar535._4_4_ = auVar429._4_4_ + auVar463._4_4_;
          auVar535._8_4_ = auVar429._8_4_ + auVar463._8_4_;
          auVar535._12_4_ = auVar429._12_4_ + auVar463._12_4_;
          auVar429 = vinsertps_avx(auVar498,auVar484,0x4c);
          auVar428 = vinsertps_avx(auVar484,auVar498,0x1c);
          auVar478 = vinsertps_avx(auVar523,auVar515,0x4c);
          auVar483 = vinsertps_avx(auVar515,auVar523,0x1c);
          auVar496 = vinsertps_avx(auVar535,auVar531,0x4c);
          auVar521 = vinsertps_avx(auVar531,auVar535,0x1c);
          auVar462 = ZEXT1664(CONCAT412(auVar429._12_4_ + 0.0 + auVar428._12_4_ + auVar478._12_4_ +
                                        auVar521._12_4_ + auVar483._12_4_ + auVar496._12_4_,
                                        CONCAT48(auVar429._8_4_ + 0.0 +
                                                 auVar428._8_4_ + auVar478._8_4_ + auVar521._8_4_ +
                                                 auVar483._8_4_ + auVar496._8_4_,
                                                 CONCAT44(auVar429._4_4_ + fVar493 +
                                                          auVar428._4_4_ + auVar478._4_4_ +
                                                          auVar521._4_4_ +
                                                          auVar483._4_4_ + auVar496._4_4_,
                                                          auVar429._0_4_ + fVar427 +
                                                          auVar428._0_4_ + auVar478._0_4_ +
                                                          auVar521._0_4_ +
                                                          auVar483._0_4_ + auVar496._0_4_))));
          for (; (long)(uVar398 | 1) < lVar366; uVar398 = uVar398 + 2) {
            lVar376 = 0;
            uVar400 = uVar417;
            pauVar377 = pauVar405;
            while (iVar362 = (int)uVar400, uVar400 = (ulong)(iVar362 - 1), iVar362 != 0) {
              auVar479._8_8_ = 0;
              auVar479._0_8_ = *(ulong *)*pauVar377;
              auVar485._8_8_ = 0;
              auVar485._0_8_ = *(ulong *)(*pauVar377 + 8);
              uVar4 = *(undefined4 *)((long)puVar407 + lVar376);
              auVar429._4_4_ = uVar4;
              auVar429._0_4_ = uVar4;
              auVar429._8_4_ = uVar4;
              auVar429._12_4_ = uVar4;
              auVar429 = vfmadd231ps_avx512vl(auVar462._0_16_,auVar479,auVar429);
              uVar4 = *(undefined4 *)(lVar421 + lVar376);
              auVar113._4_4_ = uVar4;
              auVar113._0_4_ = uVar4;
              auVar113._8_4_ = uVar4;
              auVar113._12_4_ = uVar4;
              auVar429 = vfmadd231ps_avx512vl(auVar429,auVar485,auVar113);
              auVar462 = ZEXT1664(auVar429);
              pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x10);
              lVar376 = lVar376 + lVar426;
            }
            pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar404);
            lVar421 = lVar421 + lVar383 * 2;
            puVar407 = (undefined4 *)((long)puVar407 + lVar383 * 2);
          }
          for (; auVar443 = auVar462._0_16_, (long)uVar398 < lVar366; uVar398 = uVar398 + 1) {
            puVar378 = puVar407;
            for (lVar421 = 0; iVar409 != (int)lVar421; lVar421 = lVar421 + 1) {
              auVar480._8_8_ = 0;
              auVar480._0_8_ = *(ulong *)(*pauVar405 + lVar421 * 8);
              uVar4 = *puVar378;
              auVar114._4_4_ = uVar4;
              auVar114._0_4_ = uVar4;
              auVar114._8_4_ = uVar4;
              auVar114._12_4_ = uVar4;
              auVar429 = vfmadd231ps_avx512vl(auVar462._0_16_,auVar480,auVar114);
              auVar462 = ZEXT1664(auVar429);
              puVar378 = puVar378 + lVar425;
            }
            pauVar405 = (undefined1 (*) [64])(*pauVar405 + uVar417 * 8);
            puVar407 = (undefined4 *)((long)puVar407 + lVar383);
          }
          if (iVar423 - 1U < 6) {
            auVar429 = vmovshdup_avx(auVar443);
            fVar427 = auVar462._0_4_;
            fVar493 = auVar429._0_4_;
            switch(iVar423) {
            case 1:
              auVar443 = vmaxps_avx(auVar443,_DAT_005364e0);
              break;
            case 2:
              uVar398 = vcmpps_avx512vl(auVar443,_DAT_005364e0,0xe);
              fVar493 = *pfVar14;
              auVar140._4_4_ = fVar493;
              auVar140._0_4_ = fVar493;
              auVar140._8_4_ = fVar493;
              auVar140._12_4_ = fVar493;
              auVar429 = vmulps_avx512vl(auVar443,auVar140);
              bVar18 = (bool)((byte)uVar398 & 1);
              auVar443._0_4_ = (float)((uint)bVar18 * (int)fVar427 | (uint)!bVar18 * auVar429._0_4_)
              ;
              bVar18 = (bool)((byte)(uVar398 >> 1) & 1);
              auVar443._4_4_ =
                   (float)((uint)bVar18 * (int)auVar462._4_4_ | (uint)!bVar18 * auVar429._4_4_);
              bVar18 = (bool)((byte)(uVar398 >> 2) & 1);
              auVar443._8_4_ =
                   (float)((uint)bVar18 * (int)auVar462._8_4_ | (uint)!bVar18 * auVar429._8_4_);
              bVar18 = (bool)((byte)(uVar398 >> 3) & 1);
              auVar443._12_4_ =
                   (float)((uint)bVar18 * (int)auVar462._12_4_ | (uint)!bVar18 * auVar429._12_4_);
              break;
            case 3:
              uVar398 = *(ulong *)pfVar14;
              auVar481._8_8_ = 0;
              auVar481._0_8_ = uVar398;
              auVar483 = vmaxss_avx(auVar481,auVar443);
              auVar428 = vinsertps_avx(auVar481,auVar483,0x10);
              auVar478 = vinsertps_avx(auVar429,auVar481,0x50);
              uVar400 = vcmpps_avx512vl(auVar478,auVar428,1);
              auVar429 = vinsertps_avx(auVar429,auVar483,0x10);
              bVar18 = (bool)((byte)uVar400 & 1);
              auVar442._0_4_ = (uint)bVar18 * (int)uVar398 | (uint)!bVar18 * auVar429._0_4_;
              bVar18 = (bool)((byte)(uVar400 >> 1) & 1);
              auVar442._4_4_ =
                   (uint)bVar18 * (int)(uVar398 >> 0x20) | (uint)!bVar18 * auVar429._4_4_;
              auVar442._8_4_ = (uint)!(bool)((byte)(uVar400 >> 2) & 1) * auVar429._8_4_;
              auVar442._12_4_ = (uint)!(bool)((byte)(uVar400 >> 3) & 1) * auVar429._12_4_;
              auVar443 = vshufps_avx(auVar442,auVar442,0xe1);
              uVar398 = vcmpps_avx512vl(auVar481,auVar443,1);
              if ((uVar398 & 2) != 0) {
                auVar443 = vinsertps_avx(auVar443,auVar481,0x50);
              }
              break;
            case 4:
              auVar486._8_4_ = 0x42b0c0a5;
              auVar486._0_8_ = 0x42b0c0a542b0c0a5;
              auVar486._12_4_ = 0x42b0c0a5;
              auVar429 = vminps_avx(auVar443,auVar486);
              auVar138._8_4_ = 0xc2b0c0a5;
              auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar138._12_4_ = 0xc2b0c0a5;
              uVar398 = vcmpps_avx512vl(auVar429,auVar138,1);
              auVar139._8_4_ = 0x80000000;
              auVar139._0_8_ = 0x8000000080000000;
              auVar139._12_4_ = 0x80000000;
              auVar429 = vxorps_avx512vl(auVar429,auVar139);
              bVar18 = (bool)((byte)uVar398 & 1);
              fVar427 = (float)((uint)bVar18 * 0x42b0c0a5 | (uint)!bVar18 * auVar429._0_4_);
              bVar18 = (bool)((byte)(uVar398 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar398 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar398 >> 3) & 1);
              local_298._0_4_ = expf(fVar427);
              local_298._4_4_ = extraout_XMM0_Db_00;
              local_298._8_4_ = extraout_XMM0_Dc_00;
              local_298._12_4_ = extraout_XMM0_Dd_00;
              auVar352._4_4_ = (uint)bVar18 * 0x42b0c0a5 | (uint)!bVar18 * auVar429._4_4_;
              auVar352._0_4_ = fVar427;
              auVar352._8_4_ = (uint)bVar16 * 0x42b0c0a5 | (uint)!bVar16 * auVar429._8_4_;
              auVar352._12_4_ = (uint)bVar17 * 0x42b0c0a5 | (uint)!bVar17 * auVar429._12_4_;
              auVar429 = vmovshdup_avx(auVar352);
              auVar460._0_4_ = expf(auVar429._0_4_);
              auVar460._4_60_ = extraout_var_00;
              auVar461 = vmovdqu64_avx512f(local_b8);
              auVar429 = vinsertps_avx(local_298,auVar460._0_16_,0x10);
              auVar487._8_4_ = 0x3f800000;
              auVar487._0_8_ = 0x3f8000003f800000;
              auVar487._12_4_ = 0x3f800000;
              auVar482._0_4_ = auVar429._0_4_ + 1.0;
              auVar482._4_4_ = auVar429._4_4_ + 1.0;
              auVar482._8_4_ = auVar429._8_4_ + 1.0;
              auVar482._12_4_ = auVar429._12_4_ + 1.0;
              auVar443 = vdivps_avx(auVar487,auVar482);
              auVar459 = _DAT_00544100;
              auVar460 = _DAT_00544140;
              break;
            case 5:
              fVar492 = expf(fVar427);
              fVar492 = logf(fVar492 + 1.0);
              fVar492 = tanhf(fVar492);
              fVar493 = expf(fVar493);
              fVar493 = logf(fVar493 + 1.0);
              auVar459._0_4_ = tanhf(fVar493);
              auVar459._4_60_ = extraout_var;
              auVar461 = vmovdqu64_avx512f(local_b8);
              auVar351._4_4_ = extraout_XMM0_Db;
              auVar351._0_4_ = fVar492;
              auVar351._8_4_ = extraout_XMM0_Dc;
              auVar351._12_4_ = extraout_XMM0_Dd;
              auVar429 = vinsertps_avx(auVar351,auVar459._0_16_,0x10);
              auVar443._0_4_ = auVar429._0_4_ * fVar427;
              auVar443._4_4_ = auVar429._4_4_ * auVar462._4_4_;
              auVar443._8_4_ = auVar429._8_4_ * auVar462._8_4_;
              auVar443._12_4_ = auVar429._12_4_ * auVar462._12_4_;
              auVar459 = _DAT_00544100;
              auVar460 = _DAT_00544140;
              break;
            case 6:
              fVar492 = *pfVar14;
              fVar508 = pfVar14[1];
              auVar137._8_4_ = 0x80000000;
              auVar137._0_8_ = 0x8000000080000000;
              auVar137._12_4_ = 0x80000000;
              auVar428 = vxorps_avx512vl(ZEXT416((uint)fVar508),auVar137);
              fVar494 = auVar428._0_4_ / fVar492;
              fVar507 = 0.0;
              if ((fVar494 <= fVar427) && (fVar507 = fVar427, fVar427 <= fVar494 + 1.0 / fVar492)) {
                auVar428 = vfmadd213ss_fma(auVar443,ZEXT416((uint)fVar492),ZEXT416((uint)fVar508));
                fVar507 = auVar428._0_4_ * fVar427;
              }
              if (fVar494 <= fVar493) {
                auVar443._4_12_ = auVar462._4_12_;
                auVar443._0_4_ = fVar507;
                if (fVar493 <= fVar494 + 1.0 / fVar492) {
                  auVar429 = vfmadd213ss_fma(ZEXT416((uint)fVar492),auVar429,ZEXT416((uint)fVar508))
                  ;
                  auVar443 = vinsertps_avx(auVar443,ZEXT416((uint)(auVar429._0_4_ * fVar493)),0x10);
                }
              }
              else {
                auVar443 = ZEXT416((uint)fVar507);
              }
            }
          }
          *puVar373 = auVar443._0_4_;
          uVar4 = vextractps_avx(auVar443,1);
          *puVar370 = uVar4;
          puVar373 = puVar373 + 1;
          puVar370 = puVar370 + 1;
          iVar403 = iVar403 + iVar381;
          local_348 = local_348 + lVar3;
          local_2c8 = local_2c8 + lVar3;
        }
      }
      lVar382 = lVar382 * lVar387;
      pvVar10 = top_blob->data;
      iVar381 = top_blob->w;
      sVar11 = top_blob->elemsize;
      uVar368 = 0;
      if (0 < (int)local_f0) {
        uVar368 = local_f0 & 0xffffffff;
      }
      uVar396 = (ulong)(iVar380 + iVar386 * 2);
      lVar366 = vpextrq_avx(auVar461._0_16_,1);
      for (; (long)uVar396 < (long)uVar363; uVar396 = uVar396 + 1) {
        uVar399 = (int)uVar396 >> 0x1f;
        uVar391 = (ulong)uVar399 << 0x20 | uVar396 & 0xffffffff;
        sVar12 = (this->weight_data_tm).cstep;
        sVar15 = (this->weight_data_tm).elemsize;
        pfVar422 = (float *)((long)iVar381 * sVar11 * uVar396 + (long)pvVar10);
        pvVar13 = (this->weight_data_tm).data;
        pfVar14 = (float *)(this->super_Convolution1D).activation_params.data;
        local_2c0 = 0;
        iVar386 = 0;
        lVar367 = lVar394 * 4;
        for (uVar390 = 0; uVar390 != uVar368; uVar390 = uVar390 + 1) {
          if (pvVar7 == (void *)0x0) {
            fVar427 = 0.0;
          }
          else {
            fVar427 = *(float *)((long)pvVar7 + uVar396 * 4);
          }
          iVar380 = iVar6 * iVar5 * (int)uVar390;
          lVar388 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar387 = (long)local_188.data + lVar367;
          puVar395 = (uint *)((long)local_188.data + local_2c0);
          auVar462 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar374 = 0;
          pauVar405 = (undefined1 (*) [64])
                      ((long)((int)(char)((char)((long)((ulong)uVar399 << 0x20 |
                                                       uVar396 & 0xffffffff) % 4) / '\x02') +
                              (int)(char)((char)((long)((ulong)uVar399 << 0x20 |
                                                       uVar396 & 0xffffffff) % 8) / '\x04') +
                             (int)((long)((ulong)uVar399 << 0x20 | uVar396 & 0xffffffff) % 2) +
                             (int)((long)uVar391 / 0x10) +
                             (int)(char)((char)((long)uVar391 % 0x10) / '\b')) * sVar12 * sVar15 +
                      (long)pvVar13);
          while( true ) {
            local_210 = (int)lVar382;
            if (local_210 <= (int)((uint)uVar374 | 0xf)) break;
            lVar413 = (int)((long)((ulong)(uint)((int)(uint)uVar374 >> 0x1f) << 0x20 |
                                  uVar374 & 0xffffffff) / (long)iVar5) * lVar388;
            if (iVar5 == 0x10) {
              pauVar377 = (undefined1 (*) [64])((long)local_188.data + lVar413 + (long)iVar386 * 4);
              uVar371 = uVar417;
              pauVar412 = pauVar405;
              while (iVar403 = (int)uVar371, uVar371 = (ulong)(iVar403 - 1), iVar403 != 0) {
                auVar462 = vfmadd231ps_avx512f(auVar462,*pauVar377,*pauVar412);
                pauVar412 = pauVar412 + 1;
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar424 * 4);
              }
              pauVar405 = pauVar405 + uVar417;
            }
            else {
              pauVar377 = (undefined1 (*) [64])((long)local_188.data + lVar413 + (long)iVar380 * 4);
            }
            uVar371 = uVar417;
            pauVar412 = pauVar377;
            pauVar420 = pauVar405;
            if (iVar5 == 8) {
              while ((int)uVar371 != 0) {
                auVar463 = vinsertf64x4_avx512f
                                     (ZEXT3264(*(undefined1 (*) [32])*pauVar412),
                                      *(undefined1 (*) [32])(*pauVar412 + lVar394 * 4),1);
                auVar462 = vfmadd231ps_avx512f(auVar462,auVar463,*pauVar420);
                uVar371 = (ulong)((int)uVar371 - 1);
                pauVar412 = (undefined1 (*) [64])(*pauVar412 + lVar1);
                pauVar420 = pauVar420 + 1;
              }
              pauVar405 = pauVar405 + uVar417;
              pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar410);
            }
            uVar371 = uVar417;
            pauVar412 = pauVar377;
            pauVar420 = pauVar405;
            if (iVar5 == 4) {
              while ((int)uVar371 != 0) {
                auVar506._16_16_ = *(undefined1 (*) [16])(*pauVar412 + lVar366 * 4);
                auVar506._0_16_ = *(undefined1 (*) [16])(*pauVar412 + auVar461._0_8_ * 4);
                auVar463 = vinsertf64x4_avx512f
                                     (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                           (*pauVar412 + lVar394 * 4),
                                                          *(undefined1 (*) [16])*pauVar412)),
                                      auVar506,1);
                auVar462 = vfmadd231ps_avx512f(auVar462,auVar463,*pauVar420);
                uVar371 = (ulong)((int)uVar371 - 1);
                pauVar412 = (undefined1 (*) [64])(*pauVar412 + lVar2);
                pauVar420 = pauVar420 + 1;
              }
              pauVar405 = pauVar405 + uVar417;
              pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar414);
            }
            uVar371 = uVar417;
            pauVar412 = pauVar405;
            if (iVar5 == 1) {
              while ((int)uVar371 != 0) {
                auVar428 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar377 + lVar387 * 4));
                vgatherqps_avx512f(*(undefined8 *)(*pauVar377 + (long)pauVar412 * 4));
                auVar429 = vinsertps_avx(ZEXT416(*(uint *)*pauVar377),
                                         ZEXT416(*(uint *)(*pauVar377 + lVar394 * 4)),0x10);
                vpermt2pd_avx512f(auVar459,ZEXT1664(auVar429));
                auVar463 = vpermt2pd_avx512f(auVar460,ZEXT1664(auVar428));
                auVar565 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar377 + lVar364 * 4)));
                auVar533 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar377 + lVar365 * 4)));
                auVar565._0_56_ = auVar463._0_56_;
                auVar565._60_4_ = auVar533._60_4_;
                auVar462 = vfmadd231ps_avx512f(auVar462,auVar565,*pauVar412);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + lVar426);
                uVar371 = (ulong)((int)uVar371 - 1);
                pauVar412 = pauVar412 + 1;
              }
              pauVar405 = pauVar405 + uVar417;
            }
            uVar374 = uVar374 + 0x10;
            lVar387 = lVar387 + lVar388 * 0x10;
            puVar395 = puVar395 + lVar388 * 4;
          }
          auVar446 = vextractf64x4_avx512f(auVar462,1);
          fVar493 = auVar462._4_4_ + auVar446._4_4_;
          auVar488._0_4_ = auVar462._0_4_ + auVar446._0_4_ + auVar462._16_4_ + auVar446._16_4_;
          auVar488._4_4_ = fVar493 + fVar493;
          auVar488._8_4_ = auVar462._8_4_ + auVar446._8_4_ + auVar462._24_4_ + auVar446._24_4_;
          auVar488._12_4_ = auVar462._12_4_ + auVar446._12_4_ + auVar462._28_4_ + auVar446._28_4_;
          auVar429 = vshufpd_avx(auVar488,auVar488,1);
          auVar489._0_4_ = auVar429._0_4_ + auVar488._0_4_;
          auVar489._4_4_ = auVar429._4_4_ + auVar488._4_4_;
          auVar489._8_4_ = auVar429._8_4_ + auVar488._8_4_;
          auVar489._12_4_ = auVar429._12_4_ + auVar488._12_4_;
          auVar462 = ZEXT864(0) << 0x20;
          for (; (int)((uint)uVar374 | 7) < local_210; uVar374 = uVar374 + 8) {
            lVar413 = (int)((long)((ulong)(uint)((int)(uint)uVar374 >> 0x1f) << 0x20 |
                                  uVar374 & 0xffffffff) / (long)iVar5) * lVar388;
            if (iVar5 == 8) {
              pauVar411 = (undefined1 (*) [32])((long)local_188.data + lVar413 + (long)iVar386 * 4);
              uVar371 = uVar417;
              pauVar377 = pauVar405;
              while (iVar403 = (int)uVar371, uVar371 = (ulong)(iVar403 - 1), iVar403 != 0) {
                auVar429 = vfmadd231ps_fma(auVar462._0_32_,*pauVar411,
                                           *(undefined1 (*) [32])*pauVar377);
                auVar462 = ZEXT1664(auVar429);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x20);
                pauVar411 = (undefined1 (*) [32])(*pauVar411 + lVar1);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar419);
            }
            else {
              pauVar411 = (undefined1 (*) [32])((long)local_188.data + lVar413 + (long)iVar380 * 4);
            }
            uVar371 = uVar417;
            pauVar401 = pauVar411;
            pauVar377 = pauVar405;
            if (iVar5 == 4) {
              while ((int)uVar371 != 0) {
                auVar520._16_16_ = *(undefined1 (*) [16])(*pauVar401 + lVar394 * 4);
                auVar520._0_16_ = *(undefined1 (*) [16])*pauVar401;
                auVar429 = vfmadd231ps_fma(auVar462._0_32_,auVar520,*(undefined1 (*) [32])*pauVar377
                                          );
                auVar462 = ZEXT1664(auVar429);
                uVar371 = (ulong)((int)uVar371 - 1);
                pauVar401 = (undefined1 (*) [32])(*pauVar401 + lVar2);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x20);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar419);
              pauVar411 = (undefined1 (*) [32])(*pauVar411 + lVar414);
            }
            uVar371 = uVar417;
            pauVar377 = pauVar405;
            if (iVar5 == 1) {
              while ((int)uVar371 != 0) {
                auVar428 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar411 + (long)pauVar377 * 4));
                auVar429 = vinsertps_avx(ZEXT416(*(uint *)*pauVar411),
                                         ZEXT416(*(uint *)(*pauVar411 + lVar394 * 4)),0x10);
                auVar446 = vpermpd_avx2(ZEXT1632(auVar428),0xd0);
                auVar446 = vblendps_avx(auVar446,ZEXT1632(auVar429),3);
                uVar4 = *(undefined4 *)(*pauVar411 + lVar527 * 4);
                auVar525._4_4_ = uVar4;
                auVar525._0_4_ = uVar4;
                auVar525._8_4_ = uVar4;
                auVar525._12_4_ = uVar4;
                auVar525._16_4_ = uVar4;
                auVar525._20_4_ = uVar4;
                auVar525._24_4_ = uVar4;
                auVar525._28_4_ = uVar4;
                auVar446 = vblendps_avx(auVar446,auVar525,0x40);
                uVar4 = *(undefined4 *)(*pauVar411 + lVar8 * 4);
                auVar526._4_4_ = uVar4;
                auVar526._0_4_ = uVar4;
                auVar526._8_4_ = uVar4;
                auVar526._12_4_ = uVar4;
                auVar526._16_4_ = uVar4;
                auVar526._20_4_ = uVar4;
                auVar526._24_4_ = uVar4;
                auVar526._28_4_ = uVar4;
                auVar446 = vblendps_avx(auVar446,auVar526,0x80);
                auVar429 = vfmadd231ps_fma(auVar462._0_32_,auVar446,*(undefined1 (*) [32])*pauVar377
                                          );
                auVar462 = ZEXT1664(auVar429);
                pauVar411 = (undefined1 (*) [32])(*pauVar411 + lVar426);
                uVar371 = (ulong)((int)uVar371 - 1);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x20);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar419);
            }
            lVar387 = lVar387 + lVar388 * 8;
            puVar395 = puVar395 + lVar388 * 2;
          }
          auVar499._0_4_ = auVar462._16_4_ + auVar462._0_4_;
          auVar499._4_4_ = auVar462._20_4_ + auVar462._4_4_;
          auVar499._8_4_ = auVar462._24_4_ + auVar462._8_4_;
          auVar499._12_4_ = auVar462._28_4_ + auVar462._12_4_;
          auVar429 = vshufpd_avx(auVar499,auVar499,1);
          auVar500._0_4_ = auVar429._0_4_ + auVar499._0_4_;
          auVar500._4_4_ = auVar429._4_4_ + auVar499._4_4_;
          auVar500._8_4_ = auVar429._8_4_ + auVar499._8_4_;
          auVar500._12_4_ = auVar429._12_4_ + auVar499._12_4_;
          auVar462 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar374 | 3) < local_210; uVar374 = uVar374 + 4) {
            lVar413 = (int)((long)((ulong)(uint)((int)(uint)uVar374 >> 0x1f) << 0x20 |
                                  uVar374 & 0xffffffff) / (long)iVar5) * lVar388;
            if (iVar5 == 4) {
              pauVar406 = (undefined1 (*) [16])((long)local_188.data + lVar413 + (long)iVar386 * 4);
              uVar371 = uVar417;
              pauVar377 = pauVar405;
              while (iVar403 = (int)uVar371, uVar371 = (ulong)(iVar403 - 1), iVar403 != 0) {
                auVar429 = vfmadd231ps_fma(auVar462._0_16_,*pauVar406,
                                           *(undefined1 (*) [16])*pauVar377);
                auVar462 = ZEXT1664(auVar429);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x10);
                pauVar406 = (undefined1 (*) [16])(*pauVar406 + lVar2);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar404);
            }
            else {
              pauVar406 = (undefined1 (*) [16])((long)local_188.data + lVar413 + (long)iVar380 * 4);
            }
            uVar371 = uVar417;
            pauVar377 = pauVar405;
            if (iVar5 == 1) {
              while ((int)uVar371 != 0) {
                auVar429 = vinsertps_avx(ZEXT416(*(uint *)*pauVar406),
                                         ZEXT416(*(uint *)(*pauVar406 + lVar394 * 4)),0x10);
                auVar429 = vinsertps_avx(auVar429,ZEXT416(*(uint *)(*pauVar406 + auVar461._0_8_ * 4)
                                                         ),0x20);
                auVar429 = vinsertps_avx(auVar429,ZEXT416(*(uint *)(*pauVar406 + lVar366 * 4)),0x30)
                ;
                auVar429 = vfmadd231ps_fma(auVar462._0_16_,auVar429,*(undefined1 (*) [16])*pauVar377
                                          );
                auVar462 = ZEXT1664(auVar429);
                pauVar406 = (undefined1 (*) [16])(*pauVar406 + lVar426);
                uVar371 = (ulong)((int)uVar371 - 1);
                pauVar377 = (undefined1 (*) [64])(*pauVar377 + 0x10);
              }
              pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar404);
            }
            lVar387 = lVar387 + lVar388 * 4;
            puVar395 = puVar395 + lVar388;
          }
          auVar428 = vmovshdup_avx(auVar489);
          auVar429 = vshufpd_avx(auVar462._0_16_,auVar462._0_16_,1);
          auVar516._0_4_ = auVar429._0_4_ + auVar462._0_4_;
          auVar516._4_4_ = auVar429._4_4_ + auVar462._4_4_;
          auVar516._8_4_ = auVar429._8_4_ + auVar462._8_4_;
          auVar516._12_4_ = auVar429._12_4_ + auVar462._12_4_;
          auVar478 = vshufps_avx(auVar516,auVar500,0x11);
          auVar429 = vshufpd_avx(auVar478,auVar478,1);
          auVar501._0_4_ = auVar478._0_4_ + auVar429._0_4_;
          auVar501._4_4_ = auVar478._4_4_ + auVar429._4_4_;
          auVar501._8_4_ = auVar478._8_4_ + auVar429._8_4_;
          auVar501._12_4_ = auVar478._12_4_ + auVar429._12_4_;
          auVar429 = vhaddps_avx(auVar501,auVar501);
          auVar462 = ZEXT464((uint)(auVar428._0_4_ + auVar489._0_4_ + fVar427 + auVar429._0_4_));
          for (; (long)(uVar374 | 1) < lVar382; uVar374 = uVar374 + 2) {
            lVar413 = 0;
            for (lVar421 = 0; iVar409 != (int)lVar421; lVar421 = lVar421 + 1) {
              auVar429 = vfmadd231ss_fma(auVar462._0_16_,
                                         ZEXT416(*(uint *)(*pauVar405 + lVar421 * 8)),
                                         ZEXT416(*(uint *)((long)puVar395 + lVar413)));
              auVar429 = vfmadd231ss_fma(auVar429,ZEXT416(*(uint *)(*pauVar405 + lVar421 * 8 + 4)),
                                         ZEXT416(*(uint *)(lVar387 + lVar413)));
              auVar462 = ZEXT1664(auVar429);
              lVar413 = lVar413 + lVar426;
            }
            pauVar405 = (undefined1 (*) [64])(*pauVar405 + uVar417 * 8);
            lVar387 = lVar387 + lVar388 * 2;
            puVar395 = (uint *)((long)puVar395 + lVar388 * 2);
          }
          for (; (long)uVar374 < lVar382; uVar374 = uVar374 + 1) {
            puVar379 = puVar395;
            for (lVar387 = 0; iVar409 != (int)lVar387; lVar387 = lVar387 + 1) {
              auVar429 = vfmadd231ss_fma(auVar462._0_16_,
                                         ZEXT416(*(uint *)(*pauVar405 + lVar387 * 4)),
                                         ZEXT416(*puVar379));
              auVar462 = ZEXT1664(auVar429);
              puVar379 = puVar379 + lVar425;
            }
            pauVar405 = (undefined1 (*) [64])(*pauVar405 + lVar9);
            puVar395 = (uint *)((long)puVar395 + lVar388);
          }
          auVar429 = auVar462._0_16_;
          fVar493 = auVar462._0_4_;
          fVar427 = fVar493;
          switch(iVar423) {
          case 1:
            auVar429 = vmaxss_avx(auVar429,ZEXT416(0));
            fVar427 = auVar429._0_4_;
            break;
          case 2:
            uVar20 = vcmpss_avx512f(auVar429,ZEXT416(0),0xe);
            bVar18 = (bool)((byte)uVar20 & 1);
            fVar427 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * (int)*pfVar14) * fVar493;
            break;
          case 3:
            auVar429 = vmaxss_avx(auVar429,ZEXT416((uint)*pfVar14));
            fVar427 = auVar429._0_4_;
            if (pfVar14[1] < auVar429._0_4_) {
              fVar427 = pfVar14[1];
            }
            break;
          case 4:
            auVar429 = vminss_avx(auVar429,SUB6416(ZEXT464(0x42b0c0a5),0));
            auVar142._8_4_ = 0x80000000;
            auVar142._0_8_ = 0x8000000080000000;
            auVar142._12_4_ = 0x80000000;
            auVar428 = vxorps_avx512vl(auVar429,auVar142);
            uVar20 = vcmpss_avx512f(auVar429,ZEXT416(0xc2b0c0a5),1);
            bVar18 = (bool)((byte)uVar20 & 1);
            fVar427 = expf((float)((uint)bVar18 * 0x42b0c0a5 + (uint)!bVar18 * auVar428._0_4_));
            fVar427 = 1.0 / (fVar427 + 1.0);
            auVar459 = _DAT_00544100;
            auVar460 = _DAT_00544140;
            break;
          case 5:
            fVar427 = expf(fVar493);
            fVar427 = logf(fVar427 + 1.0);
            fVar427 = tanhf(fVar427);
            fVar427 = fVar427 * fVar493;
            auVar459 = _DAT_00544100;
            auVar460 = _DAT_00544140;
            break;
          case 6:
            fVar492 = *pfVar14;
            auVar141._8_4_ = 0x80000000;
            auVar141._0_8_ = 0x8000000080000000;
            auVar141._12_4_ = 0x80000000;
            auVar428 = vxorps_avx512vl(ZEXT416((uint)pfVar14[1]),auVar141);
            fVar508 = auVar428._0_4_ / fVar492;
            fVar427 = 0.0;
            if ((fVar508 <= fVar493) && (fVar427 = fVar493, fVar493 <= fVar508 + 1.0 / fVar492)) {
              auVar429 = vfmadd213ss_fma(ZEXT416((uint)fVar492),auVar429,ZEXT416((uint)pfVar14[1]));
              fVar427 = auVar429._0_4_ * fVar493;
            }
          }
          *pfVar422 = fVar427;
          pfVar422 = pfVar422 + 1;
          iVar386 = iVar386 + iVar6 * iVar5;
          lVar367 = lVar367 + lVar3;
          local_2c0 = local_2c0 + lVar3;
        }
      }
      iVar423 = 0;
    }
  }
  piVar353 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar353 != (int *)0x0) {
    LOCK();
    *piVar353 = *piVar353 + -1;
    UNLOCK();
    if (*piVar353 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        free(local_188.data);
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar423;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}